

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUSettings.cpp
# Opt level: O1

bool __thiscall RTIMUSettings::loadSettings(RTIMUSettings *this)

{
  uint uVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  RTFLOAT ftemp;
  char key [200];
  char val [200];
  char buf [200];
  RTFLOAT local_2bc;
  char local_2b8;
  char cStack_2b7;
  char cStack_2b6;
  char cStack_2b5;
  char cStack_2b4;
  char cStack_2b3;
  char cStack_2b2;
  char cStack_2b1;
  char cStack_2b0;
  char cStack_2af;
  char cStack_2ae;
  char cStack_2ad;
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  char cStack_2a9;
  char local_2a8;
  char cStack_2a7;
  char cStack_2a6;
  char cStack_2a5;
  char cStack_2a4;
  char cStack_2a3;
  char cStack_2a2;
  char cStack_2a1;
  char cStack_2a0;
  char cStack_29f;
  char cStack_29e;
  char cStack_29d;
  char cStack_29c;
  char cStack_29b;
  char cStack_29a;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  int local_1c8;
  char local_1c4;
  byte local_f8 [200];
  
  setDefaults(this);
  pFVar3 = fopen(this->m_filename,"r");
  this->m_fd = (FILE *)pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    puts("Settings file not found. Using defaults and creating settings file");
    fflush(_stdout);
    iVar2 = (*(this->super_RTIMUHal)._vptr_RTIMUHal[3])(this);
    return SUB41(iVar2,0);
  }
  pcVar4 = fgets((char *)local_f8,200,(FILE *)this->m_fd);
  if (pcVar4 != (char *)0x0) {
    local_1e0 = 0x657079546e6f69;
    local_1d8 = 0x43737361706d6f63;
    uStack_1d0 = 0x74657366664f6c61;
    local_1e8 = 0x65707954657275;
    local_1f0 = 0x65707954797469;
    do {
      if ((0x23 < (ulong)local_f8[0]) || ((0x900000400U >> ((ulong)local_f8[0] & 0x3f) & 1) == 0)) {
        iVar2 = __isoc99_sscanf(local_f8,"%[^=]=%s",&local_2b8,&local_1c8);
        if (iVar2 != 2) {
          loadSettings();
          return false;
        }
        if (CONCAT17(cStack_2b1,
                     CONCAT16(cStack_2b2,
                              CONCAT15(cStack_2b3,
                                       CONCAT14(cStack_2b4,
                                                CONCAT13(cStack_2b5,
                                                         CONCAT12(cStack_2b6,
                                                                  CONCAT11(cStack_2b7,local_2b8)))))
                             )) == 0x65707954554d49) {
          iVar2 = atoi((char *)&local_1c8);
          *(int *)&(this->super_RTIMUHal).field_0x1c = iVar2;
        }
        else if (CONCAT17(cStack_2ae,
                          CONCAT16(cStack_2af,
                                   CONCAT15(cStack_2b0,
                                            CONCAT14(cStack_2b1,
                                                     CONCAT13(cStack_2b2,
                                                              CONCAT12(cStack_2b3,
                                                                       CONCAT11(cStack_2b4,
                                                                                cStack_2b5))))))) ==
                 local_1e0 &&
                 CONCAT17(cStack_2b1,
                          CONCAT16(cStack_2b2,
                                   CONCAT15(cStack_2b3,
                                            CONCAT14(cStack_2b4,
                                                     CONCAT13(cStack_2b5,
                                                              CONCAT12(cStack_2b6,
                                                                       CONCAT11(cStack_2b7,local_2b8
                                                                               ))))))) ==
                 0x79546e6f69737546) {
          iVar2 = atoi((char *)&local_1c8);
          this->m_fusionType = iVar2;
        }
        else if (cStack_2b0 == '\0' &&
                 CONCAT17(cStack_2b1,
                          CONCAT16(cStack_2b2,
                                   CONCAT15(cStack_2b3,
                                            CONCAT14(cStack_2b4,
                                                     CONCAT13(cStack_2b5,
                                                              CONCAT12(cStack_2b6,
                                                                       CONCAT11(cStack_2b7,local_2b8
                                                                               ))))))) ==
                 0x4332497349737542) {
          (this->super_RTIMUHal).m_busIsI2C = local_1c4 == '\0' && local_1c8 == 0x65757274;
        }
        else if (CONCAT13(cStack_2b2,CONCAT12(cStack_2b3,CONCAT11(cStack_2b4,cStack_2b5))) ==
                 0x737542 &&
                 CONCAT13(cStack_2b5,CONCAT12(cStack_2b6,CONCAT11(cStack_2b7,local_2b8))) ==
                 0x42433249) {
          iVar2 = atoi((char *)&local_1c8);
          (this->super_RTIMUHal).m_I2CBus = (uchar)iVar2;
        }
        else if (CONCAT13(cStack_2b2,CONCAT12(cStack_2b3,CONCAT11(cStack_2b4,cStack_2b5))) ==
                 0x737542 &&
                 CONCAT13(cStack_2b5,CONCAT12(cStack_2b6,CONCAT11(cStack_2b7,local_2b8))) ==
                 0x42495053) {
          iVar2 = atoi((char *)&local_1c8);
          (this->super_RTIMUHal).m_SPIBus = (uchar)iVar2;
        }
        else if (CONCAT11(cStack_2af,cStack_2b0) == 0x74 &&
                 CONCAT17(cStack_2b1,
                          CONCAT16(cStack_2b2,
                                   CONCAT15(cStack_2b3,
                                            CONCAT14(cStack_2b4,
                                                     CONCAT13(cStack_2b5,
                                                              CONCAT12(cStack_2b6,
                                                                       CONCAT11(cStack_2b7,local_2b8
                                                                               ))))))) ==
                 0x63656c6553495053) {
          iVar2 = atoi((char *)&local_1c8);
          (this->super_RTIMUHal).m_SPISelect = (uchar)iVar2;
        }
        else if (cStack_2b0 == '\0' &&
                 CONCAT17(cStack_2b1,
                          CONCAT16(cStack_2b2,
                                   CONCAT15(cStack_2b3,
                                            CONCAT14(cStack_2b4,
                                                     CONCAT13(cStack_2b5,
                                                              CONCAT12(cStack_2b6,
                                                                       CONCAT11(cStack_2b7,local_2b8
                                                                               ))))))) ==
                 0x6465657053495053) {
          uVar1 = atoi((char *)&local_1c8);
          (this->super_RTIMUHal).m_SPISpeed = uVar1;
        }
        else {
          auVar5[0] = -(local_2b8 == 'I');
          auVar5[1] = -(cStack_2b7 == '2');
          auVar5[2] = -(cStack_2b6 == 'C');
          auVar5[3] = -(cStack_2b5 == 'S');
          auVar5[4] = -(cStack_2b4 == 'l');
          auVar5[5] = -(cStack_2b3 == 'a');
          auVar5[6] = -(cStack_2b2 == 'v');
          auVar5[7] = -(cStack_2b1 == 'e');
          auVar5[8] = -(cStack_2b0 == 'A');
          auVar5[9] = -(cStack_2af == 'd');
          auVar5[10] = -(cStack_2ae == 'd');
          auVar5[0xb] = -(cStack_2ad == 'r');
          auVar5[0xc] = -(cStack_2ac == 'e');
          auVar5[0xd] = -(cStack_2ab == 's');
          auVar5[0xe] = -(cStack_2aa == 's');
          auVar5[0xf] = -(cStack_2a9 == '\0');
          if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
            iVar2 = atoi((char *)&local_1c8);
            this->m_I2CSlaveAddress = (uchar)iVar2;
          }
          else if (CONCAT17(cStack_2ac,
                            CONCAT16(cStack_2ad,
                                     CONCAT15(cStack_2ae,
                                              CONCAT14(cStack_2af,
                                                       CONCAT13(cStack_2b0,
                                                                CONCAT12(cStack_2b1,
                                                                         CONCAT11(cStack_2b2,
                                                                                  cStack_2b3)))))))
                   == 0x6e6f697461746f &&
                   CONCAT17(cStack_2b1,
                            CONCAT16(cStack_2b2,
                                     CONCAT15(cStack_2b3,
                                              CONCAT14(cStack_2b4,
                                                       CONCAT13(cStack_2b5,
                                                                CONCAT12(cStack_2b6,
                                                                         CONCAT11(cStack_2b7,
                                                                                  local_2b8)))))))
                   == 0x61746f5273697841) {
            iVar2 = atoi((char *)&local_1c8);
            this->m_axisRotation = iVar2;
          }
          else if (CONCAT17(cStack_2ac,
                            CONCAT16(cStack_2ad,
                                     CONCAT15(cStack_2ae,
                                              CONCAT14(cStack_2af,
                                                       CONCAT13(cStack_2b0,
                                                                CONCAT12(cStack_2b1,
                                                                         CONCAT11(cStack_2b2,
                                                                                  cStack_2b3)))))))
                   == local_1e8 &&
                   CONCAT17(cStack_2b1,
                            CONCAT16(cStack_2b2,
                                     CONCAT15(cStack_2b3,
                                              CONCAT14(cStack_2b4,
                                                       CONCAT13(cStack_2b5,
                                                                CONCAT12(cStack_2b6,
                                                                         CONCAT11(cStack_2b7,
                                                                                  local_2b8)))))))
                   == 0x6572757373657250) {
            iVar2 = atoi((char *)&local_1c8);
            this->m_pressureType = iVar2;
          }
          else {
            auVar6[0] = -(cStack_2b5 == 'P');
            auVar6[1] = -(cStack_2b4 == 'r');
            auVar6[2] = -(cStack_2b3 == 'e');
            auVar6[3] = -(cStack_2b2 == 's');
            auVar6[4] = -(cStack_2b1 == 's');
            auVar6[5] = -(cStack_2b0 == 'u');
            auVar6[6] = -(cStack_2af == 'r');
            auVar6[7] = -(cStack_2ae == 'e');
            auVar6[8] = -(cStack_2ad == 'A');
            auVar6[9] = -(cStack_2ac == 'd');
            auVar6[10] = -(cStack_2ab == 'd');
            auVar6[0xb] = -(cStack_2aa == 'r');
            auVar6[0xc] = -(cStack_2a9 == 'e');
            auVar6[0xd] = -(local_2a8 == 's');
            auVar6[0xe] = -(cStack_2a7 == 's');
            auVar6[0xf] = -(cStack_2a6 == '\0');
            auVar20[0] = -(local_2b8 == 'I');
            auVar20[1] = -(cStack_2b7 == '2');
            auVar20[2] = -(cStack_2b6 == 'C');
            auVar20[3] = -(cStack_2b5 == 'P');
            auVar20[4] = -(cStack_2b4 == 'r');
            auVar20[5] = -(cStack_2b3 == 'e');
            auVar20[6] = -(cStack_2b2 == 's');
            auVar20[7] = -(cStack_2b1 == 's');
            auVar20[8] = -(cStack_2b0 == 'u');
            auVar20[9] = -(cStack_2af == 'r');
            auVar20[10] = -(cStack_2ae == 'e');
            auVar20[0xb] = -(cStack_2ad == 'A');
            auVar20[0xc] = -(cStack_2ac == 'd');
            auVar20[0xd] = -(cStack_2ab == 'd');
            auVar20[0xe] = -(cStack_2aa == 'r');
            auVar20[0xf] = -(cStack_2a9 == 'e');
            auVar20 = auVar20 & auVar6;
            if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
              iVar2 = atoi((char *)&local_1c8);
              this->m_I2CPressureAddress = (uchar)iVar2;
            }
            else if (CONCAT17(cStack_2ac,
                              CONCAT16(cStack_2ad,
                                       CONCAT15(cStack_2ae,
                                                CONCAT14(cStack_2af,
                                                         CONCAT13(cStack_2b0,
                                                                  CONCAT12(cStack_2b1,
                                                                           CONCAT11(cStack_2b2,
                                                                                    cStack_2b3))))))
                             ) == local_1f0 &&
                     CONCAT17(cStack_2b1,
                              CONCAT16(cStack_2b2,
                                       CONCAT15(cStack_2b3,
                                                CONCAT14(cStack_2b4,
                                                         CONCAT13(cStack_2b5,
                                                                  CONCAT12(cStack_2b6,
                                                                           CONCAT11(cStack_2b7,
                                                                                    local_2b8)))))))
                     == 0x79746964696d7548) {
              iVar2 = atoi((char *)&local_1c8);
              this->m_humidityType = iVar2;
            }
            else {
              auVar7[0] = -(cStack_2b5 == 'H');
              auVar7[1] = -(cStack_2b4 == 'u');
              auVar7[2] = -(cStack_2b3 == 'm');
              auVar7[3] = -(cStack_2b2 == 'i');
              auVar7[4] = -(cStack_2b1 == 'd');
              auVar7[5] = -(cStack_2b0 == 'i');
              auVar7[6] = -(cStack_2af == 't');
              auVar7[7] = -(cStack_2ae == 'y');
              auVar7[8] = -(cStack_2ad == 'A');
              auVar7[9] = -(cStack_2ac == 'd');
              auVar7[10] = -(cStack_2ab == 'd');
              auVar7[0xb] = -(cStack_2aa == 'r');
              auVar7[0xc] = -(cStack_2a9 == 'e');
              auVar7[0xd] = -(local_2a8 == 's');
              auVar7[0xe] = -(cStack_2a7 == 's');
              auVar7[0xf] = -(cStack_2a6 == '\0');
              auVar21[0] = -(local_2b8 == 'I');
              auVar21[1] = -(cStack_2b7 == '2');
              auVar21[2] = -(cStack_2b6 == 'C');
              auVar21[3] = -(cStack_2b5 == 'H');
              auVar21[4] = -(cStack_2b4 == 'u');
              auVar21[5] = -(cStack_2b3 == 'm');
              auVar21[6] = -(cStack_2b2 == 'i');
              auVar21[7] = -(cStack_2b1 == 'd');
              auVar21[8] = -(cStack_2b0 == 'i');
              auVar21[9] = -(cStack_2af == 't');
              auVar21[10] = -(cStack_2ae == 'y');
              auVar21[0xb] = -(cStack_2ad == 'A');
              auVar21[0xc] = -(cStack_2ac == 'd');
              auVar21[0xd] = -(cStack_2ab == 'd');
              auVar21[0xe] = -(cStack_2aa == 'r');
              auVar21[0xf] = -(cStack_2a9 == 'e');
              auVar21 = auVar21 & auVar7;
              if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
                iVar2 = atoi((char *)&local_1c8);
                this->m_I2CHumidityAddress = (uchar)iVar2;
              }
              else {
                auVar8[0] = -(local_2b8 == 'C');
                auVar8[1] = -(cStack_2b7 == 'o');
                auVar8[2] = -(cStack_2b6 == 'm');
                auVar8[3] = -(cStack_2b5 == 'p');
                auVar8[4] = -(cStack_2b4 == 'a');
                auVar8[5] = -(cStack_2b3 == 's');
                auVar8[6] = -(cStack_2b2 == 's');
                auVar8[7] = -(cStack_2b1 == 'C');
                auVar8[8] = -(cStack_2b0 == 'a');
                auVar8[9] = -(cStack_2af == 'l');
                auVar8[10] = -(cStack_2ae == 'V');
                auVar8[0xb] = -(cStack_2ad == 'a');
                auVar8[0xc] = -(cStack_2ac == 'l');
                auVar8[0xd] = -(cStack_2ab == 'i');
                auVar8[0xe] = -(cStack_2aa == 'd');
                auVar8[0xf] = -(cStack_2a9 == '\0');
                if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
                  this->m_compassCalValid = local_1c4 == '\0' && local_1c8 == 0x65757274;
                }
                else if (CONCAT17(cStack_2aa,
                                  CONCAT16(cStack_2ab,
                                           CONCAT15(cStack_2ac,
                                                    CONCAT14(cStack_2ad,
                                                             CONCAT13(cStack_2ae,
                                                                      CONCAT12(cStack_2af,
                                                                               CONCAT11(cStack_2b0,
                                                                                        cStack_2b1))
                                                                     ))))) == 0x586e694d6c6143 &&
                         CONCAT17(cStack_2b1,
                                  CONCAT16(cStack_2b2,
                                           CONCAT15(cStack_2b3,
                                                    CONCAT14(cStack_2b4,
                                                             CONCAT13(cStack_2b5,
                                                                      CONCAT12(cStack_2b6,
                                                                               CONCAT11(cStack_2b7,
                                                                                        local_2b8)))
                                                            )))) == 0x43737361706d6f43) {
                  __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                  (this->m_compassCalMin).m_data[0] = local_2bc;
                }
                else if (CONCAT17(cStack_2aa,
                                  CONCAT16(cStack_2ab,
                                           CONCAT15(cStack_2ac,
                                                    CONCAT14(cStack_2ad,
                                                             CONCAT13(cStack_2ae,
                                                                      CONCAT12(cStack_2af,
                                                                               CONCAT11(cStack_2b0,
                                                                                        cStack_2b1))
                                                                     ))))) == 0x596e694d6c6143 &&
                         CONCAT17(cStack_2b1,
                                  CONCAT16(cStack_2b2,
                                           CONCAT15(cStack_2b3,
                                                    CONCAT14(cStack_2b4,
                                                             CONCAT13(cStack_2b5,
                                                                      CONCAT12(cStack_2b6,
                                                                               CONCAT11(cStack_2b7,
                                                                                        local_2b8)))
                                                            )))) == 0x43737361706d6f43) {
                  __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                  (this->m_compassCalMin).m_data[1] = local_2bc;
                }
                else if (CONCAT17(cStack_2aa,
                                  CONCAT16(cStack_2ab,
                                           CONCAT15(cStack_2ac,
                                                    CONCAT14(cStack_2ad,
                                                             CONCAT13(cStack_2ae,
                                                                      CONCAT12(cStack_2af,
                                                                               CONCAT11(cStack_2b0,
                                                                                        cStack_2b1))
                                                                     ))))) == 0x5a6e694d6c6143 &&
                         CONCAT17(cStack_2b1,
                                  CONCAT16(cStack_2b2,
                                           CONCAT15(cStack_2b3,
                                                    CONCAT14(cStack_2b4,
                                                             CONCAT13(cStack_2b5,
                                                                      CONCAT12(cStack_2b6,
                                                                               CONCAT11(cStack_2b7,
                                                                                        local_2b8)))
                                                            )))) == 0x43737361706d6f43) {
                  __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                  (this->m_compassCalMin).m_data[2] = local_2bc;
                }
                else if (CONCAT17(cStack_2aa,
                                  CONCAT16(cStack_2ab,
                                           CONCAT15(cStack_2ac,
                                                    CONCAT14(cStack_2ad,
                                                             CONCAT13(cStack_2ae,
                                                                      CONCAT12(cStack_2af,
                                                                               CONCAT11(cStack_2b0,
                                                                                        cStack_2b1))
                                                                     ))))) == 0x5878614d6c6143 &&
                         CONCAT17(cStack_2b1,
                                  CONCAT16(cStack_2b2,
                                           CONCAT15(cStack_2b3,
                                                    CONCAT14(cStack_2b4,
                                                             CONCAT13(cStack_2b5,
                                                                      CONCAT12(cStack_2b6,
                                                                               CONCAT11(cStack_2b7,
                                                                                        local_2b8)))
                                                            )))) == 0x43737361706d6f43) {
                  __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                  (this->m_compassCalMax).m_data[0] = local_2bc;
                }
                else if (CONCAT17(cStack_2aa,
                                  CONCAT16(cStack_2ab,
                                           CONCAT15(cStack_2ac,
                                                    CONCAT14(cStack_2ad,
                                                             CONCAT13(cStack_2ae,
                                                                      CONCAT12(cStack_2af,
                                                                               CONCAT11(cStack_2b0,
                                                                                        cStack_2b1))
                                                                     ))))) == 0x5978614d6c6143 &&
                         CONCAT17(cStack_2b1,
                                  CONCAT16(cStack_2b2,
                                           CONCAT15(cStack_2b3,
                                                    CONCAT14(cStack_2b4,
                                                             CONCAT13(cStack_2b5,
                                                                      CONCAT12(cStack_2b6,
                                                                               CONCAT11(cStack_2b7,
                                                                                        local_2b8)))
                                                            )))) == 0x43737361706d6f43) {
                  __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                  (this->m_compassCalMax).m_data[1] = local_2bc;
                }
                else if (CONCAT17(cStack_2aa,
                                  CONCAT16(cStack_2ab,
                                           CONCAT15(cStack_2ac,
                                                    CONCAT14(cStack_2ad,
                                                             CONCAT13(cStack_2ae,
                                                                      CONCAT12(cStack_2af,
                                                                               CONCAT11(cStack_2b0,
                                                                                        cStack_2b1))
                                                                     ))))) == 0x5a78614d6c6143 &&
                         CONCAT17(cStack_2b1,
                                  CONCAT16(cStack_2b2,
                                           CONCAT15(cStack_2b3,
                                                    CONCAT14(cStack_2b4,
                                                             CONCAT13(cStack_2b5,
                                                                      CONCAT12(cStack_2b6,
                                                                               CONCAT11(cStack_2b7,
                                                                                        local_2b8)))
                                                            )))) == 0x43737361706d6f43) {
                  __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                  (this->m_compassCalMax).m_data[2] = local_2bc;
                }
                else {
                  auVar9[0] = -(cStack_2b2 == 's');
                  auVar9[1] = -(cStack_2b1 == 'A');
                  auVar9[2] = -(cStack_2b0 == 'd');
                  auVar9[3] = -(cStack_2af == 'j');
                  auVar9[4] = -(cStack_2ae == 'D');
                  auVar9[5] = -(cStack_2ad == 'e');
                  auVar9[6] = -(cStack_2ac == 'c');
                  auVar9[7] = -(cStack_2ab == 'l');
                  auVar9[8] = -(cStack_2aa == 'i');
                  auVar9[9] = -(cStack_2a9 == 'n');
                  auVar9[10] = -(local_2a8 == 'a');
                  auVar9[0xb] = -(cStack_2a7 == 't');
                  auVar9[0xc] = -(cStack_2a6 == 'i');
                  auVar9[0xd] = -(cStack_2a5 == 'o');
                  auVar9[0xe] = -(cStack_2a4 == 'n');
                  auVar9[0xf] = -(cStack_2a3 == '\0');
                  auVar22[0] = -(local_2b8 == 'c');
                  auVar22[1] = -(cStack_2b7 == 'o');
                  auVar22[2] = -(cStack_2b6 == 'm');
                  auVar22[3] = -(cStack_2b5 == 'p');
                  auVar22[4] = -(cStack_2b4 == 'a');
                  auVar22[5] = -(cStack_2b3 == 's');
                  auVar22[6] = -(cStack_2b2 == 's');
                  auVar22[7] = -(cStack_2b1 == 'A');
                  auVar22[8] = -(cStack_2b0 == 'd');
                  auVar22[9] = -(cStack_2af == 'j');
                  auVar22[10] = -(cStack_2ae == 'D');
                  auVar22[0xb] = -(cStack_2ad == 'e');
                  auVar22[0xc] = -(cStack_2ac == 'c');
                  auVar22[0xd] = -(cStack_2ab == 'l');
                  auVar22[0xe] = -(cStack_2aa == 'i');
                  auVar22[0xf] = -(cStack_2a9 == 'n');
                  auVar22 = auVar22 & auVar9;
                  if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff) {
                    __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                    this->m_compassAdjDeclination = local_2bc;
                  }
                  else {
                    auVar10[0] = -(cStack_2af == 'l');
                    auVar10[1] = -(cStack_2ae == 'E');
                    auVar10[2] = -(cStack_2ad == 'l');
                    auVar10[3] = -(cStack_2ac == 'l');
                    auVar10[4] = -(cStack_2ab == 'i');
                    auVar10[5] = -(cStack_2aa == 'p');
                    auVar10[6] = -(cStack_2a9 == 's');
                    auVar10[7] = -(local_2a8 == 'o');
                    auVar10[8] = -(cStack_2a7 == 'i');
                    auVar10[9] = -(cStack_2a6 == 'd');
                    auVar10[10] = -(cStack_2a5 == 'V');
                    auVar10[0xb] = -(cStack_2a4 == 'a');
                    auVar10[0xc] = -(cStack_2a3 == 'l');
                    auVar10[0xd] = -(cStack_2a2 == 'i');
                    auVar10[0xe] = -(cStack_2a1 == 'd');
                    auVar10[0xf] = -(cStack_2a0 == '\0');
                    auVar23[0] = -(local_2b8 == 'c');
                    auVar23[1] = -(cStack_2b7 == 'o');
                    auVar23[2] = -(cStack_2b6 == 'm');
                    auVar23[3] = -(cStack_2b5 == 'p');
                    auVar23[4] = -(cStack_2b4 == 'a');
                    auVar23[5] = -(cStack_2b3 == 's');
                    auVar23[6] = -(cStack_2b2 == 's');
                    auVar23[7] = -(cStack_2b1 == 'C');
                    auVar23[8] = -(cStack_2b0 == 'a');
                    auVar23[9] = -(cStack_2af == 'l');
                    auVar23[10] = -(cStack_2ae == 'E');
                    auVar23[0xb] = -(cStack_2ad == 'l');
                    auVar23[0xc] = -(cStack_2ac == 'l');
                    auVar23[0xd] = -(cStack_2ab == 'i');
                    auVar23[0xe] = -(cStack_2aa == 'p');
                    auVar23[0xf] = -(cStack_2a9 == 's');
                    auVar23 = auVar23 & auVar10;
                    if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff) {
                      this->m_compassCalEllipsoidValid =
                           local_1c4 == '\0' && local_1c8 == 0x65757274;
                    }
                    else {
                      auVar11[0] = -(local_2a8 == 'X');
                      auVar11[1] = -(cStack_2a7 == '\0');
                      auVar11[2] = 0xff;
                      auVar11[3] = 0xff;
                      auVar11[4] = 0xff;
                      auVar11[5] = 0xff;
                      auVar11[6] = 0xff;
                      auVar11[7] = 0xff;
                      auVar11[8] = 0xff;
                      auVar11[9] = 0xff;
                      auVar11[10] = 0xff;
                      auVar11[0xb] = 0xff;
                      auVar11[0xc] = 0xff;
                      auVar11[0xd] = 0xff;
                      auVar11[0xe] = 0xff;
                      auVar11[0xf] = 0xff;
                      auVar24[0] = -(local_2b8 == 'c');
                      auVar24[1] = -(cStack_2b7 == 'o');
                      auVar24[2] = -(cStack_2b6 == 'm');
                      auVar24[3] = -(cStack_2b5 == 'p');
                      auVar24[4] = -(cStack_2b4 == 'a');
                      auVar24[5] = -(cStack_2b3 == 's');
                      auVar24[6] = -(cStack_2b2 == 's');
                      auVar24[7] = -(cStack_2b1 == 'C');
                      auVar24[8] = -(cStack_2b0 == 'a');
                      auVar24[9] = -(cStack_2af == 'l');
                      auVar24[10] = -(cStack_2ae == 'O');
                      auVar24[0xb] = -(cStack_2ad == 'f');
                      auVar24[0xc] = -(cStack_2ac == 'f');
                      auVar24[0xd] = -(cStack_2ab == 's');
                      auVar24[0xe] = -(cStack_2aa == 'e');
                      auVar24[0xf] = -(cStack_2a9 == 't');
                      auVar24 = auVar24 & auVar11;
                      if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
                        __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                        (this->m_compassCalEllipsoidOffset).m_data[0] = local_2bc;
                      }
                      else {
                        auVar12[0] = -(local_2a8 == 'Y');
                        auVar12[1] = -(cStack_2a7 == '\0');
                        auVar12[2] = 0xff;
                        auVar12[3] = 0xff;
                        auVar12[4] = 0xff;
                        auVar12[5] = 0xff;
                        auVar12[6] = 0xff;
                        auVar12[7] = 0xff;
                        auVar12[8] = 0xff;
                        auVar12[9] = 0xff;
                        auVar12[10] = 0xff;
                        auVar12[0xb] = 0xff;
                        auVar12[0xc] = 0xff;
                        auVar12[0xd] = 0xff;
                        auVar12[0xe] = 0xff;
                        auVar12[0xf] = 0xff;
                        auVar25[0] = -(local_2b8 == (char)local_1d8);
                        auVar25[1] = -(cStack_2b7 == local_1d8._1_1_);
                        auVar25[2] = -(cStack_2b6 == local_1d8._2_1_);
                        auVar25[3] = -(cStack_2b5 == local_1d8._3_1_);
                        auVar25[4] = -(cStack_2b4 == local_1d8._4_1_);
                        auVar25[5] = -(cStack_2b3 == local_1d8._5_1_);
                        auVar25[6] = -(cStack_2b2 == local_1d8._6_1_);
                        auVar25[7] = -(cStack_2b1 == local_1d8._7_1_);
                        auVar25[8] = -(cStack_2b0 == (char)uStack_1d0);
                        auVar25[9] = -(cStack_2af == uStack_1d0._1_1_);
                        auVar25[10] = -(cStack_2ae == uStack_1d0._2_1_);
                        auVar25[0xb] = -(cStack_2ad == uStack_1d0._3_1_);
                        auVar25[0xc] = -(cStack_2ac == uStack_1d0._4_1_);
                        auVar25[0xd] = -(cStack_2ab == uStack_1d0._5_1_);
                        auVar25[0xe] = -(cStack_2aa == uStack_1d0._6_1_);
                        auVar25[0xf] = -(cStack_2a9 == uStack_1d0._7_1_);
                        auVar25 = auVar25 & auVar12;
                        if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff) {
                          __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                          (this->m_compassCalEllipsoidOffset).m_data[1] = local_2bc;
                        }
                        else {
                          auVar13[0] = -(local_2a8 == 'Z');
                          auVar13[1] = -(cStack_2a7 == '\0');
                          auVar13[2] = 0xff;
                          auVar13[3] = 0xff;
                          auVar13[4] = 0xff;
                          auVar13[5] = 0xff;
                          auVar13[6] = 0xff;
                          auVar13[7] = 0xff;
                          auVar13[8] = 0xff;
                          auVar13[9] = 0xff;
                          auVar13[10] = 0xff;
                          auVar13[0xb] = 0xff;
                          auVar13[0xc] = 0xff;
                          auVar13[0xd] = 0xff;
                          auVar13[0xe] = 0xff;
                          auVar13[0xf] = 0xff;
                          auVar26[0] = -(local_2b8 == (char)local_1d8);
                          auVar26[1] = -(cStack_2b7 == local_1d8._1_1_);
                          auVar26[2] = -(cStack_2b6 == local_1d8._2_1_);
                          auVar26[3] = -(cStack_2b5 == local_1d8._3_1_);
                          auVar26[4] = -(cStack_2b4 == local_1d8._4_1_);
                          auVar26[5] = -(cStack_2b3 == local_1d8._5_1_);
                          auVar26[6] = -(cStack_2b2 == local_1d8._6_1_);
                          auVar26[7] = -(cStack_2b1 == local_1d8._7_1_);
                          auVar26[8] = -(cStack_2b0 == (char)uStack_1d0);
                          auVar26[9] = -(cStack_2af == uStack_1d0._1_1_);
                          auVar26[10] = -(cStack_2ae == uStack_1d0._2_1_);
                          auVar26[0xb] = -(cStack_2ad == uStack_1d0._3_1_);
                          auVar26[0xc] = -(cStack_2ac == uStack_1d0._4_1_);
                          auVar26[0xd] = -(cStack_2ab == uStack_1d0._5_1_);
                          auVar26[0xe] = -(cStack_2aa == uStack_1d0._6_1_);
                          auVar26[0xf] = -(cStack_2a9 == uStack_1d0._7_1_);
                          auVar26 = auVar26 & auVar13;
                          if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) == 0xffff) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            (this->m_compassCalEllipsoidOffset).m_data[2] = local_2bc;
                          }
                          else if ((local_2a8 == '\0' &&
                                   CONCAT17(cStack_2b1,
                                            CONCAT16(cStack_2b2,
                                                     CONCAT15(cStack_2b3,
                                                              CONCAT14(cStack_2b4,
                                                                       CONCAT13(cStack_2b5,
                                                                                CONCAT12(cStack_2b6,
                                                                                         CONCAT11(
                                                  cStack_2b7,local_2b8))))))) == 0x43737361706d6f63)
                                   && CONCAT17(cStack_2a9,
                                               CONCAT16(cStack_2aa,
                                                        CONCAT15(cStack_2ab,
                                                                 CONCAT14(cStack_2ac,
                                                                          CONCAT13(cStack_2ad,
                                                                                   CONCAT12(
                                                  cStack_2ae,CONCAT11(cStack_2af,cStack_2b0)))))))
                                      == 0x313172726f436c61) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            this->m_compassCalEllipsoidCorr[0][0] = local_2bc;
                          }
                          else if ((local_2a8 == '\0' &&
                                   CONCAT17(cStack_2b1,
                                            CONCAT16(cStack_2b2,
                                                     CONCAT15(cStack_2b3,
                                                              CONCAT14(cStack_2b4,
                                                                       CONCAT13(cStack_2b5,
                                                                                CONCAT12(cStack_2b6,
                                                                                         CONCAT11(
                                                  cStack_2b7,local_2b8))))))) == 0x43737361706d6f63)
                                   && CONCAT17(cStack_2a9,
                                               CONCAT16(cStack_2aa,
                                                        CONCAT15(cStack_2ab,
                                                                 CONCAT14(cStack_2ac,
                                                                          CONCAT13(cStack_2ad,
                                                                                   CONCAT12(
                                                  cStack_2ae,CONCAT11(cStack_2af,cStack_2b0)))))))
                                      == 0x323172726f436c61) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            this->m_compassCalEllipsoidCorr[0][1] = local_2bc;
                          }
                          else if ((local_2a8 == '\0' &&
                                   CONCAT17(cStack_2b1,
                                            CONCAT16(cStack_2b2,
                                                     CONCAT15(cStack_2b3,
                                                              CONCAT14(cStack_2b4,
                                                                       CONCAT13(cStack_2b5,
                                                                                CONCAT12(cStack_2b6,
                                                                                         CONCAT11(
                                                  cStack_2b7,local_2b8))))))) == 0x43737361706d6f63)
                                   && CONCAT17(cStack_2a9,
                                               CONCAT16(cStack_2aa,
                                                        CONCAT15(cStack_2ab,
                                                                 CONCAT14(cStack_2ac,
                                                                          CONCAT13(cStack_2ad,
                                                                                   CONCAT12(
                                                  cStack_2ae,CONCAT11(cStack_2af,cStack_2b0)))))))
                                      == 0x333172726f436c61) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            this->m_compassCalEllipsoidCorr[0][2] = local_2bc;
                          }
                          else if ((local_2a8 == '\0' &&
                                   CONCAT17(cStack_2b1,
                                            CONCAT16(cStack_2b2,
                                                     CONCAT15(cStack_2b3,
                                                              CONCAT14(cStack_2b4,
                                                                       CONCAT13(cStack_2b5,
                                                                                CONCAT12(cStack_2b6,
                                                                                         CONCAT11(
                                                  cStack_2b7,local_2b8))))))) == 0x43737361706d6f63)
                                   && CONCAT17(cStack_2a9,
                                               CONCAT16(cStack_2aa,
                                                        CONCAT15(cStack_2ab,
                                                                 CONCAT14(cStack_2ac,
                                                                          CONCAT13(cStack_2ad,
                                                                                   CONCAT12(
                                                  cStack_2ae,CONCAT11(cStack_2af,cStack_2b0)))))))
                                      == 0x313272726f436c61) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            this->m_compassCalEllipsoidCorr[1][0] = local_2bc;
                          }
                          else if ((local_2a8 == '\0' &&
                                   CONCAT17(cStack_2b1,
                                            CONCAT16(cStack_2b2,
                                                     CONCAT15(cStack_2b3,
                                                              CONCAT14(cStack_2b4,
                                                                       CONCAT13(cStack_2b5,
                                                                                CONCAT12(cStack_2b6,
                                                                                         CONCAT11(
                                                  cStack_2b7,local_2b8))))))) == 0x43737361706d6f63)
                                   && CONCAT17(cStack_2a9,
                                               CONCAT16(cStack_2aa,
                                                        CONCAT15(cStack_2ab,
                                                                 CONCAT14(cStack_2ac,
                                                                          CONCAT13(cStack_2ad,
                                                                                   CONCAT12(
                                                  cStack_2ae,CONCAT11(cStack_2af,cStack_2b0)))))))
                                      == 0x323272726f436c61) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            this->m_compassCalEllipsoidCorr[1][1] = local_2bc;
                          }
                          else if ((local_2a8 == '\0' &&
                                   CONCAT17(cStack_2b1,
                                            CONCAT16(cStack_2b2,
                                                     CONCAT15(cStack_2b3,
                                                              CONCAT14(cStack_2b4,
                                                                       CONCAT13(cStack_2b5,
                                                                                CONCAT12(cStack_2b6,
                                                                                         CONCAT11(
                                                  cStack_2b7,local_2b8))))))) == 0x43737361706d6f63)
                                   && CONCAT17(cStack_2a9,
                                               CONCAT16(cStack_2aa,
                                                        CONCAT15(cStack_2ab,
                                                                 CONCAT14(cStack_2ac,
                                                                          CONCAT13(cStack_2ad,
                                                                                   CONCAT12(
                                                  cStack_2ae,CONCAT11(cStack_2af,cStack_2b0)))))))
                                      == 0x333272726f436c61) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            this->m_compassCalEllipsoidCorr[1][2] = local_2bc;
                          }
                          else if ((local_2a8 == '\0' &&
                                   CONCAT17(cStack_2b1,
                                            CONCAT16(cStack_2b2,
                                                     CONCAT15(cStack_2b3,
                                                              CONCAT14(cStack_2b4,
                                                                       CONCAT13(cStack_2b5,
                                                                                CONCAT12(cStack_2b6,
                                                                                         CONCAT11(
                                                  cStack_2b7,local_2b8))))))) == 0x43737361706d6f63)
                                   && CONCAT17(cStack_2a9,
                                               CONCAT16(cStack_2aa,
                                                        CONCAT15(cStack_2ab,
                                                                 CONCAT14(cStack_2ac,
                                                                          CONCAT13(cStack_2ad,
                                                                                   CONCAT12(
                                                  cStack_2ae,CONCAT11(cStack_2af,cStack_2b0)))))))
                                      == 0x313372726f436c61) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            this->m_compassCalEllipsoidCorr[2][0] = local_2bc;
                          }
                          else if ((local_2a8 == '\0' &&
                                   CONCAT17(cStack_2b1,
                                            CONCAT16(cStack_2b2,
                                                     CONCAT15(cStack_2b3,
                                                              CONCAT14(cStack_2b4,
                                                                       CONCAT13(cStack_2b5,
                                                                                CONCAT12(cStack_2b6,
                                                                                         CONCAT11(
                                                  cStack_2b7,local_2b8))))))) == 0x43737361706d6f63)
                                   && CONCAT17(cStack_2a9,
                                               CONCAT16(cStack_2aa,
                                                        CONCAT15(cStack_2ab,
                                                                 CONCAT14(cStack_2ac,
                                                                          CONCAT13(cStack_2ad,
                                                                                   CONCAT12(
                                                  cStack_2ae,CONCAT11(cStack_2af,cStack_2b0)))))))
                                      == 0x323372726f436c61) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            this->m_compassCalEllipsoidCorr[2][1] = local_2bc;
                          }
                          else if ((local_2a8 == '\0' &&
                                   CONCAT17(cStack_2b1,
                                            CONCAT16(cStack_2b2,
                                                     CONCAT15(cStack_2b3,
                                                              CONCAT14(cStack_2b4,
                                                                       CONCAT13(cStack_2b5,
                                                                                CONCAT12(cStack_2b6,
                                                                                         CONCAT11(
                                                  cStack_2b7,local_2b8))))))) == 0x43737361706d6f63)
                                   && CONCAT17(cStack_2a9,
                                               CONCAT16(cStack_2aa,
                                                        CONCAT15(cStack_2ab,
                                                                 CONCAT14(cStack_2ac,
                                                                          CONCAT13(cStack_2ad,
                                                                                   CONCAT12(
                                                  cStack_2ae,CONCAT11(cStack_2af,cStack_2b0)))))))
                                      == 0x333372726f436c61) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            this->m_compassCalEllipsoidCorr[2][2] = local_2bc;
                          }
                          else if (CONCAT17(cStack_2ab,
                                            CONCAT16(cStack_2ac,
                                                     CONCAT15(cStack_2ad,
                                                              CONCAT14(cStack_2ae,
                                                                       CONCAT13(cStack_2af,
                                                                                CONCAT12(cStack_2b0,
                                                                                         CONCAT11(
                                                  cStack_2b1,cStack_2b2))))))) == 0x64696c61566c61
                                   && CONCAT17(cStack_2b1,
                                               CONCAT16(cStack_2b2,
                                                        CONCAT15(cStack_2b3,
                                                                 CONCAT14(cStack_2b4,
                                                                          CONCAT13(cStack_2b5,
                                                                                   CONCAT12(
                                                  cStack_2b6,CONCAT11(cStack_2b7,local_2b8))))))) ==
                                      0x6c61436c65636341) {
                            this->m_accelCalValid = local_1c4 == '\0' && local_1c8 == 0x65757274;
                          }
                          else if (CONCAT17(cStack_2ac,
                                            CONCAT16(cStack_2ad,
                                                     CONCAT15(cStack_2ae,
                                                              CONCAT14(cStack_2af,
                                                                       CONCAT13(cStack_2b0,
                                                                                CONCAT12(cStack_2b1,
                                                                                         CONCAT11(
                                                  cStack_2b2,cStack_2b3))))))) == 0x586e694d6c6143
                                   && CONCAT17(cStack_2b1,
                                               CONCAT16(cStack_2b2,
                                                        CONCAT15(cStack_2b3,
                                                                 CONCAT14(cStack_2b4,
                                                                          CONCAT13(cStack_2b5,
                                                                                   CONCAT12(
                                                  cStack_2b6,CONCAT11(cStack_2b7,local_2b8))))))) ==
                                      0x6c61436c65636341) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            (this->m_accelCalMin).m_data[0] = local_2bc;
                          }
                          else if (CONCAT17(cStack_2ac,
                                            CONCAT16(cStack_2ad,
                                                     CONCAT15(cStack_2ae,
                                                              CONCAT14(cStack_2af,
                                                                       CONCAT13(cStack_2b0,
                                                                                CONCAT12(cStack_2b1,
                                                                                         CONCAT11(
                                                  cStack_2b2,cStack_2b3))))))) == 0x596e694d6c6143
                                   && CONCAT17(cStack_2b1,
                                               CONCAT16(cStack_2b2,
                                                        CONCAT15(cStack_2b3,
                                                                 CONCAT14(cStack_2b4,
                                                                          CONCAT13(cStack_2b5,
                                                                                   CONCAT12(
                                                  cStack_2b6,CONCAT11(cStack_2b7,local_2b8))))))) ==
                                      0x6c61436c65636341) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            (this->m_accelCalMin).m_data[1] = local_2bc;
                          }
                          else if (CONCAT17(cStack_2ac,
                                            CONCAT16(cStack_2ad,
                                                     CONCAT15(cStack_2ae,
                                                              CONCAT14(cStack_2af,
                                                                       CONCAT13(cStack_2b0,
                                                                                CONCAT12(cStack_2b1,
                                                                                         CONCAT11(
                                                  cStack_2b2,cStack_2b3))))))) == 0x5a6e694d6c6143
                                   && CONCAT17(cStack_2b1,
                                               CONCAT16(cStack_2b2,
                                                        CONCAT15(cStack_2b3,
                                                                 CONCAT14(cStack_2b4,
                                                                          CONCAT13(cStack_2b5,
                                                                                   CONCAT12(
                                                  cStack_2b6,CONCAT11(cStack_2b7,local_2b8))))))) ==
                                      0x6c61436c65636341) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            (this->m_accelCalMin).m_data[2] = local_2bc;
                          }
                          else if (CONCAT17(cStack_2ac,
                                            CONCAT16(cStack_2ad,
                                                     CONCAT15(cStack_2ae,
                                                              CONCAT14(cStack_2af,
                                                                       CONCAT13(cStack_2b0,
                                                                                CONCAT12(cStack_2b1,
                                                                                         CONCAT11(
                                                  cStack_2b2,cStack_2b3))))))) == 0x5878614d6c6143
                                   && CONCAT17(cStack_2b1,
                                               CONCAT16(cStack_2b2,
                                                        CONCAT15(cStack_2b3,
                                                                 CONCAT14(cStack_2b4,
                                                                          CONCAT13(cStack_2b5,
                                                                                   CONCAT12(
                                                  cStack_2b6,CONCAT11(cStack_2b7,local_2b8))))))) ==
                                      0x6c61436c65636341) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            (this->m_accelCalMax).m_data[0] = local_2bc;
                          }
                          else if (CONCAT17(cStack_2ac,
                                            CONCAT16(cStack_2ad,
                                                     CONCAT15(cStack_2ae,
                                                              CONCAT14(cStack_2af,
                                                                       CONCAT13(cStack_2b0,
                                                                                CONCAT12(cStack_2b1,
                                                                                         CONCAT11(
                                                  cStack_2b2,cStack_2b3))))))) == 0x5978614d6c6143
                                   && CONCAT17(cStack_2b1,
                                               CONCAT16(cStack_2b2,
                                                        CONCAT15(cStack_2b3,
                                                                 CONCAT14(cStack_2b4,
                                                                          CONCAT13(cStack_2b5,
                                                                                   CONCAT12(
                                                  cStack_2b6,CONCAT11(cStack_2b7,local_2b8))))))) ==
                                      0x6c61436c65636341) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            (this->m_accelCalMax).m_data[1] = local_2bc;
                          }
                          else if (CONCAT17(cStack_2ac,
                                            CONCAT16(cStack_2ad,
                                                     CONCAT15(cStack_2ae,
                                                              CONCAT14(cStack_2af,
                                                                       CONCAT13(cStack_2b0,
                                                                                CONCAT12(cStack_2b1,
                                                                                         CONCAT11(
                                                  cStack_2b2,cStack_2b3))))))) == 0x5a78614d6c6143
                                   && CONCAT17(cStack_2b1,
                                               CONCAT16(cStack_2b2,
                                                        CONCAT15(cStack_2b3,
                                                                 CONCAT14(cStack_2b4,
                                                                          CONCAT13(cStack_2b5,
                                                                                   CONCAT12(
                                                  cStack_2b6,CONCAT11(cStack_2b7,local_2b8))))))) ==
                                      0x6c61436c65636341) {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            (this->m_accelCalMax).m_data[2] = local_2bc;
                          }
                          else if (CONCAT17(cStack_2ab,
                                            CONCAT16(cStack_2ac,
                                                     CONCAT15(cStack_2ad,
                                                              CONCAT14(cStack_2ae,
                                                                       CONCAT13(cStack_2af,
                                                                                CONCAT12(cStack_2b0,
                                                                                         CONCAT11(
                                                  cStack_2b1,cStack_2b2))))))) == 0x64696c61567361
                                   && CONCAT17(cStack_2b1,
                                               CONCAT16(cStack_2b2,
                                                        CONCAT15(cStack_2b3,
                                                                 CONCAT14(cStack_2b4,
                                                                          CONCAT13(cStack_2b5,
                                                                                   CONCAT12(
                                                  cStack_2b6,CONCAT11(cStack_2b7,local_2b8))))))) ==
                                      0x736169426f727947) {
                            this->m_gyroBiasValid = local_1c4 == '\0' && local_1c8 == 0x65757274;
                          }
                          else if (CONCAT11(cStack_2af,cStack_2b0) == 0x58 &&
                                   CONCAT17(cStack_2b1,
                                            CONCAT16(cStack_2b2,
                                                     CONCAT15(cStack_2b3,
                                                              CONCAT14(cStack_2b4,
                                                                       CONCAT13(cStack_2b5,
                                                                                CONCAT12(cStack_2b6,
                                                                                         CONCAT11(
                                                  cStack_2b7,local_2b8))))))) == 0x736169426f727947)
                          {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            (this->m_gyroBias).m_data[0] = local_2bc;
                          }
                          else if (CONCAT11(cStack_2af,cStack_2b0) == 0x59 &&
                                   CONCAT17(cStack_2b1,
                                            CONCAT16(cStack_2b2,
                                                     CONCAT15(cStack_2b3,
                                                              CONCAT14(cStack_2b4,
                                                                       CONCAT13(cStack_2b5,
                                                                                CONCAT12(cStack_2b6,
                                                                                         CONCAT11(
                                                  cStack_2b7,local_2b8))))))) == 0x736169426f727947)
                          {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            (this->m_gyroBias).m_data[1] = local_2bc;
                          }
                          else if (CONCAT11(cStack_2af,cStack_2b0) == 0x5a &&
                                   CONCAT17(cStack_2b1,
                                            CONCAT16(cStack_2b2,
                                                     CONCAT15(cStack_2b3,
                                                              CONCAT14(cStack_2b4,
                                                                       CONCAT13(cStack_2b5,
                                                                                CONCAT12(cStack_2b6,
                                                                                         CONCAT11(
                                                  cStack_2b7,local_2b8))))))) == 0x736169426f727947)
                          {
                            __isoc99_sscanf(&local_1c8,"%f",&local_2bc);
                            (this->m_gyroBias).m_data[2] = local_2bc;
                          }
                          else {
                            auVar14[0] = -(cStack_2ad == 'A');
                            auVar14[1] = -(cStack_2ac == 'c');
                            auVar14[2] = -(cStack_2ab == 'c');
                            auVar14[3] = -(cStack_2aa == 'e');
                            auVar14[4] = -(cStack_2a9 == 'l');
                            auVar14[5] = -(local_2a8 == 'S');
                            auVar14[6] = -(cStack_2a7 == 'a');
                            auVar14[7] = -(cStack_2a6 == 'm');
                            auVar14[8] = -(cStack_2a5 == 'p');
                            auVar14[9] = -(cStack_2a4 == 'l');
                            auVar14[10] = -(cStack_2a3 == 'e');
                            auVar14[0xb] = -(cStack_2a2 == 'R');
                            auVar14[0xc] = -(cStack_2a1 == 'a');
                            auVar14[0xd] = -(cStack_2a0 == 't');
                            auVar14[0xe] = -(cStack_29f == 'e');
                            auVar14[0xf] = -(cStack_29e == '\0');
                            auVar27[0] = -(local_2b8 == 'M');
                            auVar27[1] = -(cStack_2b7 == 'P');
                            auVar27[2] = -(cStack_2b6 == 'U');
                            auVar27[3] = -(cStack_2b5 == '9');
                            auVar27[4] = -(cStack_2b4 == '1');
                            auVar27[5] = -(cStack_2b3 == '5');
                            auVar27[6] = -(cStack_2b2 == '0');
                            auVar27[7] = -(cStack_2b1 == 'G');
                            auVar27[8] = -(cStack_2b0 == 'y');
                            auVar27[9] = -(cStack_2af == 'r');
                            auVar27[10] = -(cStack_2ae == 'o');
                            auVar27[0xb] = -(cStack_2ad == 'A');
                            auVar27[0xc] = -(cStack_2ac == 'c');
                            auVar27[0xd] = -(cStack_2ab == 'c');
                            auVar27[0xe] = -(cStack_2aa == 'e');
                            auVar27[0xf] = -(cStack_2a9 == 'l');
                            auVar27 = auVar27 & auVar14;
                            if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                         (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                                        (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff) {
                              iVar2 = atoi((char *)&local_1c8);
                              this->m_MPU9150GyroAccelSampleRate = iVar2;
                            }
                            else {
                              auVar15[0] = -(cStack_2af == 'm');
                              auVar15[1] = -(cStack_2ae == 'p');
                              auVar15[2] = -(cStack_2ad == 'a');
                              auVar15[3] = -(cStack_2ac == 's');
                              auVar15[4] = -(cStack_2ab == 's');
                              auVar15[5] = -(cStack_2aa == 'S');
                              auVar15[6] = -(cStack_2a9 == 'a');
                              auVar15[7] = -(local_2a8 == 'm');
                              auVar15[8] = -(cStack_2a7 == 'p');
                              auVar15[9] = -(cStack_2a6 == 'l');
                              auVar15[10] = -(cStack_2a5 == 'e');
                              auVar15[0xb] = -(cStack_2a4 == 'R');
                              auVar15[0xc] = -(cStack_2a3 == 'a');
                              auVar15[0xd] = -(cStack_2a2 == 't');
                              auVar15[0xe] = -(cStack_2a1 == 'e');
                              auVar15[0xf] = -(cStack_2a0 == '\0');
                              auVar28[0] = -(local_2b8 == 'M');
                              auVar28[1] = -(cStack_2b7 == 'P');
                              auVar28[2] = -(cStack_2b6 == 'U');
                              auVar28[3] = -(cStack_2b5 == '9');
                              auVar28[4] = -(cStack_2b4 == '1');
                              auVar28[5] = -(cStack_2b3 == '5');
                              auVar28[6] = -(cStack_2b2 == '0');
                              auVar28[7] = -(cStack_2b1 == 'C');
                              auVar28[8] = -(cStack_2b0 == 'o');
                              auVar28[9] = -(cStack_2af == 'm');
                              auVar28[10] = -(cStack_2ae == 'p');
                              auVar28[0xb] = -(cStack_2ad == 'a');
                              auVar28[0xc] = -(cStack_2ac == 's');
                              auVar28[0xd] = -(cStack_2ab == 's');
                              auVar28[0xe] = -(cStack_2aa == 'S');
                              auVar28[0xf] = -(cStack_2a9 == 'a');
                              auVar28 = auVar28 & auVar15;
                              if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                                          (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff) {
                                iVar2 = atoi((char *)&local_1c8);
                                this->m_MPU9150CompassSampleRate = iVar2;
                              }
                              else {
                                auVar16[0] = -(local_2b8 == 'M');
                                auVar16[1] = -(cStack_2b7 == 'P');
                                auVar16[2] = -(cStack_2b6 == 'U');
                                auVar16[3] = -(cStack_2b5 == '9');
                                auVar16[4] = -(cStack_2b4 == '1');
                                auVar16[5] = -(cStack_2b3 == '5');
                                auVar16[6] = -(cStack_2b2 == '0');
                                auVar16[7] = -(cStack_2b1 == 'G');
                                auVar16[8] = -(cStack_2b0 == 'y');
                                auVar16[9] = -(cStack_2af == 'r');
                                auVar16[10] = -(cStack_2ae == 'o');
                                auVar16[0xb] = -(cStack_2ad == 'A');
                                auVar16[0xc] = -(cStack_2ac == 'c');
                                auVar16[0xd] = -(cStack_2ab == 'c');
                                auVar16[0xe] = -(cStack_2aa == 'e');
                                auVar16[0xf] = -(cStack_2a9 == 'l');
                                auVar29[0] = -(local_2a8 == 'L');
                                auVar29[1] = -(cStack_2a7 == 'p');
                                auVar29[2] = -(cStack_2a6 == 'f');
                                auVar29[3] = -(cStack_2a5 == '\0');
                                auVar29[4] = 0xff;
                                auVar29[5] = 0xff;
                                auVar29[6] = 0xff;
                                auVar29[7] = 0xff;
                                auVar29[8] = 0xff;
                                auVar29[9] = 0xff;
                                auVar29[10] = 0xff;
                                auVar29[0xb] = 0xff;
                                auVar29[0xc] = 0xff;
                                auVar29[0xd] = 0xff;
                                auVar29[0xe] = 0xff;
                                auVar29[0xf] = 0xff;
                                auVar16 = auVar16 & auVar29;
                                if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                             (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                             (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                             (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                             (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                             (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                             (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                             (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                             (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                             (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                             (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                             (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                             (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                             (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                             (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                                            (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) {
                                  iVar2 = atoi((char *)&local_1c8);
                                  this->m_MPU9150GyroAccelLpf = iVar2;
                                }
                                else if (CONCAT17(cStack_2aa,
                                                  CONCAT16(cStack_2ab,
                                                           CONCAT15(cStack_2ac,
                                                                    CONCAT14(cStack_2ad,
                                                                             CONCAT13(cStack_2ae,
                                                                                      CONCAT12(
                                                  cStack_2af,CONCAT11(cStack_2b0,cStack_2b1)))))))
                                         == 0x5253466f727947 &&
                                         CONCAT17(cStack_2b1,
                                                  CONCAT16(cStack_2b2,
                                                           CONCAT15(cStack_2b3,
                                                                    CONCAT14(cStack_2b4,
                                                                             CONCAT13(cStack_2b5,
                                                                                      CONCAT12(
                                                  cStack_2b6,CONCAT11(cStack_2b7,local_2b8))))))) ==
                                         0x473035313955504d) {
                                  iVar2 = atoi((char *)&local_1c8);
                                  this->m_MPU9150GyroFsr = iVar2;
                                }
                                else {
                                  auVar17[0] = -(local_2b8 == 'M');
                                  auVar17[1] = -(cStack_2b7 == 'P');
                                  auVar17[2] = -(cStack_2b6 == 'U');
                                  auVar17[3] = -(cStack_2b5 == '9');
                                  auVar17[4] = -(cStack_2b4 == '1');
                                  auVar17[5] = -(cStack_2b3 == '5');
                                  auVar17[6] = -(cStack_2b2 == '0');
                                  auVar17[7] = -(cStack_2b1 == 'A');
                                  auVar17[8] = -(cStack_2b0 == 'c');
                                  auVar17[9] = -(cStack_2af == 'c');
                                  auVar17[10] = -(cStack_2ae == 'e');
                                  auVar17[0xb] = -(cStack_2ad == 'l');
                                  auVar17[0xc] = -(cStack_2ac == 'F');
                                  auVar17[0xd] = -(cStack_2ab == 'S');
                                  auVar17[0xe] = -(cStack_2aa == 'R');
                                  auVar17[0xf] = -(cStack_2a9 == '\0');
                                  if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                               (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                               (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                               (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                               (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                               (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                               (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                               (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                               (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                               (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                               (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                               (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                               (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                               (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                                               (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                                              (ushort)(auVar17[0xf] >> 7) << 0xf) == 0xffff) {
                                    iVar2 = atoi((char *)&local_1c8);
                                    this->m_MPU9150AccelFsr = iVar2;
                                  }
                                  else {
                                    auVar30[0] = -(cStack_2ad == 'A');
                                    auVar30[1] = -(cStack_2ac == 'c');
                                    auVar30[2] = -(cStack_2ab == 'c');
                                    auVar30[3] = -(cStack_2aa == 'e');
                                    auVar30[4] = -(cStack_2a9 == 'l');
                                    auVar30[5] = -(local_2a8 == 'S');
                                    auVar30[6] = -(cStack_2a7 == 'a');
                                    auVar30[7] = -(cStack_2a6 == 'm');
                                    auVar30[8] = -(cStack_2a5 == 'p');
                                    auVar30[9] = -(cStack_2a4 == 'l');
                                    auVar30[10] = -(cStack_2a3 == 'e');
                                    auVar30[0xb] = -(cStack_2a2 == 'R');
                                    auVar30[0xc] = -(cStack_2a1 == 'a');
                                    auVar30[0xd] = -(cStack_2a0 == 't');
                                    auVar30[0xe] = -(cStack_29f == 'e');
                                    auVar30[0xf] = -(cStack_29e == '\0');
                                    auVar53[0] = -(local_2b8 == 'M');
                                    auVar53[1] = -(cStack_2b7 == 'P');
                                    auVar53[2] = -(cStack_2b6 == 'U');
                                    auVar53[3] = -(cStack_2b5 == '9');
                                    auVar53[4] = -(cStack_2b4 == '2');
                                    auVar53[5] = -(cStack_2b3 == '5');
                                    auVar53[6] = -(cStack_2b2 == '0');
                                    auVar53[7] = -(cStack_2b1 == 'G');
                                    auVar53[8] = -(cStack_2b0 == 'y');
                                    auVar53[9] = -(cStack_2af == 'r');
                                    auVar53[10] = -(cStack_2ae == 'o');
                                    auVar53[0xb] = -(cStack_2ad == 'A');
                                    auVar53[0xc] = -(cStack_2ac == 'c');
                                    auVar53[0xd] = -(cStack_2ab == 'c');
                                    auVar53[0xe] = -(cStack_2aa == 'e');
                                    auVar53[0xf] = -(cStack_2a9 == 'l');
                                    auVar53 = auVar53 & auVar30;
                                    if ((ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                                                 (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                                                 (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                                                 (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                                                 (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                                                 (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                                                 (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                                                 (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                                                 (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                                                 (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                                                 (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                                                 (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                                                 (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                                                 (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                                                 (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                                                (ushort)(byte)(auVar53[0xf] >> 7) << 0xf) == 0xffff)
                                    {
                                      iVar2 = atoi((char *)&local_1c8);
                                      this->m_MPU9250GyroAccelSampleRate = iVar2;
                                    }
                                    else {
                                      auVar54[0] = -(cStack_2af == 'm');
                                      auVar54[1] = -(cStack_2ae == 'p');
                                      auVar54[2] = -(cStack_2ad == 'a');
                                      auVar54[3] = -(cStack_2ac == 's');
                                      auVar54[4] = -(cStack_2ab == 's');
                                      auVar54[5] = -(cStack_2aa == 'S');
                                      auVar54[6] = -(cStack_2a9 == 'a');
                                      auVar54[7] = -(local_2a8 == 'm');
                                      auVar54[8] = -(cStack_2a7 == 'p');
                                      auVar54[9] = -(cStack_2a6 == 'l');
                                      auVar54[10] = -(cStack_2a5 == 'e');
                                      auVar54[0xb] = -(cStack_2a4 == 'R');
                                      auVar54[0xc] = -(cStack_2a3 == 'a');
                                      auVar54[0xd] = -(cStack_2a2 == 't');
                                      auVar54[0xe] = -(cStack_2a1 == 'e');
                                      auVar54[0xf] = -(cStack_2a0 == '\0');
                                      auVar71[0] = -(local_2b8 == 'M');
                                      auVar71[1] = -(cStack_2b7 == 'P');
                                      auVar71[2] = -(cStack_2b6 == 'U');
                                      auVar71[3] = -(cStack_2b5 == '9');
                                      auVar71[4] = -(cStack_2b4 == '2');
                                      auVar71[5] = -(cStack_2b3 == '5');
                                      auVar71[6] = -(cStack_2b2 == '0');
                                      auVar71[7] = -(cStack_2b1 == 'C');
                                      auVar71[8] = -(cStack_2b0 == 'o');
                                      auVar71[9] = -(cStack_2af == 'm');
                                      auVar71[10] = -(cStack_2ae == 'p');
                                      auVar71[0xb] = -(cStack_2ad == 'a');
                                      auVar71[0xc] = -(cStack_2ac == 's');
                                      auVar71[0xd] = -(cStack_2ab == 's');
                                      auVar71[0xe] = -(cStack_2aa == 'S');
                                      auVar71[0xf] = -(cStack_2a9 == 'a');
                                      auVar71 = auVar71 & auVar54;
                                      if ((ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) |
                                                   (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                                                   (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                                                   (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                                                   (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                                                   (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                                                   (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                                                   (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                                                   (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                                                   (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                                                   (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                                                   (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                                                   (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                                                   (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                                                   (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(byte)(auVar71[0xf] >> 7) << 0xf) ==
                                          0xffff) {
                                        iVar2 = atoi((char *)&local_1c8);
                                        this->m_MPU9250CompassSampleRate = iVar2;
                                      }
                                      else if (CONCAT17(cStack_2aa,
                                                        CONCAT16(cStack_2ab,
                                                                 CONCAT15(cStack_2ac,
                                                                          CONCAT14(cStack_2ad,
                                                                                   CONCAT13(
                                                  cStack_2ae,
                                                  CONCAT12(cStack_2af,
                                                           CONCAT11(cStack_2b0,cStack_2b1))))))) ==
                                               0x66704c6f727947 &&
                                               CONCAT17(cStack_2b1,
                                                        CONCAT16(cStack_2b2,
                                                                 CONCAT15(cStack_2b3,
                                                                          CONCAT14(cStack_2b4,
                                                                                   CONCAT13(
                                                  cStack_2b5,
                                                  CONCAT12(cStack_2b6,CONCAT11(cStack_2b7,local_2b8)
                                                          )))))) == 0x473035323955504d) {
                                        iVar2 = atoi((char *)&local_1c8);
                                        this->m_MPU9250GyroLpf = iVar2;
                                      }
                                      else {
                                        auVar55[0] = -(local_2b8 == 'M');
                                        auVar55[1] = -(cStack_2b7 == 'P');
                                        auVar55[2] = -(cStack_2b6 == 'U');
                                        auVar55[3] = -(cStack_2b5 == '9');
                                        auVar55[4] = -(cStack_2b4 == '2');
                                        auVar55[5] = -(cStack_2b3 == '5');
                                        auVar55[6] = -(cStack_2b2 == '0');
                                        auVar55[7] = -(cStack_2b1 == 'A');
                                        auVar55[8] = -(cStack_2b0 == 'c');
                                        auVar55[9] = -(cStack_2af == 'c');
                                        auVar55[10] = -(cStack_2ae == 'e');
                                        auVar55[0xb] = -(cStack_2ad == 'l');
                                        auVar55[0xc] = -(cStack_2ac == 'L');
                                        auVar55[0xd] = -(cStack_2ab == 'p');
                                        auVar55[0xe] = -(cStack_2aa == 'f');
                                        auVar55[0xf] = -(cStack_2a9 == '\0');
                                        if ((ushort)((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                                                     (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                                                     (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                                                     (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                                                     (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                                                     (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                                                     (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                                                     (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                                                     (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                                                     (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                                                     (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                                                     (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb
                                                     | (ushort)(SUB161(auVar55 >> 0x67,0) & 1) <<
                                                       0xc | (ushort)(SUB161(auVar55 >> 0x6f,0) & 1)
                                                             << 0xd |
                                                     (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe
                                                    | (ushort)(auVar55[0xf] >> 7) << 0xf) == 0xffff)
                                        {
                                          iVar2 = atoi((char *)&local_1c8);
                                          this->m_MPU9250AccelLpf = iVar2;
                                        }
                                        else if (CONCAT17(cStack_2aa,
                                                          CONCAT16(cStack_2ab,
                                                                   CONCAT15(cStack_2ac,
                                                                            CONCAT14(cStack_2ad,
                                                                                     CONCAT13(
                                                  cStack_2ae,
                                                  CONCAT12(cStack_2af,
                                                           CONCAT11(cStack_2b0,cStack_2b1))))))) ==
                                                 0x5253466f727947 &&
                                                 CONCAT17(cStack_2b1,
                                                          CONCAT16(cStack_2b2,
                                                                   CONCAT15(cStack_2b3,
                                                                            CONCAT14(cStack_2b4,
                                                                                     CONCAT13(
                                                  cStack_2b5,
                                                  CONCAT12(cStack_2b6,CONCAT11(cStack_2b7,local_2b8)
                                                          )))))) == 0x473035323955504d) {
                                          iVar2 = atoi((char *)&local_1c8);
                                          this->m_MPU9250GyroFsr = iVar2;
                                        }
                                        else {
                                          auVar56[0] = -(local_2b8 == 'M');
                                          auVar56[1] = -(cStack_2b7 == 'P');
                                          auVar56[2] = -(cStack_2b6 == 'U');
                                          auVar56[3] = -(cStack_2b5 == '9');
                                          auVar56[4] = -(cStack_2b4 == '2');
                                          auVar56[5] = -(cStack_2b3 == '5');
                                          auVar56[6] = -(cStack_2b2 == '0');
                                          auVar56[7] = -(cStack_2b1 == 'A');
                                          auVar56[8] = -(cStack_2b0 == 'c');
                                          auVar56[9] = -(cStack_2af == 'c');
                                          auVar56[10] = -(cStack_2ae == 'e');
                                          auVar56[0xb] = -(cStack_2ad == 'l');
                                          auVar56[0xc] = -(cStack_2ac == 'F');
                                          auVar56[0xd] = -(cStack_2ab == 'S');
                                          auVar56[0xe] = -(cStack_2aa == 'R');
                                          auVar56[0xf] = -(cStack_2a9 == '\0');
                                          if ((ushort)((ushort)(SUB161(auVar56 >> 7,0) & 1) |
                                                       (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                                                       (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2
                                                       | (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) <<
                                                         3 | (ushort)(SUB161(auVar56 >> 0x27,0) & 1)
                                                             << 4 |
                                                       (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5
                                                       | (ushort)(SUB161(auVar56 >> 0x37,0) & 1) <<
                                                         6 | (ushort)(SUB161(auVar56 >> 0x3f,0) & 1)
                                                             << 7 |
                                                       (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8
                                                       | (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) <<
                                                         9 | (ushort)(SUB161(auVar56 >> 0x57,0) & 1)
                                                             << 10 |
                                                       (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) <<
                                                       0xb | (ushort)(SUB161(auVar56 >> 0x67,0) & 1)
                                                             << 0xc |
                                                       (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) <<
                                                       0xd | (ushort)(SUB161(auVar56 >> 0x77,0) & 1)
                                                             << 0xe |
                                                      (ushort)(auVar56[0xf] >> 7) << 0xf) == 0xffff)
                                          {
                                            iVar2 = atoi((char *)&local_1c8);
                                            this->m_MPU9250AccelFsr = iVar2;
                                          }
                                          else {
                                            auVar57[0] = -(cStack_2af == 'D');
                                            auVar57[1] = -(cStack_2ae == 'G');
                                            auVar57[2] = -(cStack_2ad == 'y');
                                            auVar57[3] = -(cStack_2ac == 'r');
                                            auVar57[4] = -(cStack_2ab == 'o');
                                            auVar57[5] = -(cStack_2aa == 'S');
                                            auVar57[6] = -(cStack_2a9 == 'a');
                                            auVar57[7] = -(local_2a8 == 'm');
                                            auVar57[8] = -(cStack_2a7 == 'p');
                                            auVar57[9] = -(cStack_2a6 == 'l');
                                            auVar57[10] = -(cStack_2a5 == 'e');
                                            auVar57[0xb] = -(cStack_2a4 == 'R');
                                            auVar57[0xc] = -(cStack_2a3 == 'a');
                                            auVar57[0xd] = -(cStack_2a2 == 't');
                                            auVar57[0xe] = -(cStack_2a1 == 'e');
                                            auVar57[0xf] = -(cStack_2a0 == '\0');
                                            auVar72[0] = -(local_2b8 == 'G');
                                            auVar72[1] = -(cStack_2b7 == 'D');
                                            auVar72[2] = -(cStack_2b6 == '2');
                                            auVar72[3] = -(cStack_2b5 == '0');
                                            auVar72[4] = -(cStack_2b4 == 'H');
                                            auVar72[5] = -(cStack_2b3 == 'M');
                                            auVar72[6] = -(cStack_2b2 == '3');
                                            auVar72[7] = -(cStack_2b1 == '0');
                                            auVar72[8] = -(cStack_2b0 == '3');
                                            auVar72[9] = -(cStack_2af == 'D');
                                            auVar72[10] = -(cStack_2ae == 'G');
                                            auVar72[0xb] = -(cStack_2ad == 'y');
                                            auVar72[0xc] = -(cStack_2ac == 'r');
                                            auVar72[0xd] = -(cStack_2ab == 'o');
                                            auVar72[0xe] = -(cStack_2aa == 'S');
                                            auVar72[0xf] = -(cStack_2a9 == 'a');
                                            auVar72 = auVar72 & auVar57;
                                            if ((ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) |
                                                         (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1
                                                         | (ushort)(SUB161(auVar72 >> 0x17,0) & 1)
                                                           << 2 | (ushort)(SUB161(auVar72 >> 0x1f,0)
                                                                          & 1) << 3 |
                                                         (ushort)(SUB161(auVar72 >> 0x27,0) & 1) <<
                                                         4 | (ushort)(SUB161(auVar72 >> 0x2f,0) & 1)
                                                             << 5 |
                                                         (ushort)(SUB161(auVar72 >> 0x37,0) & 1) <<
                                                         6 | (ushort)(SUB161(auVar72 >> 0x3f,0) & 1)
                                                             << 7 |
                                                         (ushort)(SUB161(auVar72 >> 0x47,0) & 1) <<
                                                         8 | (ushort)(SUB161(auVar72 >> 0x4f,0) & 1)
                                                             << 9 |
                                                         (ushort)(SUB161(auVar72 >> 0x57,0) & 1) <<
                                                         10 | (ushort)(SUB161(auVar72 >> 0x5f,0) & 1
                                                                      ) << 0xb |
                                                         (ushort)(SUB161(auVar72 >> 0x67,0) & 1) <<
                                                         0xc | (ushort)(SUB161(auVar72 >> 0x6f,0) &
                                                                       1) << 0xd |
                                                         (ushort)(SUB161(auVar72 >> 0x77,0) & 1) <<
                                                         0xe | (ushort)(byte)(auVar72[0xf] >> 7) <<
                                                               0xf) == 0xffff) {
                                              iVar2 = atoi((char *)&local_1c8);
                                              this->m_GD20HM303DGyroSampleRate = iVar2;
                                            }
                                            else {
                                              auVar73[0] = -(local_2b8 == 'G');
                                              auVar73[1] = -(cStack_2b7 == 'D');
                                              auVar73[2] = -(cStack_2b6 == '2');
                                              auVar73[3] = -(cStack_2b5 == '0');
                                              auVar73[4] = -(cStack_2b4 == 'H');
                                              auVar73[5] = -(cStack_2b3 == 'M');
                                              auVar73[6] = -(cStack_2b2 == '3');
                                              auVar73[7] = -(cStack_2b1 == '0');
                                              auVar73[8] = -(cStack_2b0 == '3');
                                              auVar73[9] = -(cStack_2af == 'D');
                                              auVar73[10] = -(cStack_2ae == 'G');
                                              auVar73[0xb] = -(cStack_2ad == 'y');
                                              auVar73[0xc] = -(cStack_2ac == 'r');
                                              auVar73[0xd] = -(cStack_2ab == 'o');
                                              auVar73[0xe] = -(cStack_2aa == 'F');
                                              auVar73[0xf] = -(cStack_2a9 == 's');
                                              auVar58[0] = -(local_2a8 == 'r');
                                              auVar58[1] = -(cStack_2a7 == '\0');
                                              auVar58[2] = 0xff;
                                              auVar58[3] = 0xff;
                                              auVar58[4] = 0xff;
                                              auVar58[5] = 0xff;
                                              auVar58[6] = 0xff;
                                              auVar58[7] = 0xff;
                                              auVar58[8] = 0xff;
                                              auVar58[9] = 0xff;
                                              auVar58[10] = 0xff;
                                              auVar58[0xb] = 0xff;
                                              auVar58[0xc] = 0xff;
                                              auVar58[0xd] = 0xff;
                                              auVar58[0xe] = 0xff;
                                              auVar58[0xf] = 0xff;
                                              auVar58 = auVar58 & auVar73;
                                              if ((ushort)((ushort)(SUB161(auVar58 >> 7,0) & 1) |
                                                           (ushort)(SUB161(auVar58 >> 0xf,0) & 1) <<
                                                           1 | (ushort)(SUB161(auVar58 >> 0x17,0) &
                                                                       1) << 2 |
                                                           (ushort)(SUB161(auVar58 >> 0x1f,0) & 1)
                                                           << 3 | (ushort)(SUB161(auVar58 >> 0x27,0)
                                                                          & 1) << 4 |
                                                           (ushort)(SUB161(auVar58 >> 0x2f,0) & 1)
                                                           << 5 | (ushort)(SUB161(auVar58 >> 0x37,0)
                                                                          & 1) << 6 |
                                                           (ushort)(SUB161(auVar58 >> 0x3f,0) & 1)
                                                           << 7 | (ushort)(SUB161(auVar58 >> 0x47,0)
                                                                          & 1) << 8 |
                                                           (ushort)(SUB161(auVar58 >> 0x4f,0) & 1)
                                                           << 9 | (ushort)(SUB161(auVar58 >> 0x57,0)
                                                                          & 1) << 10 |
                                                           (ushort)(SUB161(auVar58 >> 0x5f,0) & 1)
                                                           << 0xb | (ushort)(SUB161(auVar58 >> 0x67,
                                                                                    0) & 1) << 0xc |
                                                           (ushort)(SUB161(auVar58 >> 0x6f,0) & 1)
                                                           << 0xd | (ushort)(SUB161(auVar58 >> 0x77,
                                                                                    0) & 1) << 0xe |
                                                          (ushort)(byte)(auVar58[0xf] >> 7) << 0xf)
                                                  == 0xffff) {
                                                iVar2 = atoi((char *)&local_1c8);
                                                this->m_GD20HM303DGyroFsr = iVar2;
                                              }
                                              else {
                                                auVar59[0] = -(local_2a8 == 'f');
                                                auVar59[1] = -(cStack_2a7 == '\0');
                                                auVar59[2] = 0xff;
                                                auVar59[3] = 0xff;
                                                auVar59[4] = 0xff;
                                                auVar59[5] = 0xff;
                                                auVar59[6] = 0xff;
                                                auVar59[7] = 0xff;
                                                auVar59[8] = 0xff;
                                                auVar59[9] = 0xff;
                                                auVar59[10] = 0xff;
                                                auVar59[0xb] = 0xff;
                                                auVar59[0xc] = 0xff;
                                                auVar59[0xd] = 0xff;
                                                auVar59[0xe] = 0xff;
                                                auVar59[0xf] = 0xff;
                                                auVar74[0] = -(local_2b8 == 'G');
                                                auVar74[1] = -(cStack_2b7 == 'D');
                                                auVar74[2] = -(cStack_2b6 == '2');
                                                auVar74[3] = -(cStack_2b5 == '0');
                                                auVar74[4] = -(cStack_2b4 == 'H');
                                                auVar74[5] = -(cStack_2b3 == 'M');
                                                auVar74[6] = -(cStack_2b2 == '3');
                                                auVar74[7] = -(cStack_2b1 == '0');
                                                auVar74[8] = -(cStack_2b0 == '3');
                                                auVar74[9] = -(cStack_2af == 'D');
                                                auVar74[10] = -(cStack_2ae == 'G');
                                                auVar74[0xb] = -(cStack_2ad == 'y');
                                                auVar74[0xc] = -(cStack_2ac == 'r');
                                                auVar74[0xd] = -(cStack_2ab == 'o');
                                                auVar74[0xe] = -(cStack_2aa == 'H');
                                                auVar74[0xf] = -(cStack_2a9 == 'p');
                                                auVar74 = auVar74 & auVar59;
                                                if ((ushort)((ushort)(SUB161(auVar74 >> 7,0) & 1) |
                                                             (ushort)(SUB161(auVar74 >> 0xf,0) & 1)
                                                             << 1 | (ushort)(SUB161(auVar74 >> 0x17,
                                                                                    0) & 1) << 2 |
                                                             (ushort)(SUB161(auVar74 >> 0x1f,0) & 1)
                                                             << 3 | (ushort)(SUB161(auVar74 >> 0x27,
                                                                                    0) & 1) << 4 |
                                                             (ushort)(SUB161(auVar74 >> 0x2f,0) & 1)
                                                             << 5 | (ushort)(SUB161(auVar74 >> 0x37,
                                                                                    0) & 1) << 6 |
                                                             (ushort)(SUB161(auVar74 >> 0x3f,0) & 1)
                                                             << 7 | (ushort)(SUB161(auVar74 >> 0x47,
                                                                                    0) & 1) << 8 |
                                                             (ushort)(SUB161(auVar74 >> 0x4f,0) & 1)
                                                             << 9 | (ushort)(SUB161(auVar74 >> 0x57,
                                                                                    0) & 1) << 10 |
                                                             (ushort)(SUB161(auVar74 >> 0x5f,0) & 1)
                                                             << 0xb | (ushort)(SUB161(auVar74 >>
                                                                                      0x67,0) & 1)
                                                                      << 0xc |
                                                             (ushort)(SUB161(auVar74 >> 0x6f,0) & 1)
                                                             << 0xd | (ushort)(SUB161(auVar74 >>
                                                                                      0x77,0) & 1)
                                                                      << 0xe |
                                                            (ushort)(byte)(auVar74[0xf] >> 7) << 0xf
                                                            ) == 0xffff) {
                                                  iVar2 = atoi((char *)&local_1c8);
                                                  this->m_GD20HM303DGyroHpf = iVar2;
                                                }
                                                else if ((local_2a8 == '\0' &&
                                                         CONCAT17(cStack_2b1,
                                                                  CONCAT16(cStack_2b2,
                                                                           CONCAT15(cStack_2b3,
                                                                                    CONCAT14(
                                                  cStack_2b4,
                                                  CONCAT13(cStack_2b5,
                                                           CONCAT12(cStack_2b6,
                                                                    CONCAT11(cStack_2b7,local_2b8)))
                                                  )))) == 0x30334d4830324447) &&
                                                  CONCAT17(cStack_2a9,
                                                           CONCAT16(cStack_2aa,
                                                                    CONCAT15(cStack_2ab,
                                                                             CONCAT14(cStack_2ac,
                                                                                      CONCAT13(
                                                  cStack_2ad,
                                                  CONCAT12(cStack_2ae,
                                                           CONCAT11(cStack_2af,cStack_2b0))))))) ==
                                                  0x57426f7279474433) {
                                                  iVar2 = atoi((char *)&local_1c8);
                                                  this->m_GD20HM303DGyroBW = iVar2;
                                                }
                                                else {
                                                  auVar60[0] = -(cStack_2ae == 'A');
                                                  auVar60[1] = -(cStack_2ad == 'c');
                                                  auVar60[2] = -(cStack_2ac == 'c');
                                                  auVar60[3] = -(cStack_2ab == 'e');
                                                  auVar60[4] = -(cStack_2aa == 'l');
                                                  auVar60[5] = -(cStack_2a9 == 'S');
                                                  auVar60[6] = -(local_2a8 == 'a');
                                                  auVar60[7] = -(cStack_2a7 == 'm');
                                                  auVar60[8] = -(cStack_2a6 == 'p');
                                                  auVar60[9] = -(cStack_2a5 == 'l');
                                                  auVar60[10] = -(cStack_2a4 == 'e');
                                                  auVar60[0xb] = -(cStack_2a3 == 'R');
                                                  auVar60[0xc] = -(cStack_2a2 == 'a');
                                                  auVar60[0xd] = -(cStack_2a1 == 't');
                                                  auVar60[0xe] = -(cStack_2a0 == 'e');
                                                  auVar60[0xf] = -(cStack_29f == '\0');
                                                  auVar75[0] = -(local_2b8 == 'G');
                                                  auVar75[1] = -(cStack_2b7 == 'D');
                                                  auVar75[2] = -(cStack_2b6 == '2');
                                                  auVar75[3] = -(cStack_2b5 == '0');
                                                  auVar75[4] = -(cStack_2b4 == 'H');
                                                  auVar75[5] = -(cStack_2b3 == 'M');
                                                  auVar75[6] = -(cStack_2b2 == '3');
                                                  auVar75[7] = -(cStack_2b1 == '0');
                                                  auVar75[8] = -(cStack_2b0 == '3');
                                                  auVar75[9] = -(cStack_2af == 'D');
                                                  auVar75[10] = -(cStack_2ae == 'A');
                                                  auVar75[0xb] = -(cStack_2ad == 'c');
                                                  auVar75[0xc] = -(cStack_2ac == 'c');
                                                  auVar75[0xd] = -(cStack_2ab == 'e');
                                                  auVar75[0xe] = -(cStack_2aa == 'l');
                                                  auVar75[0xf] = -(cStack_2a9 == 'S');
                                                  auVar75 = auVar75 & auVar60;
                                                  if ((ushort)((ushort)(SUB161(auVar75 >> 7,0) & 1)
                                                               | (ushort)(SUB161(auVar75 >> 0xf,0) &
                                                                         1) << 1 |
                                                               (ushort)(SUB161(auVar75 >> 0x17,0) &
                                                                       1) << 2 |
                                                               (ushort)(SUB161(auVar75 >> 0x1f,0) &
                                                                       1) << 3 |
                                                               (ushort)(SUB161(auVar75 >> 0x27,0) &
                                                                       1) << 4 |
                                                               (ushort)(SUB161(auVar75 >> 0x2f,0) &
                                                                       1) << 5 |
                                                               (ushort)(SUB161(auVar75 >> 0x37,0) &
                                                                       1) << 6 |
                                                               (ushort)(SUB161(auVar75 >> 0x3f,0) &
                                                                       1) << 7 |
                                                               (ushort)(SUB161(auVar75 >> 0x47,0) &
                                                                       1) << 8 |
                                                               (ushort)(SUB161(auVar75 >> 0x4f,0) &
                                                                       1) << 9 |
                                                               (ushort)(SUB161(auVar75 >> 0x57,0) &
                                                                       1) << 10 |
                                                               (ushort)(SUB161(auVar75 >> 0x5f,0) &
                                                                       1) << 0xb |
                                                               (ushort)(SUB161(auVar75 >> 0x67,0) &
                                                                       1) << 0xc |
                                                               (ushort)(SUB161(auVar75 >> 0x6f,0) &
                                                                       1) << 0xd |
                                                               (ushort)(SUB161(auVar75 >> 0x77,0) &
                                                                       1) << 0xe |
                                                              (ushort)(byte)(auVar75[0xf] >> 7) <<
                                                              0xf) == 0xffff) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_GD20HM303DAccelSampleRate = iVar2;
                                                  }
                                                  else {
                                                    auVar61[0] = -(cStack_2b5 == '0');
                                                    auVar61[1] = -(cStack_2b4 == 'H');
                                                    auVar61[2] = -(cStack_2b3 == 'M');
                                                    auVar61[3] = -(cStack_2b2 == '3');
                                                    auVar61[4] = -(cStack_2b1 == '0');
                                                    auVar61[5] = -(cStack_2b0 == '3');
                                                    auVar61[6] = -(cStack_2af == 'D');
                                                    auVar61[7] = -(cStack_2ae == 'A');
                                                    auVar61[8] = -(cStack_2ad == 'c');
                                                    auVar61[9] = -(cStack_2ac == 'c');
                                                    auVar61[10] = -(cStack_2ab == 'e');
                                                    auVar61[0xb] = -(cStack_2aa == 'l');
                                                    auVar61[0xc] = -(cStack_2a9 == 'F');
                                                    auVar61[0xd] = -(local_2a8 == 's');
                                                    auVar61[0xe] = -(cStack_2a7 == 'r');
                                                    auVar61[0xf] = -(cStack_2a6 == '\0');
                                                    auVar76[0] = -(local_2b8 == 'G');
                                                    auVar76[1] = -(cStack_2b7 == 'D');
                                                    auVar76[2] = -(cStack_2b6 == '2');
                                                    auVar76[3] = -(cStack_2b5 == '0');
                                                    auVar76[4] = -(cStack_2b4 == 'H');
                                                    auVar76[5] = -(cStack_2b3 == 'M');
                                                    auVar76[6] = -(cStack_2b2 == '3');
                                                    auVar76[7] = -(cStack_2b1 == '0');
                                                    auVar76[8] = -(cStack_2b0 == '3');
                                                    auVar76[9] = -(cStack_2af == 'D');
                                                    auVar76[10] = -(cStack_2ae == 'A');
                                                    auVar76[0xb] = -(cStack_2ad == 'c');
                                                    auVar76[0xc] = -(cStack_2ac == 'c');
                                                    auVar76[0xd] = -(cStack_2ab == 'e');
                                                    auVar76[0xe] = -(cStack_2aa == 'l');
                                                    auVar76[0xf] = -(cStack_2a9 == 'F');
                                                    auVar76 = auVar76 & auVar61;
                                                    if ((ushort)((ushort)(SUB161(auVar76 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar76 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar76 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar76 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar76 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar76 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar76 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar76 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar76 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar76 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar76 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar76 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar76 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar76 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar76 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(byte)(auVar76[0xf] >> 7) <<
                                                                0xf) == 0xffff) {
                                                      iVar2 = atoi((char *)&local_1c8);
                                                      this->m_GD20HM303DAccelFsr = iVar2;
                                                    }
                                                    else {
                                                      auVar62[0] = -(cStack_2b5 == '0');
                                                      auVar62[1] = -(cStack_2b4 == 'H');
                                                      auVar62[2] = -(cStack_2b3 == 'M');
                                                      auVar62[3] = -(cStack_2b2 == '3');
                                                      auVar62[4] = -(cStack_2b1 == '0');
                                                      auVar62[5] = -(cStack_2b0 == '3');
                                                      auVar62[6] = -(cStack_2af == 'D');
                                                      auVar62[7] = -(cStack_2ae == 'A');
                                                      auVar62[8] = -(cStack_2ad == 'c');
                                                      auVar62[9] = -(cStack_2ac == 'c');
                                                      auVar62[10] = -(cStack_2ab == 'e');
                                                      auVar62[0xb] = -(cStack_2aa == 'l');
                                                      auVar62[0xc] = -(cStack_2a9 == 'L');
                                                      auVar62[0xd] = -(local_2a8 == 'p');
                                                      auVar62[0xe] = -(cStack_2a7 == 'f');
                                                      auVar62[0xf] = -(cStack_2a6 == '\0');
                                                      auVar77[0] = -(local_2b8 == 'G');
                                                      auVar77[1] = -(cStack_2b7 == 'D');
                                                      auVar77[2] = -(cStack_2b6 == '2');
                                                      auVar77[3] = -(cStack_2b5 == '0');
                                                      auVar77[4] = -(cStack_2b4 == 'H');
                                                      auVar77[5] = -(cStack_2b3 == 'M');
                                                      auVar77[6] = -(cStack_2b2 == '3');
                                                      auVar77[7] = -(cStack_2b1 == '0');
                                                      auVar77[8] = -(cStack_2b0 == '3');
                                                      auVar77[9] = -(cStack_2af == 'D');
                                                      auVar77[10] = -(cStack_2ae == 'A');
                                                      auVar77[0xb] = -(cStack_2ad == 'c');
                                                      auVar77[0xc] = -(cStack_2ac == 'c');
                                                      auVar77[0xd] = -(cStack_2ab == 'e');
                                                      auVar77[0xe] = -(cStack_2aa == 'l');
                                                      auVar77[0xf] = -(cStack_2a9 == 'L');
                                                      auVar77 = auVar77 & auVar62;
                                                      if ((ushort)((ushort)(SUB161(auVar77 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar77 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar77 >> 0x17,0
                                                                                  ) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar77 >> 0x1f,0
                                                                                  ) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar77 >> 0x27,0
                                                                                  ) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar77 >> 0x2f,0
                                                                                  ) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar77 >> 0x37,0
                                                                                  ) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar77 >> 0x3f,0
                                                                                  ) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar77 >> 0x47,0
                                                                                  ) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar77 >> 0x4f,0
                                                                                  ) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar77 >> 0x57,0
                                                                                  ) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar77 >> 0x5f,0
                                                                                  ) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar77 >> 0x67,0
                                                                                  ) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar77 >> 0x6f,0
                                                                                  ) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar77 >> 0x77,0
                                                                                  ) & 1) << 0xe |
                                                                  (ushort)(byte)(auVar77[0xf] >> 7)
                                                                  << 0xf) == 0xffff) {
                                                        iVar2 = atoi((char *)&local_1c8);
                                                        this->m_GD20HM303DAccelLpf = iVar2;
                                                      }
                                                      else {
                                                        auVar63[0] = -(cStack_2ac == 'm');
                                                        auVar63[1] = -(cStack_2ab == 'p');
                                                        auVar63[2] = -(cStack_2aa == 'a');
                                                        auVar63[3] = -(cStack_2a9 == 's');
                                                        auVar63[4] = -(local_2a8 == 's');
                                                        auVar63[5] = -(cStack_2a7 == 'S');
                                                        auVar63[6] = -(cStack_2a6 == 'a');
                                                        auVar63[7] = -(cStack_2a5 == 'm');
                                                        auVar63[8] = -(cStack_2a4 == 'p');
                                                        auVar63[9] = -(cStack_2a3 == 'l');
                                                        auVar63[10] = -(cStack_2a2 == 'e');
                                                        auVar63[0xb] = -(cStack_2a1 == 'R');
                                                        auVar63[0xc] = -(cStack_2a0 == 'a');
                                                        auVar63[0xd] = -(cStack_29f == 't');
                                                        auVar63[0xe] = -(cStack_29e == 'e');
                                                        auVar63[0xf] = -(cStack_29d == '\0');
                                                        auVar78[0] = -(local_2b8 == 'G');
                                                        auVar78[1] = -(cStack_2b7 == 'D');
                                                        auVar78[2] = -(cStack_2b6 == '2');
                                                        auVar78[3] = -(cStack_2b5 == '0');
                                                        auVar78[4] = -(cStack_2b4 == 'H');
                                                        auVar78[5] = -(cStack_2b3 == 'M');
                                                        auVar78[6] = -(cStack_2b2 == '3');
                                                        auVar78[7] = -(cStack_2b1 == '0');
                                                        auVar78[8] = -(cStack_2b0 == '3');
                                                        auVar78[9] = -(cStack_2af == 'D');
                                                        auVar78[10] = -(cStack_2ae == 'C');
                                                        auVar78[0xb] = -(cStack_2ad == 'o');
                                                        auVar78[0xc] = -(cStack_2ac == 'm');
                                                        auVar78[0xd] = -(cStack_2ab == 'p');
                                                        auVar78[0xe] = -(cStack_2aa == 'a');
                                                        auVar78[0xf] = -(cStack_2a9 == 's');
                                                        auVar78 = auVar78 & auVar63;
                                                        if ((ushort)((ushort)(SUB161(auVar78 >> 7,0)
                                                                             & 1) |
                                                                     (ushort)(SUB161(auVar78 >> 0xf,
                                                                                     0) & 1) << 1 |
                                                                     (ushort)(SUB161(auVar78 >> 0x17
                                                                                     ,0) & 1) << 2 |
                                                                     (ushort)(SUB161(auVar78 >> 0x1f
                                                                                     ,0) & 1) << 3 |
                                                                     (ushort)(SUB161(auVar78 >> 0x27
                                                                                     ,0) & 1) << 4 |
                                                                     (ushort)(SUB161(auVar78 >> 0x2f
                                                                                     ,0) & 1) << 5 |
                                                                     (ushort)(SUB161(auVar78 >> 0x37
                                                                                     ,0) & 1) << 6 |
                                                                     (ushort)(SUB161(auVar78 >> 0x3f
                                                                                     ,0) & 1) << 7 |
                                                                     (ushort)(SUB161(auVar78 >> 0x47
                                                                                     ,0) & 1) << 8 |
                                                                     (ushort)(SUB161(auVar78 >> 0x4f
                                                                                     ,0) & 1) << 9 |
                                                                     (ushort)(SUB161(auVar78 >> 0x57
                                                                                     ,0) & 1) << 10
                                                                     | (ushort)(SUB161(auVar78 >>
                                                                                       0x5f,0) & 1)
                                                                       << 0xb |
                                                                     (ushort)(SUB161(auVar78 >> 0x67
                                                                                     ,0) & 1) << 0xc
                                                                     | (ushort)(SUB161(auVar78 >>
                                                                                       0x6f,0) & 1)
                                                                       << 0xd |
                                                                     (ushort)(SUB161(auVar78 >> 0x77
                                                                                     ,0) & 1) << 0xe
                                                                    | (ushort)(byte)(auVar78[0xf] >>
                                                                                    7) << 0xf) ==
                                                            0xffff) {
                                                          iVar2 = atoi((char *)&local_1c8);
                                                          this->m_GD20HM303DCompassSampleRate =
                                                               iVar2;
                                                        }
                                                        else {
                                                          auVar88[0] = -(local_2b8 == 'G');
                                                          auVar88[1] = -(cStack_2b7 == 'D');
                                                          auVar88[2] = -(cStack_2b6 == '2');
                                                          auVar88[3] = -(cStack_2b5 == '0');
                                                          auVar88[4] = -(cStack_2b4 == 'H');
                                                          auVar88[5] = -(cStack_2b3 == 'M');
                                                          auVar88[6] = -(cStack_2b2 == '3');
                                                          auVar88[7] = -(cStack_2b1 == '0');
                                                          auVar88[8] = -(cStack_2b0 == '3');
                                                          auVar88[9] = -(cStack_2af == 'D');
                                                          auVar88[10] = -(cStack_2ae == 'C');
                                                          auVar88[0xb] = -(cStack_2ad == 'o');
                                                          auVar88[0xc] = -(cStack_2ac == 'm');
                                                          auVar88[0xd] = -(cStack_2ab == 'p');
                                                          auVar88[0xe] = -(cStack_2aa == 'a');
                                                          auVar88[0xf] = -(cStack_2a9 == 's');
                                                          auVar79[0] = -(cStack_2b3 == 'M');
                                                          auVar79[1] = -(cStack_2b2 == '3');
                                                          auVar79[2] = -(cStack_2b1 == '0');
                                                          auVar79[3] = -(cStack_2b0 == '3');
                                                          auVar79[4] = -(cStack_2af == 'D');
                                                          auVar79[5] = -(cStack_2ae == 'C');
                                                          auVar79[6] = -(cStack_2ad == 'o');
                                                          auVar79[7] = -(cStack_2ac == 'm');
                                                          auVar79[8] = -(cStack_2ab == 'p');
                                                          auVar79[9] = -(cStack_2aa == 'a');
                                                          auVar79[10] = -(cStack_2a9 == 's');
                                                          auVar79[0xb] = -(local_2a8 == 's');
                                                          auVar79[0xc] = -(cStack_2a7 == 'F');
                                                          auVar79[0xd] = -(cStack_2a6 == 's');
                                                          auVar79[0xe] = -(cStack_2a5 == 'r');
                                                          auVar79[0xf] = -(cStack_2a4 == '\0');
                                                          auVar88 = auVar88 & auVar79;
                                                          if ((ushort)((ushort)(SUB161(auVar88 >> 7,
                                                                                       0) & 1) |
                                                                       (ushort)(SUB161(auVar88 >>
                                                                                       0xf,0) & 1)
                                                                       << 1 | (ushort)(SUB161(
                                                  auVar88 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar88 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar88 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar88 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar88 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar88 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar88 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar88 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar88 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar88 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(byte)(auVar88[0xf] >> 7) << 0xf) ==
                                                  0xffff) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_GD20HM303DCompassFsr = iVar2;
                                                  }
                                                  else {
                                                    auVar80[0] = -(cStack_2ad == 'C');
                                                    auVar80[1] = -(cStack_2ac == 'G');
                                                    auVar80[2] = -(cStack_2ab == 'y');
                                                    auVar80[3] = -(cStack_2aa == 'r');
                                                    auVar80[4] = -(cStack_2a9 == 'o');
                                                    auVar80[5] = -(local_2a8 == 'S');
                                                    auVar80[6] = -(cStack_2a7 == 'a');
                                                    auVar80[7] = -(cStack_2a6 == 'm');
                                                    auVar80[8] = -(cStack_2a5 == 'p');
                                                    auVar80[9] = -(cStack_2a4 == 'l');
                                                    auVar80[10] = -(cStack_2a3 == 'e');
                                                    auVar80[0xb] = -(cStack_2a2 == 'R');
                                                    auVar80[0xc] = -(cStack_2a1 == 'a');
                                                    auVar80[0xd] = -(cStack_2a0 == 't');
                                                    auVar80[0xe] = -(cStack_29f == 'e');
                                                    auVar80[0xf] = -(cStack_29e == '\0');
                                                    auVar89[0] = -(local_2b8 == 'G');
                                                    auVar89[1] = -(cStack_2b7 == 'D');
                                                    auVar89[2] = -(cStack_2b6 == '2');
                                                    auVar89[3] = -(cStack_2b5 == '0');
                                                    auVar89[4] = -(cStack_2b4 == 'M');
                                                    auVar89[5] = -(cStack_2b3 == '3');
                                                    auVar89[6] = -(cStack_2b2 == '0');
                                                    auVar89[7] = -(cStack_2b1 == '3');
                                                    auVar89[8] = -(cStack_2b0 == 'D');
                                                    auVar89[9] = -(cStack_2af == 'L');
                                                    auVar89[10] = -(cStack_2ae == 'H');
                                                    auVar89[0xb] = -(cStack_2ad == 'C');
                                                    auVar89[0xc] = -(cStack_2ac == 'G');
                                                    auVar89[0xd] = -(cStack_2ab == 'y');
                                                    auVar89[0xe] = -(cStack_2aa == 'r');
                                                    auVar89[0xf] = -(cStack_2a9 == 'o');
                                                    auVar89 = auVar89 & auVar80;
                                                    if ((ushort)((ushort)(SUB161(auVar89 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar89 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar89 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar89 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar89 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar89 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar89 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar89 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar89 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar89 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar89 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar89 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar89 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar89 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar89 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(byte)(auVar89[0xf] >> 7) <<
                                                                0xf) == 0xffff) {
                                                      iVar2 = atoi((char *)&local_1c8);
                                                      this->m_GD20M303DLHCGyroSampleRate = iVar2;
                                                    }
                                                    else {
                                                      auVar99[0] = -(local_2a8 == 'F');
                                                      auVar99[1] = -(cStack_2a7 == 's');
                                                      auVar99[2] = -(cStack_2a6 == 'r');
                                                      auVar99[3] = -(cStack_2a5 == '\0');
                                                      auVar99[4] = 0xff;
                                                      auVar99[5] = 0xff;
                                                      auVar99[6] = 0xff;
                                                      auVar99[7] = 0xff;
                                                      auVar99[8] = 0xff;
                                                      auVar99[9] = 0xff;
                                                      auVar99[10] = 0xff;
                                                      auVar99[0xb] = 0xff;
                                                      auVar99[0xc] = 0xff;
                                                      auVar99[0xd] = 0xff;
                                                      auVar99[0xe] = 0xff;
                                                      auVar99[0xf] = 0xff;
                                                      auVar105[0] = -(local_2b8 == 'G');
                                                      auVar105[1] = -(cStack_2b7 == 'D');
                                                      auVar105[2] = -(cStack_2b6 == '2');
                                                      auVar105[3] = -(cStack_2b5 == '0');
                                                      auVar105[4] = -(cStack_2b4 == 'M');
                                                      auVar105[5] = -(cStack_2b3 == '3');
                                                      auVar105[6] = -(cStack_2b2 == '0');
                                                      auVar105[7] = -(cStack_2b1 == '3');
                                                      auVar105[8] = -(cStack_2b0 == 'D');
                                                      auVar105[9] = -(cStack_2af == 'L');
                                                      auVar105[10] = -(cStack_2ae == 'H');
                                                      auVar105[0xb] = -(cStack_2ad == 'C');
                                                      auVar105[0xc] = -(cStack_2ac == 'G');
                                                      auVar105[0xd] = -(cStack_2ab == 'y');
                                                      auVar105[0xe] = -(cStack_2aa == 'r');
                                                      auVar105[0xf] = -(cStack_2a9 == 'o');
                                                      auVar105 = auVar105 & auVar99;
                                                      if ((ushort)((ushort)(SUB161(auVar105 >> 7,0)
                                                                           & 1) |
                                                                   (ushort)(SUB161(auVar105 >> 0xf,0
                                                                                  ) & 1) << 1 |
                                                                   (ushort)(SUB161(auVar105 >> 0x17,
                                                                                   0) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar105 >> 0x1f,
                                                                                   0) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar105 >> 0x27,
                                                                                   0) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar105 >> 0x2f,
                                                                                   0) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar105 >> 0x37,
                                                                                   0) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar105 >> 0x3f,
                                                                                   0) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar105 >> 0x47,
                                                                                   0) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar105 >> 0x4f,
                                                                                   0) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar105 >> 0x57,
                                                                                   0) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar105 >> 0x5f,
                                                                                   0) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar105 >> 0x67,
                                                                                   0) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar105 >> 0x6f,
                                                                                   0) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar105 >> 0x77,
                                                                                   0) & 1) << 0xe |
                                                                  (ushort)(byte)(auVar105[0xf] >> 7)
                                                                  << 0xf) == 0xffff) {
                                                        iVar2 = atoi((char *)&local_1c8);
                                                        this->m_GD20M303DLHCGyroFsr = iVar2;
                                                      }
                                                      else {
                                                        auVar100[0] = -(local_2a8 == 'H');
                                                        auVar100[1] = -(cStack_2a7 == 'p');
                                                        auVar100[2] = -(cStack_2a6 == 'f');
                                                        auVar100[3] = -(cStack_2a5 == '\0');
                                                        auVar100[4] = 0xff;
                                                        auVar100[5] = 0xff;
                                                        auVar100[6] = 0xff;
                                                        auVar100[7] = 0xff;
                                                        auVar100[8] = 0xff;
                                                        auVar100[9] = 0xff;
                                                        auVar100[10] = 0xff;
                                                        auVar100[0xb] = 0xff;
                                                        auVar100[0xc] = 0xff;
                                                        auVar100[0xd] = 0xff;
                                                        auVar100[0xe] = 0xff;
                                                        auVar100[0xf] = 0xff;
                                                        auVar106[0] = -(local_2b8 == 'G');
                                                        auVar106[1] = -(cStack_2b7 == 'D');
                                                        auVar106[2] = -(cStack_2b6 == '2');
                                                        auVar106[3] = -(cStack_2b5 == '0');
                                                        auVar106[4] = -(cStack_2b4 == 'M');
                                                        auVar106[5] = -(cStack_2b3 == '3');
                                                        auVar106[6] = -(cStack_2b2 == '0');
                                                        auVar106[7] = -(cStack_2b1 == '3');
                                                        auVar106[8] = -(cStack_2b0 == 'D');
                                                        auVar106[9] = -(cStack_2af == 'L');
                                                        auVar106[10] = -(cStack_2ae == 'H');
                                                        auVar106[0xb] = -(cStack_2ad == 'C');
                                                        auVar106[0xc] = -(cStack_2ac == 'G');
                                                        auVar106[0xd] = -(cStack_2ab == 'y');
                                                        auVar106[0xe] = -(cStack_2aa == 'r');
                                                        auVar106[0xf] = -(cStack_2a9 == 'o');
                                                        auVar106 = auVar106 & auVar100;
                                                        if ((ushort)((ushort)(SUB161(auVar106 >> 7,0
                                                                                    ) & 1) |
                                                                     (ushort)(SUB161(auVar106 >> 0xf
                                                                                     ,0) & 1) << 1 |
                                                                     (ushort)(SUB161(auVar106 >>
                                                                                     0x17,0) & 1) <<
                                                                     2 | (ushort)(SUB161(auVar106 >>
                                                                                         0x1f,0) & 1
                                                                                 ) << 3 |
                                                                     (ushort)(SUB161(auVar106 >>
                                                                                     0x27,0) & 1) <<
                                                                     4 | (ushort)(SUB161(auVar106 >>
                                                                                         0x2f,0) & 1
                                                                                 ) << 5 |
                                                                     (ushort)(SUB161(auVar106 >>
                                                                                     0x37,0) & 1) <<
                                                                     6 | (ushort)(SUB161(auVar106 >>
                                                                                         0x3f,0) & 1
                                                                                 ) << 7 |
                                                                     (ushort)(SUB161(auVar106 >>
                                                                                     0x47,0) & 1) <<
                                                                     8 | (ushort)(SUB161(auVar106 >>
                                                                                         0x4f,0) & 1
                                                                                 ) << 9 |
                                                                     (ushort)(SUB161(auVar106 >>
                                                                                     0x57,0) & 1) <<
                                                                     10 | (ushort)(SUB161(auVar106 
                                                  >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar106 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar106 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar106 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(byte)(auVar106[0xf] >> 7) << 0xf) ==
                                                  0xffff) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_GD20M303DLHCGyroHpf = iVar2;
                                                  }
                                                  else {
                                                    auVar90[0] = -(local_2b8 == 'G');
                                                    auVar90[1] = -(cStack_2b7 == 'D');
                                                    auVar90[2] = -(cStack_2b6 == '2');
                                                    auVar90[3] = -(cStack_2b5 == '0');
                                                    auVar90[4] = -(cStack_2b4 == 'M');
                                                    auVar90[5] = -(cStack_2b3 == '3');
                                                    auVar90[6] = -(cStack_2b2 == '0');
                                                    auVar90[7] = -(cStack_2b1 == '3');
                                                    auVar90[8] = -(cStack_2b0 == 'D');
                                                    auVar90[9] = -(cStack_2af == 'L');
                                                    auVar90[10] = -(cStack_2ae == 'H');
                                                    auVar90[0xb] = -(cStack_2ad == 'C');
                                                    auVar90[0xc] = -(cStack_2ac == 'G');
                                                    auVar90[0xd] = -(cStack_2ab == 'y');
                                                    auVar90[0xe] = -(cStack_2aa == 'r');
                                                    auVar90[0xf] = -(cStack_2a9 == 'o');
                                                    auVar101[0] = -(cStack_2b5 == '0');
                                                    auVar101[1] = -(cStack_2b4 == 'M');
                                                    auVar101[2] = -(cStack_2b3 == '3');
                                                    auVar101[3] = -(cStack_2b2 == '0');
                                                    auVar101[4] = -(cStack_2b1 == '3');
                                                    auVar101[5] = -(cStack_2b0 == 'D');
                                                    auVar101[6] = -(cStack_2af == 'L');
                                                    auVar101[7] = -(cStack_2ae == 'H');
                                                    auVar101[8] = -(cStack_2ad == 'C');
                                                    auVar101[9] = -(cStack_2ac == 'G');
                                                    auVar101[10] = -(cStack_2ab == 'y');
                                                    auVar101[0xb] = -(cStack_2aa == 'r');
                                                    auVar101[0xc] = -(cStack_2a9 == 'o');
                                                    auVar101[0xd] = -(local_2a8 == 'B');
                                                    auVar101[0xe] = -(cStack_2a7 == 'W');
                                                    auVar101[0xf] = -(cStack_2a6 == '\0');
                                                    auVar90 = auVar90 & auVar101;
                                                    if ((ushort)((ushort)(SUB161(auVar90 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar90 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar90 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar90 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar90 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar90 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar90 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar90 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar90 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar90 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar90 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar90 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar90 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar90 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar90 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(byte)(auVar90[0xf] >> 7) <<
                                                                0xf) == 0xffff) {
                                                      iVar2 = atoi((char *)&local_1c8);
                                                      this->m_GD20M303DLHCGyroBW = iVar2;
                                                    }
                                                    else {
                                                      auVar91[0] = -(cStack_2ac == 'A');
                                                      auVar91[1] = -(cStack_2ab == 'c');
                                                      auVar91[2] = -(cStack_2aa == 'c');
                                                      auVar91[3] = -(cStack_2a9 == 'e');
                                                      auVar91[4] = -(local_2a8 == 'l');
                                                      auVar91[5] = -(cStack_2a7 == 'S');
                                                      auVar91[6] = -(cStack_2a6 == 'a');
                                                      auVar91[7] = -(cStack_2a5 == 'm');
                                                      auVar91[8] = -(cStack_2a4 == 'p');
                                                      auVar91[9] = -(cStack_2a3 == 'l');
                                                      auVar91[10] = -(cStack_2a2 == 'e');
                                                      auVar91[0xb] = -(cStack_2a1 == 'R');
                                                      auVar91[0xc] = -(cStack_2a0 == 'a');
                                                      auVar91[0xd] = -(cStack_29f == 't');
                                                      auVar91[0xe] = -(cStack_29e == 'e');
                                                      auVar91[0xf] = -(cStack_29d == '\0');
                                                      auVar102[0] = -(local_2b8 == 'G');
                                                      auVar102[1] = -(cStack_2b7 == 'D');
                                                      auVar102[2] = -(cStack_2b6 == '2');
                                                      auVar102[3] = -(cStack_2b5 == '0');
                                                      auVar102[4] = -(cStack_2b4 == 'M');
                                                      auVar102[5] = -(cStack_2b3 == '3');
                                                      auVar102[6] = -(cStack_2b2 == '0');
                                                      auVar102[7] = -(cStack_2b1 == '3');
                                                      auVar102[8] = -(cStack_2b0 == 'D');
                                                      auVar102[9] = -(cStack_2af == 'L');
                                                      auVar102[10] = -(cStack_2ae == 'H');
                                                      auVar102[0xb] = -(cStack_2ad == 'C');
                                                      auVar102[0xc] = -(cStack_2ac == 'A');
                                                      auVar102[0xd] = -(cStack_2ab == 'c');
                                                      auVar102[0xe] = -(cStack_2aa == 'c');
                                                      auVar102[0xf] = -(cStack_2a9 == 'e');
                                                      auVar102 = auVar102 & auVar91;
                                                      if ((ushort)((ushort)(SUB161(auVar102 >> 7,0)
                                                                           & 1) |
                                                                   (ushort)(SUB161(auVar102 >> 0xf,0
                                                                                  ) & 1) << 1 |
                                                                   (ushort)(SUB161(auVar102 >> 0x17,
                                                                                   0) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar102 >> 0x1f,
                                                                                   0) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar102 >> 0x27,
                                                                                   0) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar102 >> 0x2f,
                                                                                   0) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar102 >> 0x37,
                                                                                   0) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar102 >> 0x3f,
                                                                                   0) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar102 >> 0x47,
                                                                                   0) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar102 >> 0x4f,
                                                                                   0) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar102 >> 0x57,
                                                                                   0) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar102 >> 0x5f,
                                                                                   0) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar102 >> 0x67,
                                                                                   0) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar102 >> 0x6f,
                                                                                   0) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar102 >> 0x77,
                                                                                   0) & 1) << 0xe |
                                                                  (ushort)(byte)(auVar102[0xf] >> 7)
                                                                  << 0xf) == 0xffff) {
                                                        iVar2 = atoi((char *)&local_1c8);
                                                        this->m_GD20M303DLHCAccelSampleRate = iVar2;
                                                      }
                                                      else {
                                                        auVar103[0] = -(local_2b8 == 'G');
                                                        auVar103[1] = -(cStack_2b7 == 'D');
                                                        auVar103[2] = -(cStack_2b6 == '2');
                                                        auVar103[3] = -(cStack_2b5 == '0');
                                                        auVar103[4] = -(cStack_2b4 == 'M');
                                                        auVar103[5] = -(cStack_2b3 == '3');
                                                        auVar103[6] = -(cStack_2b2 == '0');
                                                        auVar103[7] = -(cStack_2b1 == '3');
                                                        auVar103[8] = -(cStack_2b0 == 'D');
                                                        auVar103[9] = -(cStack_2af == 'L');
                                                        auVar103[10] = -(cStack_2ae == 'H');
                                                        auVar103[0xb] = -(cStack_2ad == 'C');
                                                        auVar103[0xc] = -(cStack_2ac == 'A');
                                                        auVar103[0xd] = -(cStack_2ab == 'c');
                                                        auVar103[0xe] = -(cStack_2aa == 'c');
                                                        auVar103[0xf] = -(cStack_2a9 == 'e');
                                                        auVar92[0] = -(cStack_2b3 == '3');
                                                        auVar92[1] = -(cStack_2b2 == '0');
                                                        auVar92[2] = -(cStack_2b1 == '3');
                                                        auVar92[3] = -(cStack_2b0 == 'D');
                                                        auVar92[4] = -(cStack_2af == 'L');
                                                        auVar92[5] = -(cStack_2ae == 'H');
                                                        auVar92[6] = -(cStack_2ad == 'C');
                                                        auVar92[7] = -(cStack_2ac == 'A');
                                                        auVar92[8] = -(cStack_2ab == 'c');
                                                        auVar92[9] = -(cStack_2aa == 'c');
                                                        auVar92[10] = -(cStack_2a9 == 'e');
                                                        auVar92[0xb] = -(local_2a8 == 'l');
                                                        auVar92[0xc] = -(cStack_2a7 == 'F');
                                                        auVar92[0xd] = -(cStack_2a6 == 's');
                                                        auVar92[0xe] = -(cStack_2a5 == 'r');
                                                        auVar92[0xf] = -(cStack_2a4 == '\0');
                                                        auVar103 = auVar103 & auVar92;
                                                        if ((ushort)((ushort)(SUB161(auVar103 >> 7,0
                                                                                    ) & 1) |
                                                                     (ushort)(SUB161(auVar103 >> 0xf
                                                                                     ,0) & 1) << 1 |
                                                                     (ushort)(SUB161(auVar103 >>
                                                                                     0x17,0) & 1) <<
                                                                     2 | (ushort)(SUB161(auVar103 >>
                                                                                         0x1f,0) & 1
                                                                                 ) << 3 |
                                                                     (ushort)(SUB161(auVar103 >>
                                                                                     0x27,0) & 1) <<
                                                                     4 | (ushort)(SUB161(auVar103 >>
                                                                                         0x2f,0) & 1
                                                                                 ) << 5 |
                                                                     (ushort)(SUB161(auVar103 >>
                                                                                     0x37,0) & 1) <<
                                                                     6 | (ushort)(SUB161(auVar103 >>
                                                                                         0x3f,0) & 1
                                                                                 ) << 7 |
                                                                     (ushort)(SUB161(auVar103 >>
                                                                                     0x47,0) & 1) <<
                                                                     8 | (ushort)(SUB161(auVar103 >>
                                                                                         0x4f,0) & 1
                                                                                 ) << 9 |
                                                                     (ushort)(SUB161(auVar103 >>
                                                                                     0x57,0) & 1) <<
                                                                     10 | (ushort)(SUB161(auVar103 
                                                  >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar103 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar103 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar103 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(byte)(auVar103[0xf] >> 7) << 0xf) ==
                                                  0xffff) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_GD20M303DLHCAccelFsr = iVar2;
                                                  }
                                                  else {
                                                    auVar93[0] = -(cStack_2aa == 'm');
                                                    auVar93[1] = -(cStack_2a9 == 'p');
                                                    auVar93[2] = -(local_2a8 == 'a');
                                                    auVar93[3] = -(cStack_2a7 == 's');
                                                    auVar93[4] = -(cStack_2a6 == 's');
                                                    auVar93[5] = -(cStack_2a5 == 'S');
                                                    auVar93[6] = -(cStack_2a4 == 'a');
                                                    auVar93[7] = -(cStack_2a3 == 'm');
                                                    auVar93[8] = -(cStack_2a2 == 'p');
                                                    auVar93[9] = -(cStack_2a1 == 'l');
                                                    auVar93[10] = -(cStack_2a0 == 'e');
                                                    auVar93[0xb] = -(cStack_29f == 'R');
                                                    auVar93[0xc] = -(cStack_29e == 'a');
                                                    auVar93[0xd] = -(cStack_29d == 't');
                                                    auVar93[0xe] = -(cStack_29c == 'e');
                                                    auVar93[0xf] = -(cStack_29b == '\0');
                                                    auVar104[0] = -(local_2b8 == 'G');
                                                    auVar104[1] = -(cStack_2b7 == 'D');
                                                    auVar104[2] = -(cStack_2b6 == '2');
                                                    auVar104[3] = -(cStack_2b5 == '0');
                                                    auVar104[4] = -(cStack_2b4 == 'M');
                                                    auVar104[5] = -(cStack_2b3 == '3');
                                                    auVar104[6] = -(cStack_2b2 == '0');
                                                    auVar104[7] = -(cStack_2b1 == '3');
                                                    auVar104[8] = -(cStack_2b0 == 'D');
                                                    auVar104[9] = -(cStack_2af == 'L');
                                                    auVar104[10] = -(cStack_2ae == 'H');
                                                    auVar104[0xb] = -(cStack_2ad == 'C');
                                                    auVar104[0xc] = -(cStack_2ac == 'C');
                                                    auVar104[0xd] = -(cStack_2ab == 'o');
                                                    auVar104[0xe] = -(cStack_2aa == 'm');
                                                    auVar104[0xf] = -(cStack_2a9 == 'p');
                                                    auVar104 = auVar104 & auVar93;
                                                    if ((ushort)((ushort)(SUB161(auVar104 >> 7,0) &
                                                                         1) |
                                                                 (ushort)(SUB161(auVar104 >> 0xf,0)
                                                                         & 1) << 1 |
                                                                 (ushort)(SUB161(auVar104 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar104 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar104 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar104 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar104 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar104 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar104 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar104 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar104 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar104 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar104 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar104 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar104 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(byte)(auVar104[0xf] >> 7)
                                                                << 0xf) == 0xffff) {
                                                      iVar2 = atoi((char *)&local_1c8);
                                                      this->m_GD20M303DLHCCompassSampleRate = iVar2;
                                                    }
                                                    else {
                                                      auVar81[0] = -(local_2b8 == 'G');
                                                      auVar81[1] = -(cStack_2b7 == 'D');
                                                      auVar81[2] = -(cStack_2b6 == '2');
                                                      auVar81[3] = -(cStack_2b5 == '0');
                                                      auVar81[4] = -(cStack_2b4 == 'M');
                                                      auVar81[5] = -(cStack_2b3 == '3');
                                                      auVar81[6] = -(cStack_2b2 == '0');
                                                      auVar81[7] = -(cStack_2b1 == '3');
                                                      auVar81[8] = -(cStack_2b0 == 'D');
                                                      auVar81[9] = -(cStack_2af == 'L');
                                                      auVar81[10] = -(cStack_2ae == 'H');
                                                      auVar81[0xb] = -(cStack_2ad == 'C');
                                                      auVar81[0xc] = -(cStack_2ac == 'C');
                                                      auVar81[0xd] = -(cStack_2ab == 'o');
                                                      auVar81[0xe] = -(cStack_2aa == 'm');
                                                      auVar81[0xf] = -(cStack_2a9 == 'p');
                                                      auVar94[0] = -(cStack_2b1 == '3');
                                                      auVar94[1] = -(cStack_2b0 == 'D');
                                                      auVar94[2] = -(cStack_2af == 'L');
                                                      auVar94[3] = -(cStack_2ae == 'H');
                                                      auVar94[4] = -(cStack_2ad == 'C');
                                                      auVar94[5] = -(cStack_2ac == 'C');
                                                      auVar94[6] = -(cStack_2ab == 'o');
                                                      auVar94[7] = -(cStack_2aa == 'm');
                                                      auVar94[8] = -(cStack_2a9 == 'p');
                                                      auVar94[9] = -(local_2a8 == 'a');
                                                      auVar94[10] = -(cStack_2a7 == 's');
                                                      auVar94[0xb] = -(cStack_2a6 == 's');
                                                      auVar94[0xc] = -(cStack_2a5 == 'F');
                                                      auVar94[0xd] = -(cStack_2a4 == 's');
                                                      auVar94[0xe] = -(cStack_2a3 == 'r');
                                                      auVar94[0xf] = -(cStack_2a2 == '\0');
                                                      auVar81 = auVar81 & auVar94;
                                                      if ((ushort)((ushort)(SUB161(auVar81 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar81 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar81 >> 0x17,0
                                                                                  ) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar81 >> 0x1f,0
                                                                                  ) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar81 >> 0x27,0
                                                                                  ) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar81 >> 0x2f,0
                                                                                  ) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar81 >> 0x37,0
                                                                                  ) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar81 >> 0x3f,0
                                                                                  ) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar81 >> 0x47,0
                                                                                  ) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar81 >> 0x4f,0
                                                                                  ) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar81 >> 0x57,0
                                                                                  ) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar81 >> 0x5f,0
                                                                                  ) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar81 >> 0x67,0
                                                                                  ) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar81 >> 0x6f,0
                                                                                  ) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar81 >> 0x77,0
                                                                                  ) & 1) << 0xe |
                                                                  (ushort)(byte)(auVar81[0xf] >> 7)
                                                                  << 0xf) == 0xffff) {
                                                        iVar2 = atoi((char *)&local_1c8);
                                                        this->m_GD20M303DLHCCompassFsr = iVar2;
                                                      }
                                                      else {
                                                        auVar95[0] = -(cStack_2ac == 'C');
                                                        auVar95[1] = -(cStack_2ab == 'G');
                                                        auVar95[2] = -(cStack_2aa == 'y');
                                                        auVar95[3] = -(cStack_2a9 == 'r');
                                                        auVar95[4] = -(local_2a8 == 'o');
                                                        auVar95[5] = -(cStack_2a7 == 'S');
                                                        auVar95[6] = -(cStack_2a6 == 'a');
                                                        auVar95[7] = -(cStack_2a5 == 'm');
                                                        auVar95[8] = -(cStack_2a4 == 'p');
                                                        auVar95[9] = -(cStack_2a3 == 'l');
                                                        auVar95[10] = -(cStack_2a2 == 'e');
                                                        auVar95[0xb] = -(cStack_2a1 == 'R');
                                                        auVar95[0xc] = -(cStack_2a0 == 'a');
                                                        auVar95[0xd] = -(cStack_29f == 't');
                                                        auVar95[0xe] = -(cStack_29e == 'e');
                                                        auVar95[0xf] = -(cStack_29d == '\0');
                                                        auVar35[0] = -(local_2b8 == 'G');
                                                        auVar35[1] = -(cStack_2b7 == 'D');
                                                        auVar35[2] = -(cStack_2b6 == '2');
                                                        auVar35[3] = -(cStack_2b5 == '0');
                                                        auVar35[4] = -(cStack_2b4 == 'H');
                                                        auVar35[5] = -(cStack_2b3 == 'M');
                                                        auVar35[6] = -(cStack_2b2 == '3');
                                                        auVar35[7] = -(cStack_2b1 == '0');
                                                        auVar35[8] = -(cStack_2b0 == '3');
                                                        auVar35[9] = -(cStack_2af == 'D');
                                                        auVar35[10] = -(cStack_2ae == 'L');
                                                        auVar35[0xb] = -(cStack_2ad == 'H');
                                                        auVar35[0xc] = -(cStack_2ac == 'C');
                                                        auVar35[0xd] = -(cStack_2ab == 'G');
                                                        auVar35[0xe] = -(cStack_2aa == 'y');
                                                        auVar35[0xf] = -(cStack_2a9 == 'r');
                                                        auVar35 = auVar35 & auVar95;
                                                        if ((ushort)((ushort)(SUB161(auVar35 >> 7,0)
                                                                             & 1) |
                                                                     (ushort)(SUB161(auVar35 >> 0xf,
                                                                                     0) & 1) << 1 |
                                                                     (ushort)(SUB161(auVar35 >> 0x17
                                                                                     ,0) & 1) << 2 |
                                                                     (ushort)(SUB161(auVar35 >> 0x1f
                                                                                     ,0) & 1) << 3 |
                                                                     (ushort)(SUB161(auVar35 >> 0x27
                                                                                     ,0) & 1) << 4 |
                                                                     (ushort)(SUB161(auVar35 >> 0x2f
                                                                                     ,0) & 1) << 5 |
                                                                     (ushort)(SUB161(auVar35 >> 0x37
                                                                                     ,0) & 1) << 6 |
                                                                     (ushort)(SUB161(auVar35 >> 0x3f
                                                                                     ,0) & 1) << 7 |
                                                                     (ushort)(SUB161(auVar35 >> 0x47
                                                                                     ,0) & 1) << 8 |
                                                                     (ushort)(SUB161(auVar35 >> 0x4f
                                                                                     ,0) & 1) << 9 |
                                                                     (ushort)(SUB161(auVar35 >> 0x57
                                                                                     ,0) & 1) << 10
                                                                     | (ushort)(SUB161(auVar35 >>
                                                                                       0x5f,0) & 1)
                                                                       << 0xb |
                                                                     (ushort)(SUB161(auVar35 >> 0x67
                                                                                     ,0) & 1) << 0xc
                                                                     | (ushort)(SUB161(auVar35 >>
                                                                                       0x6f,0) & 1)
                                                                       << 0xd |
                                                                     (ushort)(SUB161(auVar35 >> 0x77
                                                                                     ,0) & 1) << 0xe
                                                                    | (ushort)(byte)(auVar35[0xf] >>
                                                                                    7) << 0xf) ==
                                                            0xffff) {
                                                          iVar2 = atoi((char *)&local_1c8);
                                                          this->m_GD20HM303DLHCGyroSampleRate =
                                                               iVar2;
                                                        }
                                                        else {
                                                          auVar82[0] = -(cStack_2b3 == 'M');
                                                          auVar82[1] = -(cStack_2b2 == '3');
                                                          auVar82[2] = -(cStack_2b1 == '0');
                                                          auVar82[3] = -(cStack_2b0 == '3');
                                                          auVar82[4] = -(cStack_2af == 'D');
                                                          auVar82[5] = -(cStack_2ae == 'L');
                                                          auVar82[6] = -(cStack_2ad == 'H');
                                                          auVar82[7] = -(cStack_2ac == 'C');
                                                          auVar82[8] = -(cStack_2ab == 'G');
                                                          auVar82[9] = -(cStack_2aa == 'y');
                                                          auVar82[10] = -(cStack_2a9 == 'r');
                                                          auVar82[0xb] = -(local_2a8 == 'o');
                                                          auVar82[0xc] = -(cStack_2a7 == 'F');
                                                          auVar82[0xd] = -(cStack_2a6 == 's');
                                                          auVar82[0xe] = -(cStack_2a5 == 'r');
                                                          auVar82[0xf] = -(cStack_2a4 == '\0');
                                                          auVar96[0] = -(local_2b8 == 'G');
                                                          auVar96[1] = -(cStack_2b7 == 'D');
                                                          auVar96[2] = -(cStack_2b6 == '2');
                                                          auVar96[3] = -(cStack_2b5 == '0');
                                                          auVar96[4] = -(cStack_2b4 == 'H');
                                                          auVar96[5] = -(cStack_2b3 == 'M');
                                                          auVar96[6] = -(cStack_2b2 == '3');
                                                          auVar96[7] = -(cStack_2b1 == '0');
                                                          auVar96[8] = -(cStack_2b0 == '3');
                                                          auVar96[9] = -(cStack_2af == 'D');
                                                          auVar96[10] = -(cStack_2ae == 'L');
                                                          auVar96[0xb] = -(cStack_2ad == 'H');
                                                          auVar96[0xc] = -(cStack_2ac == 'C');
                                                          auVar96[0xd] = -(cStack_2ab == 'G');
                                                          auVar96[0xe] = -(cStack_2aa == 'y');
                                                          auVar96[0xf] = -(cStack_2a9 == 'r');
                                                          auVar96 = auVar96 & auVar82;
                                                          if ((ushort)((ushort)(SUB161(auVar96 >> 7,
                                                                                       0) & 1) |
                                                                       (ushort)(SUB161(auVar96 >>
                                                                                       0xf,0) & 1)
                                                                       << 1 | (ushort)(SUB161(
                                                  auVar96 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar96 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar96 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar96 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar96 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar96 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar96 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar96 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar96 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar96 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar96 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar96 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar96 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(byte)(auVar96[0xf] >> 7) << 0xf) ==
                                                  0xffff) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_GD20HM303DLHCGyroFsr = iVar2;
                                                  }
                                                  else {
                                                    auVar83[0] = -(cStack_2b3 == 'M');
                                                    auVar83[1] = -(cStack_2b2 == '3');
                                                    auVar83[2] = -(cStack_2b1 == '0');
                                                    auVar83[3] = -(cStack_2b0 == '3');
                                                    auVar83[4] = -(cStack_2af == 'D');
                                                    auVar83[5] = -(cStack_2ae == 'L');
                                                    auVar83[6] = -(cStack_2ad == 'H');
                                                    auVar83[7] = -(cStack_2ac == 'C');
                                                    auVar83[8] = -(cStack_2ab == 'G');
                                                    auVar83[9] = -(cStack_2aa == 'y');
                                                    auVar83[10] = -(cStack_2a9 == 'r');
                                                    auVar83[0xb] = -(local_2a8 == 'o');
                                                    auVar83[0xc] = -(cStack_2a7 == 'H');
                                                    auVar83[0xd] = -(cStack_2a6 == 'p');
                                                    auVar83[0xe] = -(cStack_2a5 == 'f');
                                                    auVar83[0xf] = -(cStack_2a4 == '\0');
                                                    auVar97[0] = -(local_2b8 == 'G');
                                                    auVar97[1] = -(cStack_2b7 == 'D');
                                                    auVar97[2] = -(cStack_2b6 == '2');
                                                    auVar97[3] = -(cStack_2b5 == '0');
                                                    auVar97[4] = -(cStack_2b4 == 'H');
                                                    auVar97[5] = -(cStack_2b3 == 'M');
                                                    auVar97[6] = -(cStack_2b2 == '3');
                                                    auVar97[7] = -(cStack_2b1 == '0');
                                                    auVar97[8] = -(cStack_2b0 == '3');
                                                    auVar97[9] = -(cStack_2af == 'D');
                                                    auVar97[10] = -(cStack_2ae == 'L');
                                                    auVar97[0xb] = -(cStack_2ad == 'H');
                                                    auVar97[0xc] = -(cStack_2ac == 'C');
                                                    auVar97[0xd] = -(cStack_2ab == 'G');
                                                    auVar97[0xe] = -(cStack_2aa == 'y');
                                                    auVar97[0xf] = -(cStack_2a9 == 'r');
                                                    auVar97 = auVar97 & auVar83;
                                                    if ((ushort)((ushort)(SUB161(auVar97 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar97 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar97 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar97 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar97 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar97 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar97 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar97 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar97 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar97 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar97 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar97 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar97 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar97 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar97 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(byte)(auVar97[0xf] >> 7) <<
                                                                0xf) == 0xffff) {
                                                      iVar2 = atoi((char *)&local_1c8);
                                                      this->m_GD20HM303DLHCGyroHpf = iVar2;
                                                    }
                                                    else {
                                                      auVar36[0] = -(local_2b8 == 'G');
                                                      auVar36[1] = -(cStack_2b7 == 'D');
                                                      auVar36[2] = -(cStack_2b6 == '2');
                                                      auVar36[3] = -(cStack_2b5 == '0');
                                                      auVar36[4] = -(cStack_2b4 == 'H');
                                                      auVar36[5] = -(cStack_2b3 == 'M');
                                                      auVar36[6] = -(cStack_2b2 == '3');
                                                      auVar36[7] = -(cStack_2b1 == '0');
                                                      auVar36[8] = -(cStack_2b0 == '3');
                                                      auVar36[9] = -(cStack_2af == 'D');
                                                      auVar36[10] = -(cStack_2ae == 'L');
                                                      auVar36[0xb] = -(cStack_2ad == 'H');
                                                      auVar36[0xc] = -(cStack_2ac == 'C');
                                                      auVar36[0xd] = -(cStack_2ab == 'G');
                                                      auVar36[0xe] = -(cStack_2aa == 'y');
                                                      auVar36[0xf] = -(cStack_2a9 == 'r');
                                                      auVar84[0] = -(local_2a8 == 'o');
                                                      auVar84[1] = -(cStack_2a7 == 'B');
                                                      auVar84[2] = -(cStack_2a6 == 'W');
                                                      auVar84[3] = -(cStack_2a5 == '\0');
                                                      auVar84[4] = 0xff;
                                                      auVar84[5] = 0xff;
                                                      auVar84[6] = 0xff;
                                                      auVar84[7] = 0xff;
                                                      auVar84[8] = 0xff;
                                                      auVar84[9] = 0xff;
                                                      auVar84[10] = 0xff;
                                                      auVar84[0xb] = 0xff;
                                                      auVar84[0xc] = 0xff;
                                                      auVar84[0xd] = 0xff;
                                                      auVar84[0xe] = 0xff;
                                                      auVar84[0xf] = 0xff;
                                                      auVar36 = auVar36 & auVar84;
                                                      if ((ushort)((ushort)(SUB161(auVar36 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar36 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar36 >> 0x17,0
                                                                                  ) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar36 >> 0x1f,0
                                                                                  ) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar36 >> 0x27,0
                                                                                  ) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar36 >> 0x2f,0
                                                                                  ) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar36 >> 0x37,0
                                                                                  ) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar36 >> 0x3f,0
                                                                                  ) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar36 >> 0x47,0
                                                                                  ) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar36 >> 0x4f,0
                                                                                  ) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar36 >> 0x57,0
                                                                                  ) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar36 >> 0x5f,0
                                                                                  ) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar36 >> 0x67,0
                                                                                  ) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar36 >> 0x6f,0
                                                                                  ) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar36 >> 0x77,0
                                                                                  ) & 1) << 0xe |
                                                                  (ushort)(byte)(auVar36[0xf] >> 7)
                                                                  << 0xf) == 0xffff) {
                                                        iVar2 = atoi((char *)&local_1c8);
                                                        this->m_GD20HM303DLHCGyroBW = iVar2;
                                                      }
                                                      else {
                                                        auVar37[0] = -(cStack_2ab == 'A');
                                                        auVar37[1] = -(cStack_2aa == 'c');
                                                        auVar37[2] = -(cStack_2a9 == 'c');
                                                        auVar37[3] = -(local_2a8 == 'e');
                                                        auVar37[4] = -(cStack_2a7 == 'l');
                                                        auVar37[5] = -(cStack_2a6 == 'S');
                                                        auVar37[6] = -(cStack_2a5 == 'a');
                                                        auVar37[7] = -(cStack_2a4 == 'm');
                                                        auVar37[8] = -(cStack_2a3 == 'p');
                                                        auVar37[9] = -(cStack_2a2 == 'l');
                                                        auVar37[10] = -(cStack_2a1 == 'e');
                                                        auVar37[0xb] = -(cStack_2a0 == 'R');
                                                        auVar37[0xc] = -(cStack_29f == 'a');
                                                        auVar37[0xd] = -(cStack_29e == 't');
                                                        auVar37[0xe] = -(cStack_29d == 'e');
                                                        auVar37[0xf] = -(cStack_29c == '\0');
                                                        auVar85[0] = -(local_2b8 == 'G');
                                                        auVar85[1] = -(cStack_2b7 == 'D');
                                                        auVar85[2] = -(cStack_2b6 == '2');
                                                        auVar85[3] = -(cStack_2b5 == '0');
                                                        auVar85[4] = -(cStack_2b4 == 'H');
                                                        auVar85[5] = -(cStack_2b3 == 'M');
                                                        auVar85[6] = -(cStack_2b2 == '3');
                                                        auVar85[7] = -(cStack_2b1 == '0');
                                                        auVar85[8] = -(cStack_2b0 == '3');
                                                        auVar85[9] = -(cStack_2af == 'D');
                                                        auVar85[10] = -(cStack_2ae == 'L');
                                                        auVar85[0xb] = -(cStack_2ad == 'H');
                                                        auVar85[0xc] = -(cStack_2ac == 'C');
                                                        auVar85[0xd] = -(cStack_2ab == 'A');
                                                        auVar85[0xe] = -(cStack_2aa == 'c');
                                                        auVar85[0xf] = -(cStack_2a9 == 'c');
                                                        auVar85 = auVar85 & auVar37;
                                                        if ((ushort)((ushort)(SUB161(auVar85 >> 7,0)
                                                                             & 1) |
                                                                     (ushort)(SUB161(auVar85 >> 0xf,
                                                                                     0) & 1) << 1 |
                                                                     (ushort)(SUB161(auVar85 >> 0x17
                                                                                     ,0) & 1) << 2 |
                                                                     (ushort)(SUB161(auVar85 >> 0x1f
                                                                                     ,0) & 1) << 3 |
                                                                     (ushort)(SUB161(auVar85 >> 0x27
                                                                                     ,0) & 1) << 4 |
                                                                     (ushort)(SUB161(auVar85 >> 0x2f
                                                                                     ,0) & 1) << 5 |
                                                                     (ushort)(SUB161(auVar85 >> 0x37
                                                                                     ,0) & 1) << 6 |
                                                                     (ushort)(SUB161(auVar85 >> 0x3f
                                                                                     ,0) & 1) << 7 |
                                                                     (ushort)(SUB161(auVar85 >> 0x47
                                                                                     ,0) & 1) << 8 |
                                                                     (ushort)(SUB161(auVar85 >> 0x4f
                                                                                     ,0) & 1) << 9 |
                                                                     (ushort)(SUB161(auVar85 >> 0x57
                                                                                     ,0) & 1) << 10
                                                                     | (ushort)(SUB161(auVar85 >>
                                                                                       0x5f,0) & 1)
                                                                       << 0xb |
                                                                     (ushort)(SUB161(auVar85 >> 0x67
                                                                                     ,0) & 1) << 0xc
                                                                     | (ushort)(SUB161(auVar85 >>
                                                                                       0x6f,0) & 1)
                                                                       << 0xd |
                                                                     (ushort)(SUB161(auVar85 >> 0x77
                                                                                     ,0) & 1) << 0xe
                                                                    | (ushort)(byte)(auVar85[0xf] >>
                                                                                    7) << 0xf) ==
                                                            0xffff) {
                                                          iVar2 = atoi((char *)&local_1c8);
                                                          this->m_GD20HM303DLHCAccelSampleRate =
                                                               iVar2;
                                                        }
                                                        else {
                                                          auVar86[0] = -(local_2b8 == 'G');
                                                          auVar86[1] = -(cStack_2b7 == 'D');
                                                          auVar86[2] = -(cStack_2b6 == '2');
                                                          auVar86[3] = -(cStack_2b5 == '0');
                                                          auVar86[4] = -(cStack_2b4 == 'H');
                                                          auVar86[5] = -(cStack_2b3 == 'M');
                                                          auVar86[6] = -(cStack_2b2 == '3');
                                                          auVar86[7] = -(cStack_2b1 == '0');
                                                          auVar86[8] = -(cStack_2b0 == '3');
                                                          auVar86[9] = -(cStack_2af == 'D');
                                                          auVar86[10] = -(cStack_2ae == 'L');
                                                          auVar86[0xb] = -(cStack_2ad == 'H');
                                                          auVar86[0xc] = -(cStack_2ac == 'C');
                                                          auVar86[0xd] = -(cStack_2ab == 'A');
                                                          auVar86[0xe] = -(cStack_2aa == 'c');
                                                          auVar86[0xf] = -(cStack_2a9 == 'c');
                                                          auVar98[0] = -(cStack_2b2 == '3');
                                                          auVar98[1] = -(cStack_2b1 == '0');
                                                          auVar98[2] = -(cStack_2b0 == '3');
                                                          auVar98[3] = -(cStack_2af == 'D');
                                                          auVar98[4] = -(cStack_2ae == 'L');
                                                          auVar98[5] = -(cStack_2ad == 'H');
                                                          auVar98[6] = -(cStack_2ac == 'C');
                                                          auVar98[7] = -(cStack_2ab == 'A');
                                                          auVar98[8] = -(cStack_2aa == 'c');
                                                          auVar98[9] = -(cStack_2a9 == 'c');
                                                          auVar98[10] = -(local_2a8 == 'e');
                                                          auVar98[0xb] = -(cStack_2a7 == 'l');
                                                          auVar98[0xc] = -(cStack_2a6 == 'F');
                                                          auVar98[0xd] = -(cStack_2a5 == 's');
                                                          auVar98[0xe] = -(cStack_2a4 == 'r');
                                                          auVar98[0xf] = -(cStack_2a3 == '\0');
                                                          auVar86 = auVar86 & auVar98;
                                                          if ((ushort)((ushort)(SUB161(auVar86 >> 7,
                                                                                       0) & 1) |
                                                                       (ushort)(SUB161(auVar86 >>
                                                                                       0xf,0) & 1)
                                                                       << 1 | (ushort)(SUB161(
                                                  auVar86 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar86 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar86 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar86 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar86 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar86 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar86 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar86 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar86 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar86 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar86 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(byte)(auVar86[0xf] >> 7) << 0xf) ==
                                                  0xffff) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_GD20HM303DLHCAccelFsr = iVar2;
                                                  }
                                                  else {
                                                    auVar38[0] = -(cStack_2a9 == 'm');
                                                    auVar38[1] = -(local_2a8 == 'p');
                                                    auVar38[2] = -(cStack_2a7 == 'a');
                                                    auVar38[3] = -(cStack_2a6 == 's');
                                                    auVar38[4] = -(cStack_2a5 == 's');
                                                    auVar38[5] = -(cStack_2a4 == 'S');
                                                    auVar38[6] = -(cStack_2a3 == 'a');
                                                    auVar38[7] = -(cStack_2a2 == 'm');
                                                    auVar38[8] = -(cStack_2a1 == 'p');
                                                    auVar38[9] = -(cStack_2a0 == 'l');
                                                    auVar38[10] = -(cStack_29f == 'e');
                                                    auVar38[0xb] = -(cStack_29e == 'R');
                                                    auVar38[0xc] = -(cStack_29d == 'a');
                                                    auVar38[0xd] = -(cStack_29c == 't');
                                                    auVar38[0xe] = -(cStack_29b == 'e');
                                                    auVar38[0xf] = -(cStack_29a == '\0');
                                                    auVar87[0] = -(local_2b8 == 'G');
                                                    auVar87[1] = -(cStack_2b7 == 'D');
                                                    auVar87[2] = -(cStack_2b6 == '2');
                                                    auVar87[3] = -(cStack_2b5 == '0');
                                                    auVar87[4] = -(cStack_2b4 == 'H');
                                                    auVar87[5] = -(cStack_2b3 == 'M');
                                                    auVar87[6] = -(cStack_2b2 == '3');
                                                    auVar87[7] = -(cStack_2b1 == '0');
                                                    auVar87[8] = -(cStack_2b0 == '3');
                                                    auVar87[9] = -(cStack_2af == 'D');
                                                    auVar87[10] = -(cStack_2ae == 'L');
                                                    auVar87[0xb] = -(cStack_2ad == 'H');
                                                    auVar87[0xc] = -(cStack_2ac == 'C');
                                                    auVar87[0xd] = -(cStack_2ab == 'C');
                                                    auVar87[0xe] = -(cStack_2aa == 'o');
                                                    auVar87[0xf] = -(cStack_2a9 == 'm');
                                                    auVar87 = auVar87 & auVar38;
                                                    if ((ushort)((ushort)(SUB161(auVar87 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar87 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar87 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar87 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar87 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar87 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar87 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar87 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar87 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar87 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar87 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar87 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar87 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar87 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar87 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(byte)(auVar87[0xf] >> 7) <<
                                                                0xf) == 0xffff) {
                                                      iVar2 = atoi((char *)&local_1c8);
                                                      this->m_GD20HM303DLHCCompassSampleRate = iVar2
                                                      ;
                                                    }
                                                    else {
                                                      auVar64[0] = -(local_2b8 == 'G');
                                                      auVar64[1] = -(cStack_2b7 == 'D');
                                                      auVar64[2] = -(cStack_2b6 == '2');
                                                      auVar64[3] = -(cStack_2b5 == '0');
                                                      auVar64[4] = -(cStack_2b4 == 'H');
                                                      auVar64[5] = -(cStack_2b3 == 'M');
                                                      auVar64[6] = -(cStack_2b2 == '3');
                                                      auVar64[7] = -(cStack_2b1 == '0');
                                                      auVar64[8] = -(cStack_2b0 == '3');
                                                      auVar64[9] = -(cStack_2af == 'D');
                                                      auVar64[10] = -(cStack_2ae == 'L');
                                                      auVar64[0xb] = -(cStack_2ad == 'H');
                                                      auVar64[0xc] = -(cStack_2ac == 'C');
                                                      auVar64[0xd] = -(cStack_2ab == 'C');
                                                      auVar64[0xe] = -(cStack_2aa == 'o');
                                                      auVar64[0xf] = -(cStack_2a9 == 'm');
                                                      auVar39[0] = -(local_2a8 == 'p');
                                                      auVar39[1] = -(cStack_2a7 == 'a');
                                                      auVar39[2] = -(cStack_2a6 == 's');
                                                      auVar39[3] = -(cStack_2a5 == 's');
                                                      auVar39[4] = -(cStack_2a4 == 'F');
                                                      auVar39[5] = -(cStack_2a3 == 's');
                                                      auVar39[6] = -(cStack_2a2 == 'r');
                                                      auVar39[7] = -(cStack_2a1 == '\0');
                                                      auVar39[8] = 0xff;
                                                      auVar39[9] = 0xff;
                                                      auVar39[10] = 0xff;
                                                      auVar39[0xb] = 0xff;
                                                      auVar39[0xc] = 0xff;
                                                      auVar39[0xd] = 0xff;
                                                      auVar39[0xe] = 0xff;
                                                      auVar39[0xf] = 0xff;
                                                      auVar64 = auVar64 & auVar39;
                                                      if ((ushort)((ushort)(SUB161(auVar64 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar64 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar64 >> 0x17,0
                                                                                  ) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar64 >> 0x1f,0
                                                                                  ) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar64 >> 0x27,0
                                                                                  ) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar64 >> 0x2f,0
                                                                                  ) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar64 >> 0x37,0
                                                                                  ) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar64 >> 0x3f,0
                                                                                  ) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar64 >> 0x47,0
                                                                                  ) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar64 >> 0x4f,0
                                                                                  ) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar64 >> 0x57,0
                                                                                  ) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar64 >> 0x5f,0
                                                                                  ) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar64 >> 0x67,0
                                                                                  ) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar64 >> 0x6f,0
                                                                                  ) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar64 >> 0x77,0
                                                                                  ) & 1) << 0xe |
                                                                  (ushort)(byte)(auVar64[0xf] >> 7)
                                                                  << 0xf) == 0xffff) {
                                                        iVar2 = atoi((char *)&local_1c8);
                                                        this->m_GD20HM303DLHCCompassFsr = iVar2;
                                                      }
                                                      else {
                                                        auVar40[0] = -(cStack_2b2 == '0');
                                                        auVar40[1] = -(cStack_2b1 == 'G');
                                                        auVar40[2] = -(cStack_2b0 == 'y');
                                                        auVar40[3] = -(cStack_2af == 'r');
                                                        auVar40[4] = -(cStack_2ae == 'o');
                                                        auVar40[5] = -(cStack_2ad == 'S');
                                                        auVar40[6] = -(cStack_2ac == 'a');
                                                        auVar40[7] = -(cStack_2ab == 'm');
                                                        auVar40[8] = -(cStack_2aa == 'p');
                                                        auVar40[9] = -(cStack_2a9 == 'l');
                                                        auVar40[10] = -(local_2a8 == 'e');
                                                        auVar40[0xb] = -(cStack_2a7 == 'R');
                                                        auVar40[0xc] = -(cStack_2a6 == 'a');
                                                        auVar40[0xd] = -(cStack_2a5 == 't');
                                                        auVar40[0xe] = -(cStack_2a4 == 'e');
                                                        auVar40[0xf] = -(cStack_2a3 == '\0');
                                                        auVar65[0] = -(local_2b8 == 'L');
                                                        auVar65[1] = -(cStack_2b7 == 'S');
                                                        auVar65[2] = -(cStack_2b6 == 'M');
                                                        auVar65[3] = -(cStack_2b5 == '9');
                                                        auVar65[4] = -(cStack_2b4 == 'D');
                                                        auVar65[5] = -(cStack_2b3 == 'S');
                                                        auVar65[6] = -(cStack_2b2 == '0');
                                                        auVar65[7] = -(cStack_2b1 == 'G');
                                                        auVar65[8] = -(cStack_2b0 == 'y');
                                                        auVar65[9] = -(cStack_2af == 'r');
                                                        auVar65[10] = -(cStack_2ae == 'o');
                                                        auVar65[0xb] = -(cStack_2ad == 'S');
                                                        auVar65[0xc] = -(cStack_2ac == 'a');
                                                        auVar65[0xd] = -(cStack_2ab == 'm');
                                                        auVar65[0xe] = -(cStack_2aa == 'p');
                                                        auVar65[0xf] = -(cStack_2a9 == 'l');
                                                        auVar65 = auVar65 & auVar40;
                                                        if ((ushort)((ushort)(SUB161(auVar65 >> 7,0)
                                                                             & 1) |
                                                                     (ushort)(SUB161(auVar65 >> 0xf,
                                                                                     0) & 1) << 1 |
                                                                     (ushort)(SUB161(auVar65 >> 0x17
                                                                                     ,0) & 1) << 2 |
                                                                     (ushort)(SUB161(auVar65 >> 0x1f
                                                                                     ,0) & 1) << 3 |
                                                                     (ushort)(SUB161(auVar65 >> 0x27
                                                                                     ,0) & 1) << 4 |
                                                                     (ushort)(SUB161(auVar65 >> 0x2f
                                                                                     ,0) & 1) << 5 |
                                                                     (ushort)(SUB161(auVar65 >> 0x37
                                                                                     ,0) & 1) << 6 |
                                                                     (ushort)(SUB161(auVar65 >> 0x3f
                                                                                     ,0) & 1) << 7 |
                                                                     (ushort)(SUB161(auVar65 >> 0x47
                                                                                     ,0) & 1) << 8 |
                                                                     (ushort)(SUB161(auVar65 >> 0x4f
                                                                                     ,0) & 1) << 9 |
                                                                     (ushort)(SUB161(auVar65 >> 0x57
                                                                                     ,0) & 1) << 10
                                                                     | (ushort)(SUB161(auVar65 >>
                                                                                       0x5f,0) & 1)
                                                                       << 0xb |
                                                                     (ushort)(SUB161(auVar65 >> 0x67
                                                                                     ,0) & 1) << 0xc
                                                                     | (ushort)(SUB161(auVar65 >>
                                                                                       0x6f,0) & 1)
                                                                       << 0xd |
                                                                     (ushort)(SUB161(auVar65 >> 0x77
                                                                                     ,0) & 1) << 0xe
                                                                    | (ushort)(byte)(auVar65[0xf] >>
                                                                                    7) << 0xf) ==
                                                            0xffff) {
                                                          iVar2 = atoi((char *)&local_1c8);
                                                          this->m_LSM9DS0GyroSampleRate = iVar2;
                                                        }
                                                        else if (CONCAT17(cStack_2aa,
                                                                          CONCAT16(cStack_2ab,
                                                                                   CONCAT15(
                                                  cStack_2ac,
                                                  CONCAT14(cStack_2ad,
                                                           CONCAT13(cStack_2ae,
                                                                    CONCAT12(cStack_2af,
                                                                             CONCAT11(cStack_2b0,
                                                                                      cStack_2b1))))
                                                  ))) == 0x7273466f727947 &&
                                                  CONCAT17(cStack_2b1,
                                                           CONCAT16(cStack_2b2,
                                                                    CONCAT15(cStack_2b3,
                                                                             CONCAT14(cStack_2b4,
                                                                                      CONCAT13(
                                                  cStack_2b5,
                                                  CONCAT12(cStack_2b6,CONCAT11(cStack_2b7,local_2b8)
                                                          )))))) == 0x47305344394d534c) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_LSM9DS0GyroFsr = iVar2;
                                                  }
                                                  else if (CONCAT17(cStack_2aa,
                                                                    CONCAT16(cStack_2ab,
                                                                             CONCAT15(cStack_2ac,
                                                                                      CONCAT14(
                                                  cStack_2ad,
                                                  CONCAT13(cStack_2ae,
                                                           CONCAT12(cStack_2af,
                                                                    CONCAT11(cStack_2b0,cStack_2b1))
                                                          ))))) == 0x6670486f727947 &&
                                                  CONCAT17(cStack_2b1,
                                                           CONCAT16(cStack_2b2,
                                                                    CONCAT15(cStack_2b3,
                                                                             CONCAT14(cStack_2b4,
                                                                                      CONCAT13(
                                                  cStack_2b5,
                                                  CONCAT12(cStack_2b6,CONCAT11(cStack_2b7,local_2b8)
                                                          )))))) == 0x47305344394d534c) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_LSM9DS0GyroHpf = iVar2;
                                                  }
                                                  else if (CONCAT17(cStack_2ab,
                                                                    CONCAT16(cStack_2ac,
                                                                             CONCAT15(cStack_2ad,
                                                                                      CONCAT14(
                                                  cStack_2ae,
                                                  CONCAT13(cStack_2af,
                                                           CONCAT12(cStack_2b0,
                                                                    CONCAT11(cStack_2b1,cStack_2b2))
                                                          ))))) == 0x57426f72794730 &&
                                                  CONCAT17(cStack_2b1,
                                                           CONCAT16(cStack_2b2,
                                                                    CONCAT15(cStack_2b3,
                                                                             CONCAT14(cStack_2b4,
                                                                                      CONCAT13(
                                                  cStack_2b5,
                                                  CONCAT12(cStack_2b6,CONCAT11(cStack_2b7,local_2b8)
                                                          )))))) == 0x47305344394d534c) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_LSM9DS0GyroBW = iVar2;
                                                  }
                                                  else {
                                                    auVar41[0] = -(cStack_2b1 == 'A');
                                                    auVar41[1] = -(cStack_2b0 == 'c');
                                                    auVar41[2] = -(cStack_2af == 'c');
                                                    auVar41[3] = -(cStack_2ae == 'e');
                                                    auVar41[4] = -(cStack_2ad == 'l');
                                                    auVar41[5] = -(cStack_2ac == 'S');
                                                    auVar41[6] = -(cStack_2ab == 'a');
                                                    auVar41[7] = -(cStack_2aa == 'm');
                                                    auVar41[8] = -(cStack_2a9 == 'p');
                                                    auVar41[9] = -(local_2a8 == 'l');
                                                    auVar41[10] = -(cStack_2a7 == 'e');
                                                    auVar41[0xb] = -(cStack_2a6 == 'R');
                                                    auVar41[0xc] = -(cStack_2a5 == 'a');
                                                    auVar41[0xd] = -(cStack_2a4 == 't');
                                                    auVar41[0xe] = -(cStack_2a3 == 'e');
                                                    auVar41[0xf] = -(cStack_2a2 == '\0');
                                                    auVar66[0] = -(local_2b8 == 'L');
                                                    auVar66[1] = -(cStack_2b7 == 'S');
                                                    auVar66[2] = -(cStack_2b6 == 'M');
                                                    auVar66[3] = -(cStack_2b5 == '9');
                                                    auVar66[4] = -(cStack_2b4 == 'D');
                                                    auVar66[5] = -(cStack_2b3 == 'S');
                                                    auVar66[6] = -(cStack_2b2 == '0');
                                                    auVar66[7] = -(cStack_2b1 == 'A');
                                                    auVar66[8] = -(cStack_2b0 == 'c');
                                                    auVar66[9] = -(cStack_2af == 'c');
                                                    auVar66[10] = -(cStack_2ae == 'e');
                                                    auVar66[0xb] = -(cStack_2ad == 'l');
                                                    auVar66[0xc] = -(cStack_2ac == 'S');
                                                    auVar66[0xd] = -(cStack_2ab == 'a');
                                                    auVar66[0xe] = -(cStack_2aa == 'm');
                                                    auVar66[0xf] = -(cStack_2a9 == 'p');
                                                    auVar66 = auVar66 & auVar41;
                                                    if ((ushort)((ushort)(SUB161(auVar66 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar66 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar66 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar66 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar66 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar66 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar66 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar66 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar66 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar66 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar66 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar66 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar66 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar66 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar66 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(byte)(auVar66[0xf] >> 7) <<
                                                                0xf) == 0xffff) {
                                                      iVar2 = atoi((char *)&local_1c8);
                                                      this->m_LSM9DS0AccelSampleRate = iVar2;
                                                    }
                                                    else {
                                                      auVar42[0] = -(local_2b8 == 'L');
                                                      auVar42[1] = -(cStack_2b7 == 'S');
                                                      auVar42[2] = -(cStack_2b6 == 'M');
                                                      auVar42[3] = -(cStack_2b5 == '9');
                                                      auVar42[4] = -(cStack_2b4 == 'D');
                                                      auVar42[5] = -(cStack_2b3 == 'S');
                                                      auVar42[6] = -(cStack_2b2 == '0');
                                                      auVar42[7] = -(cStack_2b1 == 'A');
                                                      auVar42[8] = -(cStack_2b0 == 'c');
                                                      auVar42[9] = -(cStack_2af == 'c');
                                                      auVar42[10] = -(cStack_2ae == 'e');
                                                      auVar42[0xb] = -(cStack_2ad == 'l');
                                                      auVar42[0xc] = -(cStack_2ac == 'F');
                                                      auVar42[0xd] = -(cStack_2ab == 's');
                                                      auVar42[0xe] = -(cStack_2aa == 'r');
                                                      auVar42[0xf] = -(cStack_2a9 == '\0');
                                                      if ((ushort)((ushort)(SUB161(auVar42 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar42 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar42 >> 0x17,0
                                                                                  ) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar42 >> 0x1f,0
                                                                                  ) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar42 >> 0x27,0
                                                                                  ) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar42 >> 0x2f,0
                                                                                  ) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar42 >> 0x37,0
                                                                                  ) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar42 >> 0x3f,0
                                                                                  ) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar42 >> 0x47,0
                                                                                  ) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar42 >> 0x4f,0
                                                                                  ) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar42 >> 0x57,0
                                                                                  ) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar42 >> 0x5f,0
                                                                                  ) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar42 >> 0x67,0
                                                                                  ) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar42 >> 0x6f,0
                                                                                  ) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar42 >> 0x77,0
                                                                                  ) & 1) << 0xe |
                                                                  (ushort)(auVar42[0xf] >> 7) << 0xf
                                                                  ) == 0xffff) {
                                                        iVar2 = atoi((char *)&local_1c8);
                                                        this->m_LSM9DS0AccelFsr = iVar2;
                                                      }
                                                      else {
                                                        auVar43[0] = -(local_2b8 == 'L');
                                                        auVar43[1] = -(cStack_2b7 == 'S');
                                                        auVar43[2] = -(cStack_2b6 == 'M');
                                                        auVar43[3] = -(cStack_2b5 == '9');
                                                        auVar43[4] = -(cStack_2b4 == 'D');
                                                        auVar43[5] = -(cStack_2b3 == 'S');
                                                        auVar43[6] = -(cStack_2b2 == '0');
                                                        auVar43[7] = -(cStack_2b1 == 'A');
                                                        auVar43[8] = -(cStack_2b0 == 'c');
                                                        auVar43[9] = -(cStack_2af == 'c');
                                                        auVar43[10] = -(cStack_2ae == 'e');
                                                        auVar43[0xb] = -(cStack_2ad == 'l');
                                                        auVar43[0xc] = -(cStack_2ac == 'L');
                                                        auVar43[0xd] = -(cStack_2ab == 'p');
                                                        auVar43[0xe] = -(cStack_2aa == 'f');
                                                        auVar43[0xf] = -(cStack_2a9 == '\0');
                                                        if ((ushort)((ushort)(SUB161(auVar43 >> 7,0)
                                                                             & 1) |
                                                                     (ushort)(SUB161(auVar43 >> 0xf,
                                                                                     0) & 1) << 1 |
                                                                     (ushort)(SUB161(auVar43 >> 0x17
                                                                                     ,0) & 1) << 2 |
                                                                     (ushort)(SUB161(auVar43 >> 0x1f
                                                                                     ,0) & 1) << 3 |
                                                                     (ushort)(SUB161(auVar43 >> 0x27
                                                                                     ,0) & 1) << 4 |
                                                                     (ushort)(SUB161(auVar43 >> 0x2f
                                                                                     ,0) & 1) << 5 |
                                                                     (ushort)(SUB161(auVar43 >> 0x37
                                                                                     ,0) & 1) << 6 |
                                                                     (ushort)(SUB161(auVar43 >> 0x3f
                                                                                     ,0) & 1) << 7 |
                                                                     (ushort)(SUB161(auVar43 >> 0x47
                                                                                     ,0) & 1) << 8 |
                                                                     (ushort)(SUB161(auVar43 >> 0x4f
                                                                                     ,0) & 1) << 9 |
                                                                     (ushort)(SUB161(auVar43 >> 0x57
                                                                                     ,0) & 1) << 10
                                                                     | (ushort)(SUB161(auVar43 >>
                                                                                       0x5f,0) & 1)
                                                                       << 0xb |
                                                                     (ushort)(SUB161(auVar43 >> 0x67
                                                                                     ,0) & 1) << 0xc
                                                                     | (ushort)(SUB161(auVar43 >>
                                                                                       0x6f,0) & 1)
                                                                       << 0xd |
                                                                     (ushort)(SUB161(auVar43 >> 0x77
                                                                                     ,0) & 1) << 0xe
                                                                    | (ushort)(auVar43[0xf] >> 7) <<
                                                                      0xf) == 0xffff) {
                                                          iVar2 = atoi((char *)&local_1c8);
                                                          this->m_LSM9DS0AccelLpf = iVar2;
                                                        }
                                                        else {
                                                          auVar44[0] = -(cStack_2af == 'm');
                                                          auVar44[1] = -(cStack_2ae == 'p');
                                                          auVar44[2] = -(cStack_2ad == 'a');
                                                          auVar44[3] = -(cStack_2ac == 's');
                                                          auVar44[4] = -(cStack_2ab == 's');
                                                          auVar44[5] = -(cStack_2aa == 'S');
                                                          auVar44[6] = -(cStack_2a9 == 'a');
                                                          auVar44[7] = -(local_2a8 == 'm');
                                                          auVar44[8] = -(cStack_2a7 == 'p');
                                                          auVar44[9] = -(cStack_2a6 == 'l');
                                                          auVar44[10] = -(cStack_2a5 == 'e');
                                                          auVar44[0xb] = -(cStack_2a4 == 'R');
                                                          auVar44[0xc] = -(cStack_2a3 == 'a');
                                                          auVar44[0xd] = -(cStack_2a2 == 't');
                                                          auVar44[0xe] = -(cStack_2a1 == 'e');
                                                          auVar44[0xf] = -(cStack_2a0 == '\0');
                                                          auVar67[0] = -(local_2b8 == 'L');
                                                          auVar67[1] = -(cStack_2b7 == 'S');
                                                          auVar67[2] = -(cStack_2b6 == 'M');
                                                          auVar67[3] = -(cStack_2b5 == '9');
                                                          auVar67[4] = -(cStack_2b4 == 'D');
                                                          auVar67[5] = -(cStack_2b3 == 'S');
                                                          auVar67[6] = -(cStack_2b2 == '0');
                                                          auVar67[7] = -(cStack_2b1 == 'C');
                                                          auVar67[8] = -(cStack_2b0 == 'o');
                                                          auVar67[9] = -(cStack_2af == 'm');
                                                          auVar67[10] = -(cStack_2ae == 'p');
                                                          auVar67[0xb] = -(cStack_2ad == 'a');
                                                          auVar67[0xc] = -(cStack_2ac == 's');
                                                          auVar67[0xd] = -(cStack_2ab == 's');
                                                          auVar67[0xe] = -(cStack_2aa == 'S');
                                                          auVar67[0xf] = -(cStack_2a9 == 'a');
                                                          auVar67 = auVar67 & auVar44;
                                                          if ((ushort)((ushort)(SUB161(auVar67 >> 7,
                                                                                       0) & 1) |
                                                                       (ushort)(SUB161(auVar67 >>
                                                                                       0xf,0) & 1)
                                                                       << 1 | (ushort)(SUB161(
                                                  auVar67 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(byte)(auVar67[0xf] >> 7) << 0xf) ==
                                                  0xffff) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_LSM9DS0CompassSampleRate = iVar2;
                                                  }
                                                  else {
                                                    auVar68[0] = -(local_2b8 == 'L');
                                                    auVar68[1] = -(cStack_2b7 == 'S');
                                                    auVar68[2] = -(cStack_2b6 == 'M');
                                                    auVar68[3] = -(cStack_2b5 == '9');
                                                    auVar68[4] = -(cStack_2b4 == 'D');
                                                    auVar68[5] = -(cStack_2b3 == 'S');
                                                    auVar68[6] = -(cStack_2b2 == '0');
                                                    auVar68[7] = -(cStack_2b1 == 'C');
                                                    auVar68[8] = -(cStack_2b0 == 'o');
                                                    auVar68[9] = -(cStack_2af == 'm');
                                                    auVar68[10] = -(cStack_2ae == 'p');
                                                    auVar68[0xb] = -(cStack_2ad == 'a');
                                                    auVar68[0xc] = -(cStack_2ac == 's');
                                                    auVar68[0xd] = -(cStack_2ab == 's');
                                                    auVar68[0xe] = -(cStack_2aa == 'F');
                                                    auVar68[0xf] = -(cStack_2a9 == 's');
                                                    auVar45[0] = -(local_2a8 == 'r');
                                                    auVar45[1] = -(cStack_2a7 == '\0');
                                                    auVar45[2] = 0xff;
                                                    auVar45[3] = 0xff;
                                                    auVar45[4] = 0xff;
                                                    auVar45[5] = 0xff;
                                                    auVar45[6] = 0xff;
                                                    auVar45[7] = 0xff;
                                                    auVar45[8] = 0xff;
                                                    auVar45[9] = 0xff;
                                                    auVar45[10] = 0xff;
                                                    auVar45[0xb] = 0xff;
                                                    auVar45[0xc] = 0xff;
                                                    auVar45[0xd] = 0xff;
                                                    auVar45[0xe] = 0xff;
                                                    auVar45[0xf] = 0xff;
                                                    auVar45 = auVar45 & auVar68;
                                                    if ((ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar45 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar45 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar45 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar45 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar45 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar45 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar45 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar45 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar45 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar45 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar45 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar45 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar45 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar45 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(byte)(auVar45[0xf] >> 7) <<
                                                                0xf) == 0xffff) {
                                                      iVar2 = atoi((char *)&local_1c8);
                                                      this->m_LSM9DS0CompassFsr = iVar2;
                                                    }
                                                    else {
                                                      auVar46[0] = -(cStack_2b2 == '1');
                                                      auVar46[1] = -(cStack_2b1 == 'G');
                                                      auVar46[2] = -(cStack_2b0 == 'y');
                                                      auVar46[3] = -(cStack_2af == 'r');
                                                      auVar46[4] = -(cStack_2ae == 'o');
                                                      auVar46[5] = -(cStack_2ad == 'S');
                                                      auVar46[6] = -(cStack_2ac == 'a');
                                                      auVar46[7] = -(cStack_2ab == 'm');
                                                      auVar46[8] = -(cStack_2aa == 'p');
                                                      auVar46[9] = -(cStack_2a9 == 'l');
                                                      auVar46[10] = -(local_2a8 == 'e');
                                                      auVar46[0xb] = -(cStack_2a7 == 'R');
                                                      auVar46[0xc] = -(cStack_2a6 == 'a');
                                                      auVar46[0xd] = -(cStack_2a5 == 't');
                                                      auVar46[0xe] = -(cStack_2a4 == 'e');
                                                      auVar46[0xf] = -(cStack_2a3 == '\0');
                                                      auVar69[0] = -(local_2b8 == 'L');
                                                      auVar69[1] = -(cStack_2b7 == 'S');
                                                      auVar69[2] = -(cStack_2b6 == 'M');
                                                      auVar69[3] = -(cStack_2b5 == '9');
                                                      auVar69[4] = -(cStack_2b4 == 'D');
                                                      auVar69[5] = -(cStack_2b3 == 'S');
                                                      auVar69[6] = -(cStack_2b2 == '1');
                                                      auVar69[7] = -(cStack_2b1 == 'G');
                                                      auVar69[8] = -(cStack_2b0 == 'y');
                                                      auVar69[9] = -(cStack_2af == 'r');
                                                      auVar69[10] = -(cStack_2ae == 'o');
                                                      auVar69[0xb] = -(cStack_2ad == 'S');
                                                      auVar69[0xc] = -(cStack_2ac == 'a');
                                                      auVar69[0xd] = -(cStack_2ab == 'm');
                                                      auVar69[0xe] = -(cStack_2aa == 'p');
                                                      auVar69[0xf] = -(cStack_2a9 == 'l');
                                                      auVar69 = auVar69 & auVar46;
                                                      if ((ushort)((ushort)(SUB161(auVar69 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar69 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar69 >> 0x17,0
                                                                                  ) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar69 >> 0x1f,0
                                                                                  ) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar69 >> 0x27,0
                                                                                  ) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar69 >> 0x2f,0
                                                                                  ) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar69 >> 0x37,0
                                                                                  ) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar69 >> 0x3f,0
                                                                                  ) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar69 >> 0x47,0
                                                                                  ) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar69 >> 0x4f,0
                                                                                  ) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar69 >> 0x57,0
                                                                                  ) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar69 >> 0x5f,0
                                                                                  ) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar69 >> 0x67,0
                                                                                  ) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar69 >> 0x6f,0
                                                                                  ) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar69 >> 0x77,0
                                                                                  ) & 1) << 0xe |
                                                                  (ushort)(byte)(auVar69[0xf] >> 7)
                                                                  << 0xf) == 0xffff) {
                                                        iVar2 = atoi((char *)&local_1c8);
                                                        this->m_LSM9DS1GyroSampleRate = iVar2;
                                                      }
                                                      else if (CONCAT17(cStack_2aa,
                                                                        CONCAT16(cStack_2ab,
                                                                                 CONCAT15(cStack_2ac
                                                                                          ,CONCAT14(
                                                  cStack_2ad,
                                                  CONCAT13(cStack_2ae,
                                                           CONCAT12(cStack_2af,
                                                                    CONCAT11(cStack_2b0,cStack_2b1))
                                                          ))))) == 0x7273466f727947 &&
                                                  CONCAT17(cStack_2b1,
                                                           CONCAT16(cStack_2b2,
                                                                    CONCAT15(cStack_2b3,
                                                                             CONCAT14(cStack_2b4,
                                                                                      CONCAT13(
                                                  cStack_2b5,
                                                  CONCAT12(cStack_2b6,CONCAT11(cStack_2b7,local_2b8)
                                                          )))))) == 0x47315344394d534c) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_LSM9DS1GyroFsr = iVar2;
                                                  }
                                                  else if (CONCAT17(cStack_2aa,
                                                                    CONCAT16(cStack_2ab,
                                                                             CONCAT15(cStack_2ac,
                                                                                      CONCAT14(
                                                  cStack_2ad,
                                                  CONCAT13(cStack_2ae,
                                                           CONCAT12(cStack_2af,
                                                                    CONCAT11(cStack_2b0,cStack_2b1))
                                                          ))))) == 0x6670486f727947 &&
                                                  CONCAT17(cStack_2b1,
                                                           CONCAT16(cStack_2b2,
                                                                    CONCAT15(cStack_2b3,
                                                                             CONCAT14(cStack_2b4,
                                                                                      CONCAT13(
                                                  cStack_2b5,
                                                  CONCAT12(cStack_2b6,CONCAT11(cStack_2b7,local_2b8)
                                                          )))))) == 0x47315344394d534c) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_LSM9DS1GyroHpf = iVar2;
                                                  }
                                                  else if (CONCAT17(cStack_2ab,
                                                                    CONCAT16(cStack_2ac,
                                                                             CONCAT15(cStack_2ad,
                                                                                      CONCAT14(
                                                  cStack_2ae,
                                                  CONCAT13(cStack_2af,
                                                           CONCAT12(cStack_2b0,
                                                                    CONCAT11(cStack_2b1,cStack_2b2))
                                                          ))))) == 0x57426f72794731 &&
                                                  CONCAT17(cStack_2b1,
                                                           CONCAT16(cStack_2b2,
                                                                    CONCAT15(cStack_2b3,
                                                                             CONCAT14(cStack_2b4,
                                                                                      CONCAT13(
                                                  cStack_2b5,
                                                  CONCAT12(cStack_2b6,CONCAT11(cStack_2b7,local_2b8)
                                                          )))))) == 0x47315344394d534c) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_LSM9DS1GyroBW = iVar2;
                                                  }
                                                  else {
                                                    auVar47[0] = -(cStack_2b1 == 'A');
                                                    auVar47[1] = -(cStack_2b0 == 'c');
                                                    auVar47[2] = -(cStack_2af == 'c');
                                                    auVar47[3] = -(cStack_2ae == 'e');
                                                    auVar47[4] = -(cStack_2ad == 'l');
                                                    auVar47[5] = -(cStack_2ac == 'S');
                                                    auVar47[6] = -(cStack_2ab == 'a');
                                                    auVar47[7] = -(cStack_2aa == 'm');
                                                    auVar47[8] = -(cStack_2a9 == 'p');
                                                    auVar47[9] = -(local_2a8 == 'l');
                                                    auVar47[10] = -(cStack_2a7 == 'e');
                                                    auVar47[0xb] = -(cStack_2a6 == 'R');
                                                    auVar47[0xc] = -(cStack_2a5 == 'a');
                                                    auVar47[0xd] = -(cStack_2a4 == 't');
                                                    auVar47[0xe] = -(cStack_2a3 == 'e');
                                                    auVar47[0xf] = -(cStack_2a2 == '\0');
                                                    auVar70[0] = -(local_2b8 == 'L');
                                                    auVar70[1] = -(cStack_2b7 == 'S');
                                                    auVar70[2] = -(cStack_2b6 == 'M');
                                                    auVar70[3] = -(cStack_2b5 == '9');
                                                    auVar70[4] = -(cStack_2b4 == 'D');
                                                    auVar70[5] = -(cStack_2b3 == 'S');
                                                    auVar70[6] = -(cStack_2b2 == '1');
                                                    auVar70[7] = -(cStack_2b1 == 'A');
                                                    auVar70[8] = -(cStack_2b0 == 'c');
                                                    auVar70[9] = -(cStack_2af == 'c');
                                                    auVar70[10] = -(cStack_2ae == 'e');
                                                    auVar70[0xb] = -(cStack_2ad == 'l');
                                                    auVar70[0xc] = -(cStack_2ac == 'S');
                                                    auVar70[0xd] = -(cStack_2ab == 'a');
                                                    auVar70[0xe] = -(cStack_2aa == 'm');
                                                    auVar70[0xf] = -(cStack_2a9 == 'p');
                                                    auVar70 = auVar70 & auVar47;
                                                    if ((ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar70 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar70 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar70 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar70 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar70 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar70 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar70 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar70 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar70 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar70 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar70 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar70 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar70 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar70 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(byte)(auVar70[0xf] >> 7) <<
                                                                0xf) == 0xffff) {
                                                      iVar2 = atoi((char *)&local_1c8);
                                                      this->m_LSM9DS1AccelSampleRate = iVar2;
                                                    }
                                                    else {
                                                      auVar48[0] = -(local_2b8 == 'L');
                                                      auVar48[1] = -(cStack_2b7 == 'S');
                                                      auVar48[2] = -(cStack_2b6 == 'M');
                                                      auVar48[3] = -(cStack_2b5 == '9');
                                                      auVar48[4] = -(cStack_2b4 == 'D');
                                                      auVar48[5] = -(cStack_2b3 == 'S');
                                                      auVar48[6] = -(cStack_2b2 == '1');
                                                      auVar48[7] = -(cStack_2b1 == 'A');
                                                      auVar48[8] = -(cStack_2b0 == 'c');
                                                      auVar48[9] = -(cStack_2af == 'c');
                                                      auVar48[10] = -(cStack_2ae == 'e');
                                                      auVar48[0xb] = -(cStack_2ad == 'l');
                                                      auVar48[0xc] = -(cStack_2ac == 'F');
                                                      auVar48[0xd] = -(cStack_2ab == 's');
                                                      auVar48[0xe] = -(cStack_2aa == 'r');
                                                      auVar48[0xf] = -(cStack_2a9 == '\0');
                                                      if ((ushort)((ushort)(SUB161(auVar48 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar48 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar48 >> 0x17,0
                                                                                  ) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar48 >> 0x1f,0
                                                                                  ) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar48 >> 0x27,0
                                                                                  ) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar48 >> 0x2f,0
                                                                                  ) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar48 >> 0x37,0
                                                                                  ) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar48 >> 0x3f,0
                                                                                  ) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar48 >> 0x47,0
                                                                                  ) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar48 >> 0x4f,0
                                                                                  ) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar48 >> 0x57,0
                                                                                  ) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar48 >> 0x5f,0
                                                                                  ) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar48 >> 0x67,0
                                                                                  ) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar48 >> 0x6f,0
                                                                                  ) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar48 >> 0x77,0
                                                                                  ) & 1) << 0xe |
                                                                  (ushort)(auVar48[0xf] >> 7) << 0xf
                                                                  ) == 0xffff) {
                                                        iVar2 = atoi((char *)&local_1c8);
                                                        this->m_LSM9DS1AccelFsr = iVar2;
                                                      }
                                                      else {
                                                        auVar49[0] = -(local_2b8 == 'L');
                                                        auVar49[1] = -(cStack_2b7 == 'S');
                                                        auVar49[2] = -(cStack_2b6 == 'M');
                                                        auVar49[3] = -(cStack_2b5 == '9');
                                                        auVar49[4] = -(cStack_2b4 == 'D');
                                                        auVar49[5] = -(cStack_2b3 == 'S');
                                                        auVar49[6] = -(cStack_2b2 == '1');
                                                        auVar49[7] = -(cStack_2b1 == 'A');
                                                        auVar49[8] = -(cStack_2b0 == 'c');
                                                        auVar49[9] = -(cStack_2af == 'c');
                                                        auVar49[10] = -(cStack_2ae == 'e');
                                                        auVar49[0xb] = -(cStack_2ad == 'l');
                                                        auVar49[0xc] = -(cStack_2ac == 'L');
                                                        auVar49[0xd] = -(cStack_2ab == 'p');
                                                        auVar49[0xe] = -(cStack_2aa == 'f');
                                                        auVar49[0xf] = -(cStack_2a9 == '\0');
                                                        if ((ushort)((ushort)(SUB161(auVar49 >> 7,0)
                                                                             & 1) |
                                                                     (ushort)(SUB161(auVar49 >> 0xf,
                                                                                     0) & 1) << 1 |
                                                                     (ushort)(SUB161(auVar49 >> 0x17
                                                                                     ,0) & 1) << 2 |
                                                                     (ushort)(SUB161(auVar49 >> 0x1f
                                                                                     ,0) & 1) << 3 |
                                                                     (ushort)(SUB161(auVar49 >> 0x27
                                                                                     ,0) & 1) << 4 |
                                                                     (ushort)(SUB161(auVar49 >> 0x2f
                                                                                     ,0) & 1) << 5 |
                                                                     (ushort)(SUB161(auVar49 >> 0x37
                                                                                     ,0) & 1) << 6 |
                                                                     (ushort)(SUB161(auVar49 >> 0x3f
                                                                                     ,0) & 1) << 7 |
                                                                     (ushort)(SUB161(auVar49 >> 0x47
                                                                                     ,0) & 1) << 8 |
                                                                     (ushort)(SUB161(auVar49 >> 0x4f
                                                                                     ,0) & 1) << 9 |
                                                                     (ushort)(SUB161(auVar49 >> 0x57
                                                                                     ,0) & 1) << 10
                                                                     | (ushort)(SUB161(auVar49 >>
                                                                                       0x5f,0) & 1)
                                                                       << 0xb |
                                                                     (ushort)(SUB161(auVar49 >> 0x67
                                                                                     ,0) & 1) << 0xc
                                                                     | (ushort)(SUB161(auVar49 >>
                                                                                       0x6f,0) & 1)
                                                                       << 0xd |
                                                                     (ushort)(SUB161(auVar49 >> 0x77
                                                                                     ,0) & 1) << 0xe
                                                                    | (ushort)(auVar49[0xf] >> 7) <<
                                                                      0xf) == 0xffff) {
                                                          iVar2 = atoi((char *)&local_1c8);
                                                          this->m_LSM9DS1AccelLpf = iVar2;
                                                        }
                                                        else {
                                                          auVar50[0] = -(cStack_2af == 'm');
                                                          auVar50[1] = -(cStack_2ae == 'p');
                                                          auVar50[2] = -(cStack_2ad == 'a');
                                                          auVar50[3] = -(cStack_2ac == 's');
                                                          auVar50[4] = -(cStack_2ab == 's');
                                                          auVar50[5] = -(cStack_2aa == 'S');
                                                          auVar50[6] = -(cStack_2a9 == 'a');
                                                          auVar50[7] = -(local_2a8 == 'm');
                                                          auVar50[8] = -(cStack_2a7 == 'p');
                                                          auVar50[9] = -(cStack_2a6 == 'l');
                                                          auVar50[10] = -(cStack_2a5 == 'e');
                                                          auVar50[0xb] = -(cStack_2a4 == 'R');
                                                          auVar50[0xc] = -(cStack_2a3 == 'a');
                                                          auVar50[0xd] = -(cStack_2a2 == 't');
                                                          auVar50[0xe] = -(cStack_2a1 == 'e');
                                                          auVar50[0xf] = -(cStack_2a0 == '\0');
                                                          auVar31[0] = -(local_2b8 == 'L');
                                                          auVar31[1] = -(cStack_2b7 == 'S');
                                                          auVar31[2] = -(cStack_2b6 == 'M');
                                                          auVar31[3] = -(cStack_2b5 == '9');
                                                          auVar31[4] = -(cStack_2b4 == 'D');
                                                          auVar31[5] = -(cStack_2b3 == 'S');
                                                          auVar31[6] = -(cStack_2b2 == '1');
                                                          auVar31[7] = -(cStack_2b1 == 'C');
                                                          auVar31[8] = -(cStack_2b0 == 'o');
                                                          auVar31[9] = -(cStack_2af == 'm');
                                                          auVar31[10] = -(cStack_2ae == 'p');
                                                          auVar31[0xb] = -(cStack_2ad == 'a');
                                                          auVar31[0xc] = -(cStack_2ac == 's');
                                                          auVar31[0xd] = -(cStack_2ab == 's');
                                                          auVar31[0xe] = -(cStack_2aa == 'S');
                                                          auVar31[0xf] = -(cStack_2a9 == 'a');
                                                          auVar31 = auVar31 & auVar50;
                                                          if ((ushort)((ushort)(SUB161(auVar31 >> 7,
                                                                                       0) & 1) |
                                                                       (ushort)(SUB161(auVar31 >>
                                                                                       0xf,0) & 1)
                                                                       << 1 | (ushort)(SUB161(
                                                  auVar31 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) ==
                                                  0xffff) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_LSM9DS1CompassSampleRate = iVar2;
                                                  }
                                                  else {
                                                    auVar51[0] = -(local_2b8 == 'L');
                                                    auVar51[1] = -(cStack_2b7 == 'S');
                                                    auVar51[2] = -(cStack_2b6 == 'M');
                                                    auVar51[3] = -(cStack_2b5 == '9');
                                                    auVar51[4] = -(cStack_2b4 == 'D');
                                                    auVar51[5] = -(cStack_2b3 == 'S');
                                                    auVar51[6] = -(cStack_2b2 == '1');
                                                    auVar51[7] = -(cStack_2b1 == 'C');
                                                    auVar51[8] = -(cStack_2b0 == 'o');
                                                    auVar51[9] = -(cStack_2af == 'm');
                                                    auVar51[10] = -(cStack_2ae == 'p');
                                                    auVar51[0xb] = -(cStack_2ad == 'a');
                                                    auVar51[0xc] = -(cStack_2ac == 's');
                                                    auVar51[0xd] = -(cStack_2ab == 's');
                                                    auVar51[0xe] = -(cStack_2aa == 'F');
                                                    auVar51[0xf] = -(cStack_2a9 == 's');
                                                    auVar32[0] = -(local_2a8 == 'r');
                                                    auVar32[1] = -(cStack_2a7 == '\0');
                                                    auVar32[2] = 0xff;
                                                    auVar32[3] = 0xff;
                                                    auVar32[4] = 0xff;
                                                    auVar32[5] = 0xff;
                                                    auVar32[6] = 0xff;
                                                    auVar32[7] = 0xff;
                                                    auVar32[8] = 0xff;
                                                    auVar32[9] = 0xff;
                                                    auVar32[10] = 0xff;
                                                    auVar32[0xb] = 0xff;
                                                    auVar32[0xc] = 0xff;
                                                    auVar32[0xd] = 0xff;
                                                    auVar32[0xe] = 0xff;
                                                    auVar32[0xf] = 0xff;
                                                    auVar32 = auVar32 & auVar51;
                                                    if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar32 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar32 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar32 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar32 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar32 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar32 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar32 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar32 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar32 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar32 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar32 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar32 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar32 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar32 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(byte)(auVar32[0xf] >> 7) <<
                                                                0xf) == 0xffff) {
                                                      iVar2 = atoi((char *)&local_1c8);
                                                      this->m_LSM9DS1CompassFsr = iVar2;
                                                    }
                                                    else {
                                                      auVar33[0] = -(cStack_2b3 == '5');
                                                      auVar33[1] = -(cStack_2b2 == 'G');
                                                      auVar33[2] = -(cStack_2b1 == 'y');
                                                      auVar33[3] = -(cStack_2b0 == 'r');
                                                      auVar33[4] = -(cStack_2af == 'o');
                                                      auVar33[5] = -(cStack_2ae == 'S');
                                                      auVar33[6] = -(cStack_2ad == 'a');
                                                      auVar33[7] = -(cStack_2ac == 'm');
                                                      auVar33[8] = -(cStack_2ab == 'p');
                                                      auVar33[9] = -(cStack_2aa == 'l');
                                                      auVar33[10] = -(cStack_2a9 == 'e');
                                                      auVar33[0xb] = -(local_2a8 == 'R');
                                                      auVar33[0xc] = -(cStack_2a7 == 'a');
                                                      auVar33[0xd] = -(cStack_2a6 == 't');
                                                      auVar33[0xe] = -(cStack_2a5 == 'e');
                                                      auVar33[0xf] = -(cStack_2a4 == '\0');
                                                      auVar52[0] = -(local_2b8 == 'B');
                                                      auVar52[1] = -(cStack_2b7 == 'M');
                                                      auVar52[2] = -(cStack_2b6 == 'X');
                                                      auVar52[3] = -(cStack_2b5 == '0');
                                                      auVar52[4] = -(cStack_2b4 == '5');
                                                      auVar52[5] = -(cStack_2b3 == '5');
                                                      auVar52[6] = -(cStack_2b2 == 'G');
                                                      auVar52[7] = -(cStack_2b1 == 'y');
                                                      auVar52[8] = -(cStack_2b0 == 'r');
                                                      auVar52[9] = -(cStack_2af == 'o');
                                                      auVar52[10] = -(cStack_2ae == 'S');
                                                      auVar52[0xb] = -(cStack_2ad == 'a');
                                                      auVar52[0xc] = -(cStack_2ac == 'm');
                                                      auVar52[0xd] = -(cStack_2ab == 'p');
                                                      auVar52[0xe] = -(cStack_2aa == 'l');
                                                      auVar52[0xf] = -(cStack_2a9 == 'e');
                                                      auVar52 = auVar52 & auVar33;
                                                      if ((ushort)((ushort)(SUB161(auVar52 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar52 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar52 >> 0x17,0
                                                                                  ) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar52 >> 0x1f,0
                                                                                  ) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar52 >> 0x27,0
                                                                                  ) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar52 >> 0x2f,0
                                                                                  ) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar52 >> 0x37,0
                                                                                  ) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar52 >> 0x3f,0
                                                                                  ) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar52 >> 0x47,0
                                                                                  ) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar52 >> 0x4f,0
                                                                                  ) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar52 >> 0x57,0
                                                                                  ) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar52 >> 0x5f,0
                                                                                  ) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar52 >> 0x67,0
                                                                                  ) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar52 >> 0x6f,0
                                                                                  ) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar52 >> 0x77,0
                                                                                  ) & 1) << 0xe |
                                                                  (ushort)(byte)(auVar52[0xf] >> 7)
                                                                  << 0xf) == 0xffff) {
                                                        iVar2 = atoi((char *)&local_1c8);
                                                        this->m_BMX055GyroSampleRate = iVar2;
                                                      }
                                                      else if (CONCAT17(cStack_2ab,
                                                                        CONCAT16(cStack_2ac,
                                                                                 CONCAT15(cStack_2ad
                                                                                          ,CONCAT14(
                                                  cStack_2ae,
                                                  CONCAT13(cStack_2af,
                                                           CONCAT12(cStack_2b0,
                                                                    CONCAT11(cStack_2b1,cStack_2b2))
                                                          ))))) == 0x7273466f727947 &&
                                                  CONCAT17(cStack_2b1,
                                                           CONCAT16(cStack_2b2,
                                                                    CONCAT15(cStack_2b3,
                                                                             CONCAT14(cStack_2b4,
                                                                                      CONCAT13(
                                                  cStack_2b5,
                                                  CONCAT12(cStack_2b6,CONCAT11(cStack_2b7,local_2b8)
                                                          )))))) == 0x7947353530584d42) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_BMX055GyroFsr = iVar2;
                                                  }
                                                  else {
                                                    auVar34[0] = -(cStack_2b2 == 'A');
                                                    auVar34[1] = -(cStack_2b1 == 'c');
                                                    auVar34[2] = -(cStack_2b0 == 'c');
                                                    auVar34[3] = -(cStack_2af == 'e');
                                                    auVar34[4] = -(cStack_2ae == 'l');
                                                    auVar34[5] = -(cStack_2ad == 'S');
                                                    auVar34[6] = -(cStack_2ac == 'a');
                                                    auVar34[7] = -(cStack_2ab == 'm');
                                                    auVar34[8] = -(cStack_2aa == 'p');
                                                    auVar34[9] = -(cStack_2a9 == 'l');
                                                    auVar34[10] = -(local_2a8 == 'e');
                                                    auVar34[0xb] = -(cStack_2a7 == 'R');
                                                    auVar34[0xc] = -(cStack_2a6 == 'a');
                                                    auVar34[0xd] = -(cStack_2a5 == 't');
                                                    auVar34[0xe] = -(cStack_2a4 == 'e');
                                                    auVar34[0xf] = -(cStack_2a3 == '\0');
                                                    auVar18[0] = -(local_2b8 == 'B');
                                                    auVar18[1] = -(cStack_2b7 == 'M');
                                                    auVar18[2] = -(cStack_2b6 == 'X');
                                                    auVar18[3] = -(cStack_2b5 == '0');
                                                    auVar18[4] = -(cStack_2b4 == '5');
                                                    auVar18[5] = -(cStack_2b3 == '5');
                                                    auVar18[6] = -(cStack_2b2 == 'A');
                                                    auVar18[7] = -(cStack_2b1 == 'c');
                                                    auVar18[8] = -(cStack_2b0 == 'c');
                                                    auVar18[9] = -(cStack_2af == 'e');
                                                    auVar18[10] = -(cStack_2ae == 'l');
                                                    auVar18[0xb] = -(cStack_2ad == 'S');
                                                    auVar18[0xc] = -(cStack_2ac == 'a');
                                                    auVar18[0xd] = -(cStack_2ab == 'm');
                                                    auVar18[0xe] = -(cStack_2aa == 'p');
                                                    auVar18[0xf] = -(cStack_2a9 == 'l');
                                                    auVar18 = auVar18 & auVar34;
                                                    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar18 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar18 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar18 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar18 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar18 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar18 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar18 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar18 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar18 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar18 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar18 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar18 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar18 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar18 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(byte)(auVar18[0xf] >> 7) <<
                                                                0xf) == 0xffff) {
                                                      iVar2 = atoi((char *)&local_1c8);
                                                      this->m_BMX055AccelSampleRate = iVar2;
                                                    }
                                                    else if (CONCAT17(cStack_2aa,
                                                                      CONCAT16(cStack_2ab,
                                                                               CONCAT15(cStack_2ac,
                                                                                        CONCAT14(
                                                  cStack_2ad,
                                                  CONCAT13(cStack_2ae,
                                                           CONCAT12(cStack_2af,
                                                                    CONCAT11(cStack_2b0,cStack_2b1))
                                                          ))))) == 0x7273466c656363 &&
                                                  CONCAT17(cStack_2b1,
                                                           CONCAT16(cStack_2b2,
                                                                    CONCAT15(cStack_2b3,
                                                                             CONCAT14(cStack_2b4,
                                                                                      CONCAT13(
                                                  cStack_2b5,
                                                  CONCAT12(cStack_2b6,CONCAT11(cStack_2b7,local_2b8)
                                                          )))))) == 0x6341353530584d42) {
                                                    iVar2 = atoi((char *)&local_1c8);
                                                    this->m_BMX055AccelFsr = iVar2;
                                                  }
                                                  else {
                                                    auVar19[0] = -(local_2b8 == 'B');
                                                    auVar19[1] = -(cStack_2b7 == 'M');
                                                    auVar19[2] = -(cStack_2b6 == 'X');
                                                    auVar19[3] = -(cStack_2b5 == '0');
                                                    auVar19[4] = -(cStack_2b4 == '5');
                                                    auVar19[5] = -(cStack_2b3 == '5');
                                                    auVar19[6] = -(cStack_2b2 == 'M');
                                                    auVar19[7] = -(cStack_2b1 == 'a');
                                                    auVar19[8] = -(cStack_2b0 == 'g');
                                                    auVar19[9] = -(cStack_2af == 'P');
                                                    auVar19[10] = -(cStack_2ae == 'r');
                                                    auVar19[0xb] = -(cStack_2ad == 'e');
                                                    auVar19[0xc] = -(cStack_2ac == 's');
                                                    auVar19[0xd] = -(cStack_2ab == 'e');
                                                    auVar19[0xe] = -(cStack_2aa == 't');
                                                    auVar19[0xf] = -(cStack_2a9 == '\0');
                                                    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar19 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar19 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar19 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar19 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar19 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar19 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar19 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar19 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar19 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar19 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar19 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar19 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar19 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar19 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(auVar19[0xf] >> 7) << 0xf)
                                                        == 0xffff) {
                                                      iVar2 = atoi((char *)&local_1c8);
                                                      this->m_BMX055MagPreset = iVar2;
                                                    }
                                                    else {
                                                      fprintf(_stderr,
                                                  "Unrecognized key in settings file: %s\n",local_f8
                                                  );
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      pcVar4 = fgets((char *)local_f8,200,(FILE *)this->m_fd);
    } while (pcVar4 != (char *)0x0);
  }
  printf("Settings file %s loaded\n",this->m_filename);
  fflush(_stdout);
  fclose((FILE *)this->m_fd);
  iVar2 = (*(this->super_RTIMUHal)._vptr_RTIMUHal[3])(this);
  return (bool)(char)iVar2;
}

Assistant:

bool RTIMUSettings::loadSettings()
{
    setDefaults();

    char buf[200];
    char key[200];
    char val[200];
    RTFLOAT ftemp;
    //  check to see if settings file exists

    if (!(m_fd = fopen(m_filename, "r"))) {
        HAL_INFO("Settings file not found. Using defaults and creating settings file\n");
        return saveSettings();
    }

    while (fgets(buf, 200, m_fd)) {
        if ((buf[0] == '#') || (buf[0] == ' ') || (buf[0] == '\n'))
            // just a comment
            continue;

        if (sscanf(buf, "%[^=]=%s", key, val) != 2) {
            HAL_ERROR1("Bad line in settings file: %s\n", buf);
            fclose(m_fd);
            return false;
        }

        //  now decode keys

        //  general config

        if (strcmp(key, RTIMULIB_IMU_TYPE) == 0) {
            m_imuType = atoi(val);
        } else if (strcmp(key, RTIMULIB_FUSION_TYPE) == 0) {
            m_fusionType = atoi(val);
        } else if (strcmp(key, RTIMULIB_BUS_IS_I2C) == 0) {
            m_busIsI2C = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_I2C_BUS) == 0) {
            m_I2CBus = atoi(val);
        } else if (strcmp(key, RTIMULIB_SPI_BUS) == 0) {
            m_SPIBus = atoi(val);
        } else if (strcmp(key, RTIMULIB_SPI_SELECT) == 0) {
            m_SPISelect = atoi(val);
        } else if (strcmp(key, RTIMULIB_SPI_SPEED) == 0) {
            m_SPISpeed = atoi(val);
        } else if (strcmp(key, RTIMULIB_I2C_SLAVEADDRESS) == 0) {
            m_I2CSlaveAddress = atoi(val);
        } else if (strcmp(key, RTIMULIB_AXIS_ROTATION) == 0) {
            m_axisRotation = atoi(val);
        } else if (strcmp(key, RTIMULIB_PRESSURE_TYPE) == 0) {
            m_pressureType = atoi(val);
        } else if (strcmp(key, RTIMULIB_I2C_PRESSUREADDRESS) == 0) {
            m_I2CPressureAddress = atoi(val);
        } else if (strcmp(key, RTIMULIB_HUMIDITY_TYPE) == 0) {
            m_humidityType = atoi(val);
        } else if (strcmp(key, RTIMULIB_I2C_HUMIDITYADDRESS) == 0) {
            m_I2CHumidityAddress = atoi(val);

        // compass calibration and adjustment

        } else if (strcmp(key, RTIMULIB_COMPASSCAL_VALID) == 0) {
            m_compassCalValid = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MINX) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMin.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MINY) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMin.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MINZ) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMin.setZ(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MAXX) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMax.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MAXY) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMax.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MAXZ) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMax.setZ(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSADJ_DECLINATION) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassAdjDeclination = ftemp;

        // compass ellipsoid calibration

        } else if (strcmp(key, RTIMULIB_COMPASSCAL_ELLIPSOID_VALID) == 0) {
            m_compassCalEllipsoidValid = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_OFFSET_X) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidOffset.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_OFFSET_Y) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidOffset.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_OFFSET_Z) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidOffset.setZ(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR11) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[0][0] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR12) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[0][1] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR13) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[0][2] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR21) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[1][0] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR22) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[1][1] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR23) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[1][2] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR31) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[2][0] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR32) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[2][1] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR33) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[2][2] = ftemp;

        // accel calibration

        } else if (strcmp(key, RTIMULIB_ACCELCAL_VALID) == 0) {
            m_accelCalValid = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MINX) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMin.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MINY) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMin.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MINZ) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMin.setZ(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MAXX) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMax.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MAXY) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMax.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MAXZ) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMax.setZ(ftemp);

            // gyro bias

        } else if (strcmp(key, RTIMULIB_GYRO_BIAS_VALID) == 0) {
            m_gyroBiasValid = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_GYRO_BIAS_X) == 0) {
            sscanf(val, "%f", &ftemp);
            m_gyroBias.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_GYRO_BIAS_Y) == 0) {
            sscanf(val, "%f", &ftemp);
            m_gyroBias.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_GYRO_BIAS_Z) == 0) {
            sscanf(val, "%f", &ftemp);
            m_gyroBias.setZ(ftemp);

        //  MPU9150 settings

        } else if (strcmp(key, RTIMULIB_MPU9150_GYROACCEL_SAMPLERATE) == 0) {
            m_MPU9150GyroAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9150_COMPASS_SAMPLERATE) == 0) {
            m_MPU9150CompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9150_GYROACCEL_LPF) == 0) {
            m_MPU9150GyroAccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9150_GYRO_FSR) == 0) {
            m_MPU9150GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9150_ACCEL_FSR) == 0) {
            m_MPU9150AccelFsr = atoi(val);

        //  MPU9250 settings

        } else if (strcmp(key, RTIMULIB_MPU9250_GYROACCEL_SAMPLERATE) == 0) {
            m_MPU9250GyroAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_COMPASS_SAMPLERATE) == 0) {
            m_MPU9250CompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_GYRO_LPF) == 0) {
            m_MPU9250GyroLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_ACCEL_LPF) == 0) {
            m_MPU9250AccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_GYRO_FSR) == 0) {
            m_MPU9250GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_ACCEL_FSR) == 0) {
            m_MPU9250AccelFsr = atoi(val);

        //  GD20HM303D settings

        } else if (strcmp(key, RTIMULIB_GD20HM303D_GYRO_SAMPLERATE) == 0) {
            m_GD20HM303DGyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_GYRO_FSR) == 0) {
            m_GD20HM303DGyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_GYRO_HPF) == 0) {
            m_GD20HM303DGyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_GYRO_BW) == 0) {
            m_GD20HM303DGyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_ACCEL_SAMPLERATE) == 0) {
            m_GD20HM303DAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_ACCEL_FSR) == 0) {
            m_GD20HM303DAccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_ACCEL_LPF) == 0) {
            m_GD20HM303DAccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_COMPASS_SAMPLERATE) == 0) {
            m_GD20HM303DCompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_COMPASS_FSR) == 0) {
            m_GD20HM303DCompassFsr = atoi(val);

        //  GD20M303DLHC settings

        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_GYRO_SAMPLERATE) == 0) {
            m_GD20M303DLHCGyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_GYRO_FSR) == 0) {
            m_GD20M303DLHCGyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_GYRO_HPF) == 0) {
            m_GD20M303DLHCGyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_GYRO_BW) == 0) {
            m_GD20M303DLHCGyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_ACCEL_SAMPLERATE) == 0) {
            m_GD20M303DLHCAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_ACCEL_FSR) == 0) {
            m_GD20M303DLHCAccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_COMPASS_SAMPLERATE) == 0) {
            m_GD20M303DLHCCompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_COMPASS_FSR) == 0) {
            m_GD20M303DLHCCompassFsr = atoi(val);

        //  GD20HM303DLHC settings

         } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_GYRO_SAMPLERATE) == 0) {
            m_GD20HM303DLHCGyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_GYRO_FSR) == 0) {
            m_GD20HM303DLHCGyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_GYRO_HPF) == 0) {
            m_GD20HM303DLHCGyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_GYRO_BW) == 0) {
            m_GD20HM303DLHCGyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_ACCEL_SAMPLERATE) == 0) {
            m_GD20HM303DLHCAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_ACCEL_FSR) == 0) {
            m_GD20HM303DLHCAccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_COMPASS_SAMPLERATE) == 0) {
            m_GD20HM303DLHCCompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_COMPASS_FSR) == 0) {
            m_GD20HM303DLHCCompassFsr = atoi(val);

        //  LSM9DS0 settings

        } else if (strcmp(key, RTIMULIB_LSM9DS0_GYRO_SAMPLERATE) == 0) {
            m_LSM9DS0GyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_GYRO_FSR) == 0) {
            m_LSM9DS0GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_GYRO_HPF) == 0) {
            m_LSM9DS0GyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_GYRO_BW) == 0) {
            m_LSM9DS0GyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_ACCEL_SAMPLERATE) == 0) {
            m_LSM9DS0AccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_ACCEL_FSR) == 0) {
            m_LSM9DS0AccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_ACCEL_LPF) == 0) {
            m_LSM9DS0AccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_COMPASS_SAMPLERATE) == 0) {
            m_LSM9DS0CompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_COMPASS_FSR) == 0) {
            m_LSM9DS0CompassFsr = atoi(val);

        //  LSM9DS1 settings

        } else if (strcmp(key, RTIMULIB_LSM9DS1_GYRO_SAMPLERATE) == 0) {
            m_LSM9DS1GyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_GYRO_FSR) == 0) {
            m_LSM9DS1GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_GYRO_HPF) == 0) {
            m_LSM9DS1GyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_GYRO_BW) == 0) {
            m_LSM9DS1GyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_ACCEL_SAMPLERATE) == 0) {
            m_LSM9DS1AccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_ACCEL_FSR) == 0) {
            m_LSM9DS1AccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_ACCEL_LPF) == 0) {
            m_LSM9DS1AccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_COMPASS_SAMPLERATE) == 0) {
            m_LSM9DS1CompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_COMPASS_FSR) == 0) {
            m_LSM9DS1CompassFsr = atoi(val);

        //  BMX055 settings

        } else if (strcmp(key, RTIMULIB_BMX055_GYRO_SAMPLERATE) == 0) {
            m_BMX055GyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_BMX055_GYRO_FSR) == 0) {
            m_BMX055GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_BMX055_ACCEL_SAMPLERATE) == 0) {
            m_BMX055AccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_BMX055_ACCEL_FSR) == 0) {
            m_BMX055AccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_BMX055_MAG_PRESET) == 0) {
            m_BMX055MagPreset = atoi(val);

        //  Handle unrecognized key

        } else {
            HAL_ERROR1("Unrecognized key in settings file: %s\n", buf);
        }
    }
    HAL_INFO1("Settings file %s loaded\n", m_filename);
    fclose(m_fd);
    return saveSettings();                                  // make sure settings file is correct and complete
}